

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  ulong uVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  uint uVar104;
  ulong uVar105;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar106;
  long lVar107;
  uint uVar108;
  uint uVar109;
  long lVar110;
  ulong uVar111;
  byte bVar112;
  bool bVar113;
  byte bVar114;
  float fVar115;
  __m128 a;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 extraout_var [60];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar173;
  float fVar175;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar174;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar148 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar200;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar199;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar189 [16];
  undefined1 auVar198 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar235;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar237;
  undefined1 auVar226 [28];
  float fVar233;
  float fVar234;
  float fVar236;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar238;
  float fVar259;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [28];
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar247 [32];
  float fVar262;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar263;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar264;
  float fVar279;
  float fVar283;
  float fVar284;
  float fVar288;
  float fVar289;
  undefined1 auVar269 [32];
  float fVar273;
  float fVar275;
  float fVar277;
  float fVar280;
  float fVar281;
  float fVar285;
  float fVar286;
  float fVar290;
  float fVar291;
  undefined1 auVar270 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar272;
  float fVar274;
  float fVar278;
  float fVar282;
  float fVar287;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar276;
  undefined1 auVar271 [64];
  float fVar292;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar319;
  float fVar324;
  float fVar334;
  float fVar339;
  float fVar344;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar318 [32];
  undefined1 auVar352 [16];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar360;
  float fVar361;
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  float fVar362;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [64];
  float fVar375;
  float fVar388;
  float fVar389;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar390;
  float fVar394;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar397 [16];
  float fVar395;
  float fVar396;
  float fVar405;
  float fVar407;
  float fVar411;
  float fVar413;
  float fVar415;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar412;
  float fVar414;
  float fVar416;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar417 [16];
  undefined1 auVar418 [28];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  float fVar424;
  undefined1 auVar425 [28];
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  undefined1 auVar426 [32];
  float fVar434;
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  float fVar435;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ca8;
  undefined1 local_c60 [32];
  undefined1 local_c30 [8];
  float fStack_c28;
  float fStack_c24;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 auStack_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  RTCHitN local_840 [16];
  undefined1 auStack_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  uint local_7d0;
  uint uStack_7cc;
  uint uStack_7c8;
  uint uStack_7c4;
  uint uStack_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar382 [32];
  undefined1 auVar387 [64];
  undefined1 auVar404 [64];
  undefined1 auVar438 [64];
  
  PVar18 = prim[1];
  uVar105 = (ulong)(byte)PVar18;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 10)));
  auVar376 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 10)));
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 6)));
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 10)));
  lVar107 = uVar105 * 0x25;
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x11 + 6)));
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x11 + 10)));
  fVar219 = *(float *)(prim + lVar107 + 0x12);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar147 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar33 = vsubps_avx(auVar33,*(undefined1 (*) [16])(prim + lVar107 + 6));
  local_c30._4_4_ = fVar219 * auVar33._4_4_;
  local_c30._0_4_ = fVar219 * auVar33._0_4_;
  fStack_c28 = fVar219 * auVar33._8_4_;
  fStack_c24 = fVar219 * auVar33._12_4_;
  auVar352._0_4_ = fVar219 * auVar147._0_4_;
  auVar352._4_4_ = fVar219 * auVar147._4_4_;
  auVar352._8_4_ = fVar219 * auVar147._8_4_;
  auVar352._12_4_ = fVar219 * auVar147._12_4_;
  auVar247._16_16_ = auVar241;
  auVar247._0_16_ = auVar34;
  auVar227._16_16_ = auVar36;
  auVar227._0_16_ = auVar35;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 6)));
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 10)));
  auVar133 = vcvtdq2ps_avx(auVar227);
  auVar157._16_16_ = auVar125;
  auVar157._0_16_ = auVar376;
  auVar25 = vcvtdq2ps_avx(auVar157);
  auVar267._16_16_ = auVar127;
  auVar267._0_16_ = auVar120;
  auVar190._16_16_ = auVar126;
  auVar190._0_16_ = auVar119;
  auVar26 = vcvtdq2ps_avx(auVar190);
  auVar191._16_16_ = auVar151;
  auVar191._0_16_ = auVar37;
  auVar27 = vcvtdq2ps_avx(auVar191);
  auVar293._16_16_ = auVar147;
  auVar293._0_16_ = auVar33;
  auVar363._16_16_ = auVar241;
  auVar363._0_16_ = auVar34;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 6)));
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 10)));
  auVar419._16_16_ = auVar147;
  auVar419._0_16_ = auVar33;
  auVar33 = vshufps_avx(auVar352,auVar352,0x55);
  auVar147 = vshufps_avx(auVar352,auVar352,0xaa);
  fVar115 = auVar147._0_4_;
  fVar233 = auVar147._4_4_;
  fVar173 = auVar147._8_4_;
  fVar234 = auVar147._12_4_;
  fVar236 = auVar33._0_4_;
  fVar237 = auVar33._4_4_;
  fVar264 = auVar33._8_4_;
  fVar272 = auVar33._12_4_;
  auVar376 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar107 + 0x16)) *
                           *(float *)(prim + lVar107 + 0x1a)));
  _local_aa0 = ZEXT1632(auVar376);
  auVar28 = vcvtdq2ps_avx(auVar247);
  auVar29 = vcvtdq2ps_avx(auVar267);
  auVar30 = vcvtdq2ps_avx(auVar293);
  auVar31 = vcvtdq2ps_avx(auVar363);
  auVar32 = vcvtdq2ps_avx(auVar419);
  auVar33 = vshufps_avx(auVar352,auVar352,0);
  fVar219 = auVar241._12_4_;
  fVar174 = auVar33._0_4_;
  fVar235 = auVar33._4_4_;
  fVar175 = auVar33._8_4_;
  fVar200 = auVar33._12_4_;
  auVar436._0_4_ = fVar174 * auVar28._0_4_ + fVar236 * auVar133._0_4_ + fVar115 * auVar25._0_4_;
  auVar436._4_4_ = fVar235 * auVar28._4_4_ + fVar237 * auVar133._4_4_ + fVar233 * auVar25._4_4_;
  auVar436._8_4_ = fVar175 * auVar28._8_4_ + fVar264 * auVar133._8_4_ + fVar173 * auVar25._8_4_;
  auVar436._12_4_ = fVar200 * auVar28._12_4_ + fVar272 * auVar133._12_4_ + fVar234 * auVar25._12_4_;
  auVar436._16_4_ = fVar174 * auVar28._16_4_ + fVar236 * auVar133._16_4_ + fVar115 * auVar25._16_4_;
  auVar436._20_4_ = fVar235 * auVar28._20_4_ + fVar237 * auVar133._20_4_ + fVar233 * auVar25._20_4_;
  auVar436._24_4_ = fVar175 * auVar28._24_4_ + fVar264 * auVar133._24_4_ + fVar173 * auVar25._24_4_;
  auVar436._28_4_ = fVar219 + 0.0;
  auVar420._0_4_ = fVar174 * auVar29._0_4_ + fVar236 * auVar26._0_4_ + fVar115 * auVar27._0_4_;
  auVar420._4_4_ = fVar235 * auVar29._4_4_ + fVar237 * auVar26._4_4_ + fVar233 * auVar27._4_4_;
  auVar420._8_4_ = fVar175 * auVar29._8_4_ + fVar264 * auVar26._8_4_ + fVar173 * auVar27._8_4_;
  auVar420._12_4_ = fVar200 * auVar29._12_4_ + fVar272 * auVar26._12_4_ + fVar234 * auVar27._12_4_;
  auVar420._16_4_ = fVar174 * auVar29._16_4_ + fVar236 * auVar26._16_4_ + fVar115 * auVar27._16_4_;
  auVar420._20_4_ = fVar235 * auVar29._20_4_ + fVar237 * auVar26._20_4_ + fVar233 * auVar27._20_4_;
  auVar420._24_4_ = fVar175 * auVar29._24_4_ + fVar264 * auVar26._24_4_ + fVar173 * auVar27._24_4_;
  auVar420._28_4_ = fVar219 + 0.0;
  auVar398._0_4_ = fVar174 * auVar30._0_4_ + fVar236 * auVar31._0_4_ + fVar115 * auVar32._0_4_;
  auVar398._4_4_ = fVar235 * auVar30._4_4_ + fVar237 * auVar31._4_4_ + fVar233 * auVar32._4_4_;
  auVar398._8_4_ = fVar175 * auVar30._8_4_ + fVar264 * auVar31._8_4_ + fVar173 * auVar32._8_4_;
  auVar398._12_4_ = fVar200 * auVar30._12_4_ + fVar272 * auVar31._12_4_ + fVar234 * auVar32._12_4_;
  auVar398._16_4_ = fVar174 * auVar30._16_4_ + fVar236 * auVar31._16_4_ + fVar115 * auVar32._16_4_;
  auVar398._20_4_ = fVar235 * auVar30._20_4_ + fVar237 * auVar31._20_4_ + fVar233 * auVar32._20_4_;
  auVar398._24_4_ = fVar175 * auVar30._24_4_ + fVar264 * auVar31._24_4_ + fVar173 * auVar32._24_4_;
  auVar398._28_4_ = fVar219 + fVar234 + 0.0;
  auVar33 = vshufps_avx(_local_c30,_local_c30,0x55);
  auVar147 = vshufps_avx(_local_c30,_local_c30,0xaa);
  fVar236 = auVar147._0_4_;
  fVar237 = auVar147._4_4_;
  fVar264 = auVar147._8_4_;
  fVar272 = auVar147._12_4_;
  fVar234 = auVar33._0_4_;
  fVar174 = auVar33._4_4_;
  fVar235 = auVar33._8_4_;
  fVar175 = auVar33._12_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar33 = vpmovsxwd_avx(auVar33);
  _local_9a0 = ZEXT1632(auVar33);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar105 * 7 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar147);
  fVar200 = auVar133._28_4_ + auVar27._28_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 0xe);
  auVar241 = vpmovsxwd_avx(auVar241);
  auVar35 = vshufps_avx(_local_c30,_local_c30,0);
  fVar219 = auVar35._0_4_;
  fVar115 = auVar35._4_4_;
  fVar233 = auVar35._8_4_;
  fVar173 = auVar35._12_4_;
  auVar158._0_4_ = auVar28._0_4_ * fVar219 + fVar234 * auVar133._0_4_ + fVar236 * auVar25._0_4_;
  auVar158._4_4_ = auVar28._4_4_ * fVar115 + fVar174 * auVar133._4_4_ + fVar237 * auVar25._4_4_;
  auVar158._8_4_ = auVar28._8_4_ * fVar233 + fVar235 * auVar133._8_4_ + fVar264 * auVar25._8_4_;
  auVar158._12_4_ = auVar28._12_4_ * fVar173 + fVar175 * auVar133._12_4_ + fVar272 * auVar25._12_4_;
  auVar158._16_4_ = auVar28._16_4_ * fVar219 + fVar234 * auVar133._16_4_ + fVar236 * auVar25._16_4_;
  auVar158._20_4_ = auVar28._20_4_ * fVar115 + fVar174 * auVar133._20_4_ + fVar237 * auVar25._20_4_;
  auVar158._24_4_ = auVar28._24_4_ * fVar233 + fVar235 * auVar133._24_4_ + fVar264 * auVar25._24_4_;
  auVar158._28_4_ = fVar175 + auVar133._28_4_ + auVar25._28_4_;
  auVar131._0_4_ = fVar219 * auVar29._0_4_ + auVar26._0_4_ * fVar234 + fVar236 * auVar27._0_4_;
  auVar131._4_4_ = fVar115 * auVar29._4_4_ + auVar26._4_4_ * fVar174 + fVar237 * auVar27._4_4_;
  auVar131._8_4_ = fVar233 * auVar29._8_4_ + auVar26._8_4_ * fVar235 + fVar264 * auVar27._8_4_;
  auVar131._12_4_ = fVar173 * auVar29._12_4_ + auVar26._12_4_ * fVar175 + fVar272 * auVar27._12_4_;
  auVar131._16_4_ = fVar219 * auVar29._16_4_ + auVar26._16_4_ * fVar234 + fVar236 * auVar27._16_4_;
  auVar131._20_4_ = fVar115 * auVar29._20_4_ + auVar26._20_4_ * fVar174 + fVar237 * auVar27._20_4_;
  auVar131._24_4_ = fVar233 * auVar29._24_4_ + auVar26._24_4_ * fVar235 + fVar264 * auVar27._24_4_;
  auVar131._28_4_ = fVar175 + fVar200;
  auVar268._8_4_ = 0x7fffffff;
  auVar268._0_8_ = 0x7fffffff7fffffff;
  auVar268._12_4_ = 0x7fffffff;
  auVar268._16_4_ = 0x7fffffff;
  auVar268._20_4_ = 0x7fffffff;
  auVar268._24_4_ = 0x7fffffff;
  auVar268._28_4_ = 0x7fffffff;
  auVar314._8_4_ = 0x219392ef;
  auVar314._0_8_ = 0x219392ef219392ef;
  auVar314._12_4_ = 0x219392ef;
  auVar314._16_4_ = 0x219392ef;
  auVar314._20_4_ = 0x219392ef;
  auVar314._24_4_ = 0x219392ef;
  auVar314._28_4_ = 0x219392ef;
  auVar133 = vandps_avx(auVar436,auVar268);
  auVar133 = vcmpps_avx(auVar133,auVar314,1);
  auVar25 = vblendvps_avx(auVar436,auVar314,auVar133);
  auVar133 = vandps_avx(auVar420,auVar268);
  auVar133 = vcmpps_avx(auVar133,auVar314,1);
  auVar26 = vblendvps_avx(auVar420,auVar314,auVar133);
  auVar133 = vandps_avx(auVar398,auVar268);
  auVar133 = vcmpps_avx(auVar133,auVar314,1);
  auVar133 = vblendvps_avx(auVar398,auVar314,auVar133);
  auVar192._0_4_ = fVar219 * auVar30._0_4_ + auVar31._0_4_ * fVar234 + fVar236 * auVar32._0_4_;
  auVar192._4_4_ = fVar115 * auVar30._4_4_ + auVar31._4_4_ * fVar174 + fVar237 * auVar32._4_4_;
  auVar192._8_4_ = fVar233 * auVar30._8_4_ + auVar31._8_4_ * fVar235 + fVar264 * auVar32._8_4_;
  auVar192._12_4_ = fVar173 * auVar30._12_4_ + auVar31._12_4_ * fVar175 + fVar272 * auVar32._12_4_;
  auVar192._16_4_ = fVar219 * auVar30._16_4_ + auVar31._16_4_ * fVar234 + fVar236 * auVar32._16_4_;
  auVar192._20_4_ = fVar115 * auVar30._20_4_ + auVar31._20_4_ * fVar174 + fVar237 * auVar32._20_4_;
  auVar192._24_4_ = fVar233 * auVar30._24_4_ + auVar31._24_4_ * fVar235 + fVar264 * auVar32._24_4_;
  auVar192._28_4_ = fVar200 + fVar175 + fVar272;
  auVar27 = vrcpps_avx(auVar25);
  fVar219 = auVar27._0_4_;
  fVar233 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar233;
  auVar28._0_4_ = auVar25._0_4_ * fVar219;
  fVar234 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar234;
  fVar235 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar235;
  fVar200 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar200;
  fVar236 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar236;
  fVar237 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar237;
  auVar28._28_4_ = auVar25._28_4_;
  auVar378._8_4_ = 0x3f800000;
  auVar378._0_8_ = 0x3f8000003f800000;
  auVar378._12_4_ = 0x3f800000;
  auVar378._16_4_ = 0x3f800000;
  auVar378._20_4_ = 0x3f800000;
  auVar378._24_4_ = 0x3f800000;
  auVar378._28_4_ = 0x3f800000;
  auVar29 = vsubps_avx(auVar378,auVar28);
  auVar28 = vrcpps_avx(auVar26);
  fVar219 = fVar219 + fVar219 * auVar29._0_4_;
  fVar233 = fVar233 + fVar233 * auVar29._4_4_;
  fVar234 = fVar234 + fVar234 * auVar29._8_4_;
  fVar235 = fVar235 + fVar235 * auVar29._12_4_;
  fVar200 = fVar200 + fVar200 * auVar29._16_4_;
  fVar236 = fVar236 + fVar236 * auVar29._20_4_;
  fVar237 = fVar237 + fVar237 * auVar29._24_4_;
  fVar238 = auVar28._0_4_;
  fVar257 = auVar28._4_4_;
  auVar25._4_4_ = fVar257 * auVar26._4_4_;
  auVar25._0_4_ = fVar238 * auVar26._0_4_;
  fVar258 = auVar28._8_4_;
  auVar25._8_4_ = fVar258 * auVar26._8_4_;
  fVar259 = auVar28._12_4_;
  auVar25._12_4_ = fVar259 * auVar26._12_4_;
  fVar260 = auVar28._16_4_;
  auVar25._16_4_ = fVar260 * auVar26._16_4_;
  fVar261 = auVar28._20_4_;
  auVar25._20_4_ = fVar261 * auVar26._20_4_;
  fVar262 = auVar28._24_4_;
  auVar25._24_4_ = fVar262 * auVar26._24_4_;
  auVar25._28_4_ = auVar27._28_4_;
  auVar26 = vsubps_avx(auVar378,auVar25);
  fVar238 = fVar238 + fVar238 * auVar26._0_4_;
  fVar257 = fVar257 + fVar257 * auVar26._4_4_;
  fVar258 = fVar258 + fVar258 * auVar26._8_4_;
  fVar259 = fVar259 + fVar259 * auVar26._12_4_;
  fVar260 = fVar260 + fVar260 * auVar26._16_4_;
  fVar261 = fVar261 + fVar261 * auVar26._20_4_;
  fVar262 = fVar262 + fVar262 * auVar26._24_4_;
  auVar25 = vrcpps_avx(auVar133);
  fVar264 = auVar25._0_4_;
  fVar272 = auVar25._4_4_;
  auVar30._4_4_ = fVar272 * auVar133._4_4_;
  auVar30._0_4_ = fVar264 * auVar133._0_4_;
  fVar274 = auVar25._8_4_;
  auVar30._8_4_ = fVar274 * auVar133._8_4_;
  fVar276 = auVar25._12_4_;
  auVar30._12_4_ = fVar276 * auVar133._12_4_;
  fVar278 = auVar25._16_4_;
  auVar30._16_4_ = fVar278 * auVar133._16_4_;
  fVar282 = auVar25._20_4_;
  auVar30._20_4_ = fVar282 * auVar133._20_4_;
  fVar287 = auVar25._24_4_;
  auVar30._24_4_ = fVar287 * auVar133._24_4_;
  auVar30._28_4_ = auVar133._28_4_;
  auVar133 = vsubps_avx(auVar378,auVar30);
  fVar264 = fVar264 + fVar264 * auVar133._0_4_;
  fVar272 = fVar272 + fVar272 * auVar133._4_4_;
  fVar274 = fVar274 + fVar274 * auVar133._8_4_;
  fVar276 = fVar276 + fVar276 * auVar133._12_4_;
  fVar278 = fVar278 + fVar278 * auVar133._16_4_;
  fVar282 = fVar282 + fVar282 * auVar133._20_4_;
  fVar287 = fVar287 + fVar287 * auVar133._24_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar105 * 9 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar376 = vpermilps_avx(auVar376,0);
  auVar294._16_16_ = auVar147;
  auVar294._0_16_ = auVar33;
  auVar133 = vcvtdq2ps_avx(auVar294);
  auVar353._16_16_ = auVar241;
  auVar353._0_16_ = auVar34;
  auVar25 = vcvtdq2ps_avx(auVar353);
  auVar25 = vsubps_avx(auVar25,auVar133);
  fVar115 = auVar376._0_4_;
  fVar173 = auVar376._4_4_;
  fVar174 = auVar376._8_4_;
  fVar175 = auVar376._12_4_;
  auVar295._0_4_ = auVar25._0_4_ * fVar115 + auVar133._0_4_;
  auVar295._4_4_ = auVar25._4_4_ * fVar173 + auVar133._4_4_;
  auVar295._8_4_ = auVar25._8_4_ * fVar174 + auVar133._8_4_;
  auVar295._12_4_ = auVar25._12_4_ * fVar175 + auVar133._12_4_;
  auVar295._16_4_ = auVar25._16_4_ * fVar115 + auVar133._16_4_;
  auVar295._20_4_ = auVar25._20_4_ * fVar173 + auVar133._20_4_;
  auVar295._24_4_ = auVar25._24_4_ * fVar174 + auVar133._24_4_;
  auVar295._28_4_ = auVar25._28_4_ + auVar133._28_4_;
  auVar315._16_16_ = auVar36;
  auVar315._0_16_ = auVar35;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 6);
  auVar33 = vpmovsxwd_avx(auVar376);
  auVar133 = vcvtdq2ps_avx(auVar315);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 0xe);
  auVar147 = vpmovsxwd_avx(auVar125);
  auVar354._16_16_ = auVar147;
  auVar354._0_16_ = auVar33;
  auVar25 = vcvtdq2ps_avx(auVar354);
  auVar25 = vsubps_avx(auVar25,auVar133);
  auVar316._0_4_ = auVar133._0_4_ + auVar25._0_4_ * fVar115;
  auVar316._4_4_ = auVar133._4_4_ + auVar25._4_4_ * fVar173;
  auVar316._8_4_ = auVar133._8_4_ + auVar25._8_4_ * fVar174;
  auVar316._12_4_ = auVar133._12_4_ + auVar25._12_4_ * fVar175;
  auVar316._16_4_ = auVar133._16_4_ + auVar25._16_4_ * fVar115;
  auVar316._20_4_ = auVar133._20_4_ + auVar25._20_4_ * fVar173;
  auVar316._24_4_ = auVar133._24_4_ + auVar25._24_4_ * fVar174;
  auVar316._28_4_ = auVar133._28_4_ + auVar25._28_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 6);
  auVar33 = vpmovsxwd_avx(auVar120);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar127);
  auVar355._16_16_ = auVar147;
  auVar355._0_16_ = auVar33;
  auVar133 = vcvtdq2ps_avx(auVar355);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar105 * 0x16 + 6);
  auVar33 = vpmovsxwd_avx(auVar119);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar105 * 0x16 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar126);
  auVar364._16_16_ = auVar147;
  auVar364._0_16_ = auVar33;
  auVar25 = vcvtdq2ps_avx(auVar364);
  auVar25 = vsubps_avx(auVar25,auVar133);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar105 * 0x14 + 6);
  auVar33 = vpmovsxwd_avx(auVar37);
  auVar356._0_4_ = auVar133._0_4_ + auVar25._0_4_ * fVar115;
  auVar356._4_4_ = auVar133._4_4_ + auVar25._4_4_ * fVar173;
  auVar356._8_4_ = auVar133._8_4_ + auVar25._8_4_ * fVar174;
  auVar356._12_4_ = auVar133._12_4_ + auVar25._12_4_ * fVar175;
  auVar356._16_4_ = auVar133._16_4_ + auVar25._16_4_ * fVar115;
  auVar356._20_4_ = auVar133._20_4_ + auVar25._20_4_ * fVar173;
  auVar356._24_4_ = auVar133._24_4_ + auVar25._24_4_ * fVar174;
  auVar356._28_4_ = auVar133._28_4_ + auVar25._28_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar105 * 0x14 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar151);
  auVar365._16_16_ = auVar147;
  auVar365._0_16_ = auVar33;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 6);
  auVar33 = vpmovsxwd_avx(auVar9);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar152);
  auVar133 = vcvtdq2ps_avx(auVar365);
  auVar379._16_16_ = auVar147;
  auVar379._0_16_ = auVar33;
  auVar25 = vcvtdq2ps_avx(auVar379);
  auVar25 = vsubps_avx(auVar25,auVar133);
  auVar366._0_4_ = auVar133._0_4_ + auVar25._0_4_ * fVar115;
  auVar366._4_4_ = auVar133._4_4_ + auVar25._4_4_ * fVar173;
  auVar366._8_4_ = auVar133._8_4_ + auVar25._8_4_ * fVar174;
  auVar366._12_4_ = auVar133._12_4_ + auVar25._12_4_ * fVar175;
  auVar366._16_4_ = auVar133._16_4_ + auVar25._16_4_ * fVar115;
  auVar366._20_4_ = auVar133._20_4_ + auVar25._20_4_ * fVar173;
  auVar366._24_4_ = auVar133._24_4_ + auVar25._24_4_ * fVar174;
  auVar366._28_4_ = auVar133._28_4_ + auVar25._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 6);
  auVar33 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 0xe);
  auVar147 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar105 * 0x21 + 6);
  auVar34 = vpmovsxwd_avx(auVar12);
  auVar380._16_16_ = auVar147;
  auVar380._0_16_ = auVar33;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar105 * 0x21 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar13);
  auVar399._16_16_ = auVar33;
  auVar399._0_16_ = auVar34;
  auVar133 = vcvtdq2ps_avx(auVar380);
  auVar25 = vcvtdq2ps_avx(auVar399);
  auVar25 = vsubps_avx(auVar25,auVar133);
  auVar381._0_4_ = auVar133._0_4_ + auVar25._0_4_ * fVar115;
  auVar381._4_4_ = auVar133._4_4_ + auVar25._4_4_ * fVar173;
  auVar381._8_4_ = auVar133._8_4_ + auVar25._8_4_ * fVar174;
  auVar381._12_4_ = auVar133._12_4_ + auVar25._12_4_ * fVar175;
  auVar381._16_4_ = auVar133._16_4_ + auVar25._16_4_ * fVar115;
  auVar381._20_4_ = auVar133._20_4_ + auVar25._20_4_ * fVar173;
  auVar381._24_4_ = auVar133._24_4_ + auVar25._24_4_ * fVar174;
  auVar381._28_4_ = auVar133._28_4_ + auVar25._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar105 * 0x1f + 6);
  auVar33 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar105 * 0x1f + 0xe);
  auVar147 = vpmovsxwd_avx(auVar15);
  auVar400._16_16_ = auVar147;
  auVar400._0_16_ = auVar33;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 6);
  auVar33 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar17);
  auVar421._16_16_ = auVar147;
  auVar421._0_16_ = auVar33;
  auVar133 = vcvtdq2ps_avx(auVar400);
  auVar25 = vcvtdq2ps_avx(auVar421);
  auVar25 = vsubps_avx(auVar25,auVar133);
  auVar401._0_4_ = auVar133._0_4_ + auVar25._0_4_ * fVar115;
  auVar401._4_4_ = auVar133._4_4_ + auVar25._4_4_ * fVar173;
  auVar401._8_4_ = auVar133._8_4_ + auVar25._8_4_ * fVar174;
  auVar401._12_4_ = auVar133._12_4_ + auVar25._12_4_ * fVar175;
  auVar401._16_4_ = auVar133._16_4_ + auVar25._16_4_ * fVar115;
  auVar401._20_4_ = auVar133._20_4_ + auVar25._20_4_ * fVar173;
  auVar401._24_4_ = auVar133._24_4_ + auVar25._24_4_ * fVar174;
  auVar401._28_4_ = auVar133._28_4_ + fVar175;
  auVar133 = vsubps_avx(auVar295,auVar158);
  auVar201._0_4_ = fVar219 * auVar133._0_4_;
  auVar201._4_4_ = fVar233 * auVar133._4_4_;
  auVar201._8_4_ = fVar234 * auVar133._8_4_;
  auVar201._12_4_ = fVar235 * auVar133._12_4_;
  auVar31._16_4_ = fVar200 * auVar133._16_4_;
  auVar31._0_16_ = auVar201;
  auVar31._20_4_ = fVar236 * auVar133._20_4_;
  auVar31._24_4_ = fVar237 * auVar133._24_4_;
  auVar31._28_4_ = auVar133._28_4_;
  auVar133 = vsubps_avx(auVar316,auVar158);
  auVar220._0_4_ = fVar219 * auVar133._0_4_;
  auVar220._4_4_ = fVar233 * auVar133._4_4_;
  auVar220._8_4_ = fVar234 * auVar133._8_4_;
  auVar220._12_4_ = fVar235 * auVar133._12_4_;
  auVar32._16_4_ = fVar200 * auVar133._16_4_;
  auVar32._0_16_ = auVar220;
  auVar32._20_4_ = fVar236 * auVar133._20_4_;
  auVar32._24_4_ = fVar237 * auVar133._24_4_;
  auVar32._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar133 = vsubps_avx(auVar356,auVar131);
  auVar145._0_4_ = fVar238 * auVar133._0_4_;
  auVar145._4_4_ = fVar257 * auVar133._4_4_;
  auVar145._8_4_ = fVar258 * auVar133._8_4_;
  auVar145._12_4_ = fVar259 * auVar133._12_4_;
  auVar27._16_4_ = fVar260 * auVar133._16_4_;
  auVar27._0_16_ = auVar145;
  auVar27._20_4_ = fVar261 * auVar133._20_4_;
  auVar27._24_4_ = fVar262 * auVar133._24_4_;
  auVar27._28_4_ = auVar133._28_4_;
  auVar133 = vsubps_avx(auVar366,auVar131);
  auVar239._0_4_ = fVar238 * auVar133._0_4_;
  auVar239._4_4_ = fVar257 * auVar133._4_4_;
  auVar239._8_4_ = fVar258 * auVar133._8_4_;
  auVar239._12_4_ = fVar259 * auVar133._12_4_;
  auVar29._16_4_ = fVar260 * auVar133._16_4_;
  auVar29._0_16_ = auVar239;
  auVar29._20_4_ = fVar261 * auVar133._20_4_;
  auVar29._24_4_ = fVar262 * auVar133._24_4_;
  auVar29._28_4_ = auVar28._28_4_ + auVar26._28_4_;
  auVar133 = vsubps_avx(auVar381,auVar192);
  auVar116._0_4_ = fVar264 * auVar133._0_4_;
  auVar116._4_4_ = fVar272 * auVar133._4_4_;
  auVar116._8_4_ = fVar274 * auVar133._8_4_;
  auVar116._12_4_ = fVar276 * auVar133._12_4_;
  auVar26._16_4_ = fVar278 * auVar133._16_4_;
  auVar26._0_16_ = auVar116;
  auVar26._20_4_ = fVar282 * auVar133._20_4_;
  auVar26._24_4_ = fVar287 * auVar133._24_4_;
  auVar26._28_4_ = auVar133._28_4_;
  auVar133 = vsubps_avx(auVar401,auVar192);
  auVar176._0_4_ = fVar264 * auVar133._0_4_;
  auVar176._4_4_ = fVar272 * auVar133._4_4_;
  auVar176._8_4_ = fVar274 * auVar133._8_4_;
  auVar176._12_4_ = fVar276 * auVar133._12_4_;
  auVar38._16_4_ = fVar278 * auVar133._16_4_;
  auVar38._0_16_ = auVar176;
  auVar38._20_4_ = fVar282 * auVar133._20_4_;
  auVar38._24_4_ = fVar287 * auVar133._24_4_;
  auVar38._28_4_ = auVar133._28_4_;
  auVar33 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar147 = vpminsd_avx(auVar201,auVar220);
  auVar317._16_16_ = auVar33;
  auVar317._0_16_ = auVar147;
  auVar33 = vpminsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar147 = vpminsd_avx(auVar145,auVar239);
  auVar357._16_16_ = auVar33;
  auVar357._0_16_ = auVar147;
  auVar133 = vmaxps_avx(auVar317,auVar357);
  auVar33 = vpminsd_avx(auVar26._16_16_,auVar38._16_16_);
  auVar147 = vpminsd_avx(auVar116,auVar176);
  auVar422._16_16_ = auVar33;
  auVar422._0_16_ = auVar147;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar426._4_4_ = uVar8;
  auVar426._0_4_ = uVar8;
  auVar426._8_4_ = uVar8;
  auVar426._12_4_ = uVar8;
  auVar426._16_4_ = uVar8;
  auVar426._20_4_ = uVar8;
  auVar426._24_4_ = uVar8;
  auVar426._28_4_ = uVar8;
  auVar25 = vmaxps_avx(auVar422,auVar426);
  auVar133 = vmaxps_avx(auVar133,auVar25);
  local_3c0._4_4_ = auVar133._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar133._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar133._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar133._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar133._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar133._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar133._24_4_ * 0.99999964;
  local_3c0._28_4_ = auVar133._28_4_;
  auVar33 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar147 = vpmaxsd_avx(auVar201,auVar220);
  auVar213._16_16_ = auVar33;
  auVar213._0_16_ = auVar147;
  auVar33 = vpmaxsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar147 = vpmaxsd_avx(auVar145,auVar239);
  auVar159._16_16_ = auVar33;
  auVar159._0_16_ = auVar147;
  auVar133 = vminps_avx(auVar213,auVar159);
  auVar33 = vpmaxsd_avx(auVar26._16_16_,auVar38._16_16_);
  auVar147 = vpmaxsd_avx(auVar116,auVar176);
  auVar132._16_16_ = auVar33;
  auVar132._0_16_ = auVar147;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar193._4_4_ = uVar8;
  auVar193._0_4_ = uVar8;
  auVar193._8_4_ = uVar8;
  auVar193._12_4_ = uVar8;
  auVar193._16_4_ = uVar8;
  auVar193._20_4_ = uVar8;
  auVar193._24_4_ = uVar8;
  auVar193._28_4_ = uVar8;
  auVar25 = vminps_avx(auVar132,auVar193);
  auVar133 = vminps_avx(auVar133,auVar25);
  auVar39._4_4_ = auVar133._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar133._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar133._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar133._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar133._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar133._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar133._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar133._28_4_;
  auVar133 = vcmpps_avx(local_3c0,auVar39,2);
  auVar33 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar160._16_16_ = auVar33;
  auVar160._0_16_ = auVar33;
  auVar25 = vcvtdq2ps_avx(auVar160);
  auVar25 = vcmpps_avx(_DAT_01f7b060,auVar25,1);
  auVar133 = vandps_avx(auVar133,auVar25);
  uVar109 = vmovmskps_avx(auVar133);
  auVar133._16_16_ = mm_lookupmask_ps._240_16_;
  auVar133._0_16_ = mm_lookupmask_ps._240_16_;
  local_640 = vblendps_avx(auVar133,ZEXT832(0) << 0x20,0x80);
  local_930 = prim;
LAB_00ad1a96:
  local_928 = (ulong)uVar109;
  if (local_928 == 0) {
LAB_00ad45dd:
    return local_928 != 0;
  }
  lVar107 = 0;
  if (local_928 != 0) {
    for (; (uVar109 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
    }
  }
  uVar109 = *(uint *)(local_930 + 2);
  pGVar19 = (context->scene->geometries).items[uVar109].ptr;
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                            (ulong)*(uint *)(local_930 + lVar107 * 4 + 6) *
                            pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar219 = (pGVar19->time_range).lower;
  fVar219 = pGVar19->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar219) / ((pGVar19->time_range).upper - fVar219));
  auVar33 = vroundss_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),9);
  auVar33 = vminss_avx(auVar33,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar33 = vmaxss_avx(ZEXT816(0) << 0x20,auVar33);
  fVar219 = fVar219 - auVar33._0_4_;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar110 = (long)(int)auVar33._0_4_ * 0x38;
  lVar21 = *(long *)(_Var20 + 0x10 + lVar110);
  lVar22 = *(long *)(_Var20 + 0x38 + lVar110);
  lVar23 = *(long *)(_Var20 + 0x48 + lVar110);
  auVar33 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
  pfVar1 = (float *)(lVar22 + uVar105 * lVar23);
  fVar174 = auVar33._0_4_;
  fVar235 = auVar33._4_4_;
  fVar175 = auVar33._8_4_;
  fVar200 = auVar33._12_4_;
  pfVar2 = (float *)(lVar22 + (uVar105 + 1) * lVar23);
  pfVar3 = (float *)(lVar22 + (uVar105 + 2) * lVar23);
  pfVar4 = (float *)(lVar22 + lVar23 * (uVar105 + 3));
  lVar22 = *(long *)(_Var20 + lVar110);
  auVar33 = vshufps_avx(ZEXT416((uint)(1.0 - fVar219)),ZEXT416((uint)(1.0 - fVar219)),0);
  pfVar5 = (float *)(lVar22 + lVar21 * uVar105);
  fVar115 = auVar33._0_4_;
  fVar233 = auVar33._4_4_;
  fVar173 = auVar33._8_4_;
  fVar234 = auVar33._12_4_;
  pfVar6 = (float *)(lVar22 + lVar21 * (uVar105 + 1));
  pfVar7 = (float *)(lVar22 + lVar21 * (uVar105 + 2));
  auVar177._0_4_ = fVar174 * *pfVar1 + fVar115 * *pfVar5;
  auVar177._4_4_ = fVar235 * pfVar1[1] + fVar233 * pfVar5[1];
  auVar177._8_4_ = fVar175 * pfVar1[2] + fVar173 * pfVar5[2];
  auVar177._12_4_ = fVar200 * pfVar1[3] + fVar234 * pfVar5[3];
  auVar146._0_4_ = fVar115 * *pfVar6 + fVar174 * *pfVar2;
  auVar146._4_4_ = fVar233 * pfVar6[1] + fVar235 * pfVar2[1];
  auVar146._8_4_ = fVar173 * pfVar6[2] + fVar175 * pfVar2[2];
  auVar146._12_4_ = fVar234 * pfVar6[3] + fVar200 * pfVar2[3];
  pfVar1 = (float *)(lVar22 + lVar21 * (uVar105 + 3));
  auVar202._0_4_ = fVar115 * *pfVar7 + fVar174 * *pfVar3;
  auVar202._4_4_ = fVar233 * pfVar7[1] + fVar235 * pfVar3[1];
  auVar202._8_4_ = fVar173 * pfVar7[2] + fVar175 * pfVar3[2];
  auVar202._12_4_ = fVar234 * pfVar7[3] + fVar200 * pfVar3[3];
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar147 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar219 = *(float *)(ray + k * 4 + 0x40);
  auVar377._4_4_ = fVar219;
  auVar377._0_4_ = fVar219;
  auVar377._8_4_ = fVar219;
  auVar377._12_4_ = fVar219;
  auVar382._16_4_ = fVar219;
  auVar382._0_16_ = auVar377;
  auVar382._20_4_ = fVar219;
  auVar382._24_4_ = fVar219;
  auVar382._28_4_ = fVar219;
  auVar387 = ZEXT3264(auVar382);
  auVar240._0_4_ = fVar115 * *pfVar1 + fVar174 * *pfVar4;
  auVar240._4_4_ = fVar233 * pfVar1[1] + fVar235 * pfVar4[1];
  auVar240._8_4_ = fVar173 * pfVar1[2] + fVar175 * pfVar4[2];
  auVar240._12_4_ = fVar234 * pfVar1[3] + fVar200 * pfVar4[3];
  fVar115 = *(float *)(ray + k * 4 + 0x50);
  auVar397._4_4_ = fVar115;
  auVar397._0_4_ = fVar115;
  auVar397._8_4_ = fVar115;
  auVar397._12_4_ = fVar115;
  fStack_a10 = fVar115;
  _local_a20 = auVar397;
  fStack_a0c = fVar115;
  fStack_a08 = fVar115;
  fStack_a04 = fVar115;
  auVar404 = ZEXT3264(_local_a20);
  auVar33 = vunpcklps_avx(auVar377,auVar397);
  fVar233 = *(float *)(ray + k * 4 + 0x60);
  auVar417._4_4_ = fVar233;
  auVar417._0_4_ = fVar233;
  auVar417._8_4_ = fVar233;
  auVar417._12_4_ = fVar233;
  fStack_770 = fVar233;
  _local_780 = auVar417;
  fStack_76c = fVar233;
  fStack_768 = fVar233;
  fStack_764 = fVar233;
  _local_9f0 = vinsertps_avx(auVar33,auVar417,0x28);
  auVar359 = ZEXT1664(_local_9f0);
  auVar117._0_4_ = (auVar177._0_4_ + auVar146._0_4_ + auVar202._0_4_ + auVar240._0_4_) * 0.25;
  auVar117._4_4_ = (auVar177._4_4_ + auVar146._4_4_ + auVar202._4_4_ + auVar240._4_4_) * 0.25;
  auVar117._8_4_ = (auVar177._8_4_ + auVar146._8_4_ + auVar202._8_4_ + auVar240._8_4_) * 0.25;
  auVar117._12_4_ = (auVar177._12_4_ + auVar146._12_4_ + auVar202._12_4_ + auVar240._12_4_) * 0.25;
  auVar33 = vsubps_avx(auVar117,auVar147);
  auVar33 = vdpps_avx(auVar33,_local_9f0,0x7f);
  local_a00 = vdpps_avx(_local_9f0,_local_9f0,0x7f);
  auVar368 = ZEXT1664(local_a00);
  auVar34 = vrcpss_avx(local_a00,local_a00);
  fVar173 = auVar33._0_4_ * auVar34._0_4_ * (2.0 - local_a00._0_4_ * auVar34._0_4_);
  auVar300 = ZEXT464((uint)fVar173);
  auVar34 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
  auVar221._0_4_ = auVar147._0_4_ + local_9f0._0_4_ * auVar34._0_4_;
  auVar221._4_4_ = auVar147._4_4_ + local_9f0._4_4_ * auVar34._4_4_;
  auVar221._8_4_ = auVar147._8_4_ + local_9f0._8_4_ * auVar34._8_4_;
  auVar221._12_4_ = auVar147._12_4_ + local_9f0._12_4_ * auVar34._12_4_;
  auVar33 = vblendps_avx(auVar221,_DAT_01f45a50,8);
  auVar241 = vsubps_avx(auVar177,auVar33);
  auVar271 = ZEXT1664(auVar241);
  auVar35 = vsubps_avx(auVar202,auVar33);
  auVar36 = vsubps_avx(auVar146,auVar33);
  auVar376 = vsubps_avx(auVar240,auVar33);
  auVar33 = vshufps_avx(auVar241,auVar241,0);
  auVar437._16_16_ = auVar33;
  auVar437._0_16_ = auVar33;
  auVar438 = ZEXT3264(auVar437);
  auVar147 = vshufps_avx(auVar241,auVar241,0x55);
  register0x00001250 = auVar147;
  _local_1e0 = auVar147;
  auVar147 = vshufps_avx(auVar241,auVar241,0xaa);
  register0x00001250 = auVar147;
  _local_200 = auVar147;
  _local_aa0 = auVar241;
  auVar147 = vshufps_avx(auVar241,auVar241,0xff);
  register0x00001290 = auVar147;
  _local_220 = auVar147;
  auVar147 = vshufps_avx(auVar36,auVar36,0);
  register0x00001290 = auVar147;
  _local_240 = auVar147;
  auVar147 = vshufps_avx(auVar36,auVar36,0x55);
  register0x00001290 = auVar147;
  _local_260 = auVar147;
  auVar147 = vshufps_avx(auVar36,auVar36,0xaa);
  register0x00001290 = auVar147;
  _local_280 = auVar147;
  _local_9a0 = auVar36;
  auVar147 = vshufps_avx(auVar36,auVar36,0xff);
  register0x00001290 = auVar147;
  _local_520 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0);
  register0x00001290 = auVar147;
  _local_540 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0x55);
  register0x00001290 = auVar147;
  _local_560 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0xaa);
  register0x00001290 = auVar147;
  _local_580 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0xff);
  register0x00001290 = auVar147;
  _local_5a0 = auVar147;
  auVar147 = vshufps_avx(auVar376,auVar376,0);
  register0x00001290 = auVar147;
  _local_5c0 = auVar147;
  auVar147 = vshufps_avx(auVar376,auVar376,0x55);
  register0x00001290 = auVar147;
  _local_5e0 = auVar147;
  auVar147 = vshufps_avx(auVar376,auVar376,0xaa);
  register0x00001290 = auVar147;
  _local_600 = auVar147;
  auVar147 = vshufps_avx(auVar376,auVar376,0xff);
  register0x00001290 = auVar147;
  _local_620 = auVar147;
  auVar147 = ZEXT416((uint)(fVar219 * fVar219 + fVar115 * fVar115 + fVar233 * fVar233));
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  local_2a0._16_16_ = auVar147;
  local_2a0._0_16_ = auVar147;
  fVar115 = *(float *)(ray + k * 4 + 0x30);
  local_950 = ZEXT416((uint)fVar173);
  auVar147 = vshufps_avx(ZEXT416((uint)(fVar115 - fVar173)),ZEXT416((uint)(fVar115 - fVar173)),0);
  local_3a0._16_16_ = auVar147;
  local_3a0._0_16_ = auVar147;
  local_850 = vpshufd_avx(ZEXT416(uVar109),0);
  local_860 = vpshufd_avx(ZEXT416(*(uint *)(local_930 + lVar107 * 4 + 6)),0);
  register0x00001210 = auVar34;
  _local_9e0 = auVar34;
  uVar106 = 0;
  bVar112 = 0;
  local_ca8 = 1;
  auVar134._8_4_ = 0x7fffffff;
  auVar134._0_8_ = 0x7fffffff7fffffff;
  auVar134._12_4_ = 0x7fffffff;
  auVar134._16_4_ = 0x7fffffff;
  auVar134._20_4_ = 0x7fffffff;
  auVar134._24_4_ = 0x7fffffff;
  auVar134._28_4_ = 0x7fffffff;
  local_680 = vandps_avx(local_2a0,auVar134);
  auVar147 = vsqrtss_avx(local_a00,local_a00);
  auVar34 = vsqrtss_avx(local_a00,local_a00);
  local_6b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar248._8_4_ = 0x3f800000;
    auVar248._0_8_ = 0x3f8000003f800000;
    auVar248._12_4_ = 0x3f800000;
    auVar248._16_4_ = 0x3f800000;
    auVar248._20_4_ = 0x3f800000;
    auVar248._24_4_ = 0x3f800000;
    auVar248._28_4_ = 0x3f800000;
    auVar241 = vmovshdup_avx(local_6b0);
    auVar125 = vsubps_avx(auVar241,local_6b0);
    auVar241 = vshufps_avx(local_6b0,local_6b0,0);
    auVar36 = vshufps_avx(auVar125,auVar125,0);
    fVar435 = auVar36._0_4_;
    fVar439 = auVar36._4_4_;
    fVar440 = auVar36._8_4_;
    fVar441 = auVar36._12_4_;
    fVar442 = auVar241._0_4_;
    auVar214._0_4_ = fVar442 + fVar435 * 0.0;
    fVar443 = auVar241._4_4_;
    auVar214._4_4_ = fVar443 + fVar439 * 0.14285715;
    fVar444 = auVar241._8_4_;
    auVar214._8_4_ = fVar444 + fVar440 * 0.2857143;
    fVar199 = auVar241._12_4_;
    auVar214._12_4_ = fVar199 + fVar441 * 0.42857146;
    auVar214._16_4_ = fVar442 + fVar435 * 0.5714286;
    auVar214._20_4_ = fVar443 + fVar439 * 0.71428573;
    auVar214._24_4_ = fVar444 + fVar440 * 0.8571429;
    auVar214._28_4_ = fVar199 + fVar441;
    auVar133 = vsubps_avx(auVar248,auVar214);
    fVar233 = auVar133._0_4_;
    fVar173 = auVar133._4_4_;
    fVar234 = auVar133._8_4_;
    fVar174 = auVar133._12_4_;
    fVar235 = auVar133._16_4_;
    fVar175 = auVar133._20_4_;
    fVar200 = auVar133._24_4_;
    fVar237 = fVar233 * fVar233 * fVar233;
    fVar238 = fVar173 * fVar173 * fVar173;
    fVar258 = fVar234 * fVar234 * fVar234;
    fVar260 = fVar174 * fVar174 * fVar174;
    fVar262 = fVar235 * fVar235 * fVar235;
    fVar283 = fVar175 * fVar175 * fVar175;
    fVar288 = fVar200 * fVar200 * fVar200;
    fVar292 = auVar214._0_4_ * auVar214._0_4_ * auVar214._0_4_;
    fVar301 = auVar214._4_4_ * auVar214._4_4_ * auVar214._4_4_;
    fVar302 = auVar214._8_4_ * auVar214._8_4_ * auVar214._8_4_;
    fVar303 = auVar214._12_4_ * auVar214._12_4_ * auVar214._12_4_;
    fVar304 = auVar214._16_4_ * auVar214._16_4_ * auVar214._16_4_;
    fVar305 = auVar214._20_4_ * auVar214._20_4_ * auVar214._20_4_;
    fVar306 = auVar214._24_4_ * auVar214._24_4_ * auVar214._24_4_;
    fVar236 = auVar214._0_4_ * fVar233;
    fVar264 = auVar214._4_4_ * fVar173;
    fVar272 = auVar214._8_4_ * fVar234;
    fVar274 = auVar214._12_4_ * fVar174;
    fVar276 = auVar214._16_4_ * fVar235;
    fVar282 = auVar214._20_4_ * fVar175;
    fVar287 = auVar214._24_4_ * fVar200;
    fVar278 = auVar368._28_4_ + auVar404._28_4_;
    fVar349 = auVar300._28_4_ + 1.0 + fVar278;
    fVar360 = fVar278 + auVar271._28_4_ + auVar387._28_4_ + auVar359._28_4_;
    fVar278 = fVar237 * 0.16666667;
    fVar257 = fVar238 * 0.16666667;
    fVar259 = fVar258 * 0.16666667;
    fVar261 = fVar260 * 0.16666667;
    fVar279 = fVar262 * 0.16666667;
    fVar284 = fVar283 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar307 = (fVar292 + fVar237 * 4.0 + fVar233 * fVar236 * 12.0 + auVar214._0_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar319 = (fVar301 + fVar238 * 4.0 + fVar173 * fVar264 * 12.0 + auVar214._4_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar324 = (fVar302 + fVar258 * 4.0 + fVar234 * fVar272 * 12.0 + auVar214._8_4_ * fVar272 * 6.0)
              * 0.16666667;
    fVar329 = (fVar303 + fVar260 * 4.0 + fVar174 * fVar274 * 12.0 + auVar214._12_4_ * fVar274 * 6.0)
              * 0.16666667;
    fVar334 = (fVar304 + fVar262 * 4.0 + fVar235 * fVar276 * 12.0 + auVar214._16_4_ * fVar276 * 6.0)
              * 0.16666667;
    fVar339 = (fVar305 + fVar283 * 4.0 + fVar175 * fVar282 * 12.0 + auVar214._20_4_ * fVar282 * 6.0)
              * 0.16666667;
    fVar344 = (fVar306 + fVar288 * 4.0 + fVar200 * fVar287 * 12.0 + auVar214._24_4_ * fVar287 * 6.0)
              * 0.16666667;
    fVar237 = (fVar292 * 4.0 + fVar237 + auVar214._0_4_ * fVar236 * 12.0 + fVar233 * fVar236 * 6.0)
              * 0.16666667;
    fVar238 = (fVar301 * 4.0 + fVar238 + auVar214._4_4_ * fVar264 * 12.0 + fVar173 * fVar264 * 6.0)
              * 0.16666667;
    fVar258 = (fVar302 * 4.0 + fVar258 + auVar214._8_4_ * fVar272 * 12.0 + fVar234 * fVar272 * 6.0)
              * 0.16666667;
    fVar260 = (fVar303 * 4.0 + fVar260 + auVar214._12_4_ * fVar274 * 12.0 + fVar174 * fVar274 * 6.0)
              * 0.16666667;
    fVar262 = (fVar304 * 4.0 + fVar262 + auVar214._16_4_ * fVar276 * 12.0 + fVar235 * fVar276 * 6.0)
              * 0.16666667;
    fVar283 = (fVar305 * 4.0 + fVar283 + auVar214._20_4_ * fVar282 * 12.0 + fVar175 * fVar282 * 6.0)
              * 0.16666667;
    fVar288 = (fVar306 * 4.0 + fVar288 + auVar214._24_4_ * fVar287 * 12.0 + fVar200 * fVar287 * 6.0)
              * 0.16666667;
    fVar292 = fVar292 * 0.16666667;
    fVar301 = fVar301 * 0.16666667;
    fVar302 = fVar302 * 0.16666667;
    fVar303 = fVar303 * 0.16666667;
    fVar304 = fVar304 * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar394 = auVar387._28_4_ + 12.0;
    fVar361 = fVar360 + 12.166667;
    fVar308 = auVar438._0_4_ * fVar278 +
              fVar307 * (float)local_240._0_4_ +
              fVar292 * (float)local_5c0._0_4_ + fVar237 * (float)local_540._0_4_;
    fVar320 = auVar438._4_4_ * fVar257 +
              fVar319 * (float)local_240._4_4_ +
              fVar301 * (float)local_5c0._4_4_ + fVar238 * (float)local_540._4_4_;
    fVar325 = auVar438._8_4_ * fVar259 +
              fVar324 * fStack_238 + fVar302 * fStack_5b8 + fVar258 * fStack_538;
    fVar330 = auVar438._12_4_ * fVar261 +
              fVar329 * fStack_234 + fVar303 * fStack_5b4 + fVar260 * fStack_534;
    fVar335 = auVar438._16_4_ * fVar279 +
              fVar334 * fStack_230 + fVar304 * fStack_5b0 + fVar262 * fStack_530;
    fVar340 = auVar438._20_4_ * fVar284 +
              fVar339 * fStack_22c + fVar305 * fStack_5ac + fVar283 * fStack_52c;
    fVar345 = auVar438._24_4_ * fVar289 +
              fVar344 * fStack_228 + fVar306 * fStack_5a8 + fVar288 * fStack_528;
    fVar350 = fVar349 + fVar361;
    fVar309 = (float)local_1e0._0_4_ * fVar278 +
              (float)local_260._0_4_ * fVar307 +
              fVar292 * (float)local_5e0._0_4_ + fVar237 * (float)local_560._0_4_;
    fVar321 = (float)local_1e0._4_4_ * fVar257 +
              (float)local_260._4_4_ * fVar319 +
              fVar301 * (float)local_5e0._4_4_ + fVar238 * (float)local_560._4_4_;
    fVar326 = fStack_1d8 * fVar259 +
              fStack_258 * fVar324 + fVar302 * fStack_5d8 + fVar258 * fStack_558;
    fVar331 = fStack_1d4 * fVar261 +
              fStack_254 * fVar329 + fVar303 * fStack_5d4 + fVar260 * fStack_554;
    fVar336 = fStack_1d0 * fVar279 +
              fStack_250 * fVar334 + fVar304 * fStack_5d0 + fVar262 * fStack_550;
    fVar341 = fStack_1cc * fVar284 +
              fStack_24c * fVar339 + fVar305 * fStack_5cc + fVar283 * fStack_54c;
    fVar346 = fStack_1c8 * fVar289 +
              fStack_248 * fVar344 + fVar306 * fStack_5c8 + fVar288 * fStack_548;
    fVar351 = fVar350 + fVar394 + 12.166667;
    local_9c0 = (float)local_200._0_4_ * fVar278 +
                (float)local_280._0_4_ * fVar307 +
                fVar292 * (float)local_600._0_4_ + fVar237 * (float)local_580._0_4_;
    fStack_9bc = (float)local_200._4_4_ * fVar257 +
                 (float)local_280._4_4_ * fVar319 +
                 fVar301 * (float)local_600._4_4_ + fVar238 * (float)local_580._4_4_;
    fStack_9b8 = fStack_1f8 * fVar259 +
                 fStack_278 * fVar324 + fVar302 * fStack_5f8 + fVar258 * fStack_578;
    fStack_9b4 = fStack_1f4 * fVar261 +
                 fStack_274 * fVar329 + fVar303 * fStack_5f4 + fVar260 * fStack_574;
    fStack_9b0 = fStack_1f0 * fVar279 +
                 fStack_270 * fVar334 + fVar304 * fStack_5f0 + fVar262 * fStack_570;
    fStack_9ac = fStack_1ec * fVar284 +
                 fStack_26c * fVar339 + fVar305 * fStack_5ec + fVar283 * fStack_56c;
    fStack_9a8 = fStack_1e8 * fVar289 +
                 fStack_268 * fVar344 + fVar306 * fStack_5e8 + fVar288 * fStack_568;
    fStack_9a4 = fVar351 + fVar394 + auVar404._28_4_ + 12.0;
    local_b20._0_4_ =
         (float)local_220._0_4_ * fVar278 +
         fVar307 * (float)local_520._0_4_ +
         fVar237 * (float)local_5a0._0_4_ + fVar292 * (float)local_620._0_4_;
    local_b20._4_4_ =
         (float)local_220._4_4_ * fVar257 +
         fVar319 * (float)local_520._4_4_ +
         fVar238 * (float)local_5a0._4_4_ + fVar301 * (float)local_620._4_4_;
    fStack_b18 = fStack_218 * fVar259 +
                 fVar324 * fStack_518 + fVar258 * fStack_598 + fVar302 * fStack_618;
    fStack_b14 = fStack_214 * fVar261 +
                 fVar329 * fStack_514 + fVar260 * fStack_594 + fVar303 * fStack_614;
    fStack_b10 = fStack_210 * fVar279 +
                 fVar334 * fStack_510 + fVar262 * fStack_590 + fVar304 * fStack_610;
    fStack_b0c = fStack_20c * fVar284 +
                 fVar339 * fStack_50c + fVar283 * fStack_58c + fVar305 * fStack_60c;
    fStack_b08 = fStack_208 * fVar289 +
                 fVar344 * fStack_508 + fVar288 * fStack_588 + fVar306 * fStack_608;
    fStack_b04 = auVar271._28_4_ + fVar349 + fVar360 + auVar300._28_4_;
    auVar40._4_4_ = auVar214._4_4_ * -auVar214._4_4_;
    auVar40._0_4_ = auVar214._0_4_ * -auVar214._0_4_;
    auVar40._8_4_ = auVar214._8_4_ * -auVar214._8_4_;
    auVar40._12_4_ = auVar214._12_4_ * -auVar214._12_4_;
    auVar40._16_4_ = auVar214._16_4_ * -auVar214._16_4_;
    auVar40._20_4_ = auVar214._20_4_ * -auVar214._20_4_;
    auVar40._24_4_ = auVar214._24_4_ * -auVar214._24_4_;
    auVar40._28_4_ = auVar214._28_4_;
    auVar41._4_4_ = fVar264 * 4.0;
    auVar41._0_4_ = fVar236 * 4.0;
    auVar41._8_4_ = fVar272 * 4.0;
    auVar41._12_4_ = fVar274 * 4.0;
    auVar41._16_4_ = fVar276 * 4.0;
    auVar41._20_4_ = fVar282 * 4.0;
    auVar41._24_4_ = fVar287 * 4.0;
    auVar41._28_4_ = 0x3f800000;
    auVar133 = vsubps_avx(auVar40,auVar41);
    fVar283 = fVar233 * -fVar233 * 0.5;
    fVar284 = fVar173 * -fVar173 * 0.5;
    fVar288 = fVar234 * -fVar234 * 0.5;
    fVar289 = fVar174 * -fVar174 * 0.5;
    fVar302 = fVar235 * -fVar235 * 0.5;
    fVar303 = fVar175 * -fVar175 * 0.5;
    fVar304 = fVar200 * -fVar200 * 0.5;
    fVar238 = auVar133._0_4_ * 0.5;
    fVar257 = auVar133._4_4_ * 0.5;
    fVar258 = auVar133._8_4_ * 0.5;
    fVar259 = auVar133._12_4_ * 0.5;
    fVar261 = auVar133._16_4_ * 0.5;
    fVar262 = auVar133._20_4_ * 0.5;
    fVar279 = auVar133._24_4_ * 0.5;
    fVar237 = (fVar233 * fVar233 + fVar236 * 4.0) * 0.5;
    fVar264 = (fVar173 * fVar173 + fVar264 * 4.0) * 0.5;
    fVar272 = (fVar234 * fVar234 + fVar272 * 4.0) * 0.5;
    fVar274 = (fVar174 * fVar174 + fVar274 * 4.0) * 0.5;
    fVar278 = (fVar235 * fVar235 + fVar276 * 4.0) * 0.5;
    fVar282 = (fVar175 * fVar175 + fVar282 * 4.0) * 0.5;
    fVar287 = (fVar200 * fVar200 + fVar287 * 4.0) * 0.5;
    fVar233 = auVar214._0_4_ * auVar214._0_4_ * 0.5;
    fVar173 = auVar214._4_4_ * auVar214._4_4_ * 0.5;
    fVar234 = auVar214._8_4_ * auVar214._8_4_ * 0.5;
    fVar174 = auVar214._12_4_ * auVar214._12_4_ * 0.5;
    fVar175 = auVar214._16_4_ * auVar214._16_4_ * 0.5;
    fVar200 = auVar214._20_4_ * auVar214._20_4_ * 0.5;
    fVar236 = auVar214._24_4_ * auVar214._24_4_ * 0.5;
    auVar241 = vpermilps_avx(ZEXT416((uint)(auVar125._0_4_ * 0.04761905)),0);
    fVar235 = auVar241._0_4_;
    fVar310 = fVar235 * (auVar438._0_4_ * fVar283 +
                        (float)local_240._0_4_ * fVar238 +
                        fVar237 * (float)local_540._0_4_ + fVar233 * (float)local_5c0._0_4_);
    fVar276 = auVar241._4_4_;
    fVar322 = fVar276 * (auVar438._4_4_ * fVar284 +
                        (float)local_240._4_4_ * fVar257 +
                        fVar264 * (float)local_540._4_4_ + fVar173 * (float)local_5c0._4_4_);
    auVar42._4_4_ = fVar322;
    auVar42._0_4_ = fVar310;
    fVar260 = auVar241._8_4_;
    fVar327 = fVar260 * (auVar438._8_4_ * fVar288 +
                        fStack_238 * fVar258 + fVar272 * fStack_538 + fVar234 * fStack_5b8);
    auVar42._8_4_ = fVar327;
    fVar292 = auVar241._12_4_;
    fVar332 = fVar292 * (auVar438._12_4_ * fVar289 +
                        fStack_234 * fVar259 + fVar274 * fStack_534 + fVar174 * fStack_5b4);
    auVar42._12_4_ = fVar332;
    fVar337 = fVar235 * (auVar438._16_4_ * fVar302 +
                        fStack_230 * fVar261 + fVar278 * fStack_530 + fVar175 * fStack_5b0);
    auVar42._16_4_ = fVar337;
    fVar342 = fVar276 * (auVar438._20_4_ * fVar303 +
                        fStack_22c * fVar262 + fVar282 * fStack_52c + fVar200 * fStack_5ac);
    auVar42._20_4_ = fVar342;
    fVar347 = fVar260 * (auVar438._24_4_ * fVar304 +
                        fStack_228 * fVar279 + fVar287 * fStack_528 + fVar236 * fStack_5a8);
    auVar42._24_4_ = fVar347;
    auVar42._28_4_ = fStack_9a4 + fVar361;
    fVar375 = fVar235 * ((float)local_1e0._0_4_ * fVar283 +
                        (float)local_260._0_4_ * fVar238 +
                        fVar237 * (float)local_560._0_4_ + fVar233 * (float)local_5e0._0_4_);
    fVar388 = fVar276 * ((float)local_1e0._4_4_ * fVar284 +
                        (float)local_260._4_4_ * fVar257 +
                        fVar264 * (float)local_560._4_4_ + fVar173 * (float)local_5e0._4_4_);
    auVar43._4_4_ = fVar388;
    auVar43._0_4_ = fVar375;
    fVar389 = fVar260 * (fStack_1d8 * fVar288 +
                        fStack_258 * fVar258 + fVar272 * fStack_558 + fVar234 * fStack_5d8);
    auVar43._8_4_ = fVar389;
    fVar390 = fVar292 * (fStack_1d4 * fVar289 +
                        fStack_254 * fVar259 + fVar274 * fStack_554 + fVar174 * fStack_5d4);
    auVar43._12_4_ = fVar390;
    fVar391 = fVar235 * (fStack_1d0 * fVar302 +
                        fStack_250 * fVar261 + fVar278 * fStack_550 + fVar175 * fStack_5d0);
    auVar43._16_4_ = fVar391;
    fVar392 = fVar276 * (fStack_1cc * fVar303 +
                        fStack_24c * fVar262 + fVar282 * fStack_54c + fVar200 * fStack_5cc);
    auVar43._20_4_ = fVar392;
    fVar393 = fVar260 * (fStack_1c8 * fVar304 +
                        fStack_248 * fVar279 + fVar287 * fStack_548 + fVar236 * fStack_5c8);
    auVar43._24_4_ = fVar393;
    auVar43._28_4_ = fStack_204;
    fVar395 = fVar235 * ((float)local_200._0_4_ * fVar283 +
                        fVar233 * (float)local_600._0_4_ + fVar237 * (float)local_580._0_4_ +
                        (float)local_280._0_4_ * fVar238);
    fVar405 = fVar276 * ((float)local_200._4_4_ * fVar284 +
                        fVar173 * (float)local_600._4_4_ + fVar264 * (float)local_580._4_4_ +
                        (float)local_280._4_4_ * fVar257);
    local_a40._4_4_ = fVar405;
    local_a40._0_4_ = fVar395;
    fVar407 = fVar260 * (fStack_1f8 * fVar288 +
                        fVar234 * fStack_5f8 + fVar272 * fStack_578 + fStack_278 * fVar258);
    local_a40._8_4_ = fVar407;
    fVar409 = fVar292 * (fStack_1f4 * fVar289 +
                        fVar174 * fStack_5f4 + fVar274 * fStack_574 + fStack_274 * fVar259);
    local_a40._12_4_ = fVar409;
    fVar411 = fVar235 * (fStack_1f0 * fVar302 +
                        fVar175 * fStack_5f0 + fVar278 * fStack_570 + fStack_270 * fVar261);
    local_a40._16_4_ = fVar411;
    fVar413 = fVar276 * (fStack_1ec * fVar303 +
                        fVar200 * fStack_5ec + fVar282 * fStack_56c + fStack_26c * fVar262);
    local_a40._20_4_ = fVar413;
    fVar415 = fVar260 * (fStack_1e8 * fVar304 +
                        fVar236 * fStack_5e8 + fVar287 * fStack_568 + fStack_268 * fVar279);
    local_a40._24_4_ = fVar415;
    local_a40._28_4_ = fStack_1c4;
    fVar237 = fVar235 * ((float)local_220._0_4_ * fVar283 +
                        fVar238 * (float)local_520._0_4_ +
                        fVar233 * (float)local_620._0_4_ + fVar237 * (float)local_5a0._0_4_);
    fVar238 = fVar276 * ((float)local_220._4_4_ * fVar284 +
                        fVar257 * (float)local_520._4_4_ +
                        fVar173 * (float)local_620._4_4_ + fVar264 * (float)local_5a0._4_4_);
    auVar44._4_4_ = fVar238;
    auVar44._0_4_ = fVar237;
    fVar283 = fVar260 * (fStack_218 * fVar288 +
                        fVar258 * fStack_518 + fVar234 * fStack_618 + fVar272 * fStack_598);
    auVar44._8_4_ = fVar283;
    fVar301 = fVar292 * (fStack_214 * fVar289 +
                        fVar259 * fStack_514 + fVar174 * fStack_614 + fVar274 * fStack_594);
    auVar44._12_4_ = fVar301;
    fVar235 = fVar235 * (fStack_210 * fVar302 +
                        fVar261 * fStack_510 + fVar175 * fStack_610 + fVar278 * fStack_590);
    auVar44._16_4_ = fVar235;
    fVar276 = fVar276 * (fStack_20c * fVar303 +
                        fVar262 * fStack_50c + fVar200 * fStack_60c + fVar282 * fStack_58c);
    auVar44._20_4_ = fVar276;
    fVar260 = fVar260 * (fStack_208 * fVar304 +
                        fVar279 * fStack_508 + fVar236 * fStack_608 + fVar287 * fStack_588);
    auVar44._24_4_ = fVar260;
    auVar44._28_4_ = fVar292;
    auVar95._4_4_ = fVar321;
    auVar95._0_4_ = fVar309;
    auVar95._8_4_ = fVar326;
    auVar95._12_4_ = fVar331;
    auVar95._16_4_ = fVar336;
    auVar95._20_4_ = fVar341;
    auVar95._24_4_ = fVar346;
    auVar95._28_4_ = fVar351;
    auVar133 = vperm2f128_avx(auVar95,auVar95,1);
    auVar133 = vshufps_avx(auVar133,auVar95,0x30);
    local_ac0 = vshufps_avx(auVar95,auVar133,0x29);
    auVar101._4_4_ = fStack_9bc;
    auVar101._0_4_ = local_9c0;
    auVar101._8_4_ = fStack_9b8;
    auVar101._12_4_ = fStack_9b4;
    auVar101._16_4_ = fStack_9b0;
    auVar101._20_4_ = fStack_9ac;
    auVar101._24_4_ = fStack_9a8;
    auVar101._28_4_ = fStack_9a4;
    auVar133 = vperm2f128_avx(auVar101,auVar101,1);
    auVar133 = vshufps_avx(auVar133,auVar101,0x30);
    auVar27 = vshufps_avx(auVar101,auVar133,0x29);
    auVar25 = vsubps_avx(_local_b20,auVar44);
    auVar133 = vperm2f128_avx(auVar25,auVar25,1);
    auVar133 = vshufps_avx(auVar133,auVar25,0x30);
    auVar28 = vshufps_avx(auVar25,auVar133,0x29);
    local_320 = vsubps_avx(local_ac0,auVar95);
    local_300 = vsubps_avx(auVar27,auVar101);
    fVar173 = local_320._0_4_;
    fVar175 = local_320._4_4_;
    auVar45._4_4_ = fVar405 * fVar175;
    auVar45._0_4_ = fVar395 * fVar173;
    fVar264 = local_320._8_4_;
    auVar45._8_4_ = fVar407 * fVar264;
    fVar278 = local_320._12_4_;
    auVar45._12_4_ = fVar409 * fVar278;
    fVar257 = local_320._16_4_;
    auVar45._16_4_ = fVar411 * fVar257;
    fVar261 = local_320._20_4_;
    auVar45._20_4_ = fVar413 * fVar261;
    fVar284 = local_320._24_4_;
    auVar45._24_4_ = fVar415 * fVar284;
    auVar45._28_4_ = auVar25._28_4_;
    fVar234 = local_300._0_4_;
    fVar200 = local_300._4_4_;
    auVar46._4_4_ = fVar388 * fVar200;
    auVar46._0_4_ = fVar375 * fVar234;
    fVar272 = local_300._8_4_;
    auVar46._8_4_ = fVar389 * fVar272;
    fVar282 = local_300._12_4_;
    auVar46._12_4_ = fVar390 * fVar282;
    fVar258 = local_300._16_4_;
    auVar46._16_4_ = fVar391 * fVar258;
    fVar262 = local_300._20_4_;
    auVar46._20_4_ = fVar392 * fVar262;
    fVar288 = local_300._24_4_;
    auVar46._24_4_ = fVar393 * fVar288;
    auVar46._28_4_ = auVar133._28_4_;
    auVar26 = vsubps_avx(auVar46,auVar45);
    auVar97._4_4_ = fVar320;
    auVar97._0_4_ = fVar308;
    auVar97._8_4_ = fVar325;
    auVar97._12_4_ = fVar330;
    auVar97._16_4_ = fVar335;
    auVar97._20_4_ = fVar340;
    auVar97._24_4_ = fVar345;
    auVar97._28_4_ = fVar350;
    auVar133 = vperm2f128_avx(auVar97,auVar97,1);
    auVar133 = vshufps_avx(auVar133,auVar97,0x30);
    auVar29 = vshufps_avx(auVar97,auVar133,0x29);
    local_660 = vsubps_avx(auVar29,auVar97);
    auVar47._4_4_ = fVar322 * fVar200;
    auVar47._0_4_ = fVar310 * fVar234;
    auVar47._8_4_ = fVar327 * fVar272;
    auVar47._12_4_ = fVar332 * fVar282;
    auVar47._16_4_ = fVar337 * fVar258;
    auVar47._20_4_ = fVar342 * fVar262;
    auVar47._24_4_ = fVar347 * fVar288;
    auVar47._28_4_ = auVar29._28_4_;
    fVar174 = local_660._0_4_;
    fVar236 = local_660._4_4_;
    auVar48._4_4_ = fVar405 * fVar236;
    auVar48._0_4_ = fVar395 * fVar174;
    fVar274 = local_660._8_4_;
    auVar48._8_4_ = fVar407 * fVar274;
    fVar287 = local_660._12_4_;
    auVar48._12_4_ = fVar409 * fVar287;
    fVar259 = local_660._16_4_;
    auVar48._16_4_ = fVar411 * fVar259;
    fVar279 = local_660._20_4_;
    auVar48._20_4_ = fVar413 * fVar279;
    fVar289 = local_660._24_4_;
    auVar48._24_4_ = fVar415 * fVar289;
    auVar48._28_4_ = fVar361;
    auVar30 = vsubps_avx(auVar48,auVar47);
    auVar49._4_4_ = fVar388 * fVar236;
    auVar49._0_4_ = fVar375 * fVar174;
    auVar49._8_4_ = fVar389 * fVar274;
    auVar49._12_4_ = fVar390 * fVar287;
    auVar49._16_4_ = fVar391 * fVar259;
    auVar49._20_4_ = fVar392 * fVar279;
    auVar49._24_4_ = fVar393 * fVar289;
    auVar49._28_4_ = fVar361;
    auVar50._4_4_ = fVar322 * fVar175;
    auVar50._0_4_ = fVar310 * fVar173;
    auVar50._8_4_ = fVar327 * fVar264;
    auVar50._12_4_ = fVar332 * fVar278;
    auVar50._16_4_ = fVar337 * fVar257;
    auVar50._20_4_ = fVar342 * fVar261;
    auVar50._24_4_ = fVar347 * fVar284;
    auVar50._28_4_ = uStack_1e4;
    auVar31 = vsubps_avx(auVar50,auVar49);
    fVar233 = auVar31._28_4_;
    auVar194._0_4_ = fVar174 * fVar174 + fVar173 * fVar173 + fVar234 * fVar234;
    auVar194._4_4_ = fVar236 * fVar236 + fVar175 * fVar175 + fVar200 * fVar200;
    auVar194._8_4_ = fVar274 * fVar274 + fVar264 * fVar264 + fVar272 * fVar272;
    auVar194._12_4_ = fVar287 * fVar287 + fVar278 * fVar278 + fVar282 * fVar282;
    auVar194._16_4_ = fVar259 * fVar259 + fVar257 * fVar257 + fVar258 * fVar258;
    auVar194._20_4_ = fVar279 * fVar279 + fVar261 * fVar261 + fVar262 * fVar262;
    auVar194._24_4_ = fVar289 * fVar289 + fVar284 * fVar284 + fVar288 * fVar288;
    auVar194._28_4_ = fVar233 + fVar233 + auVar26._28_4_;
    auVar133 = vrcpps_avx(auVar194);
    fVar302 = auVar133._0_4_;
    fVar303 = auVar133._4_4_;
    auVar51._4_4_ = fVar303 * auVar194._4_4_;
    auVar51._0_4_ = fVar302 * auVar194._0_4_;
    fVar304 = auVar133._8_4_;
    auVar51._8_4_ = fVar304 * auVar194._8_4_;
    fVar305 = auVar133._12_4_;
    auVar51._12_4_ = fVar305 * auVar194._12_4_;
    fVar306 = auVar133._16_4_;
    auVar51._16_4_ = fVar306 * auVar194._16_4_;
    fVar307 = auVar133._20_4_;
    auVar51._20_4_ = fVar307 * auVar194._20_4_;
    fVar319 = auVar133._24_4_;
    auVar51._24_4_ = fVar319 * auVar194._24_4_;
    auVar51._28_4_ = uStack_1e4;
    auVar269._8_4_ = 0x3f800000;
    auVar269._0_8_ = 0x3f8000003f800000;
    auVar269._12_4_ = 0x3f800000;
    auVar269._16_4_ = 0x3f800000;
    auVar269._20_4_ = 0x3f800000;
    auVar269._24_4_ = 0x3f800000;
    auVar269._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar269,auVar51);
    fVar302 = fVar302 + fVar302 * auVar32._0_4_;
    fVar303 = fVar303 + fVar303 * auVar32._4_4_;
    fVar304 = fVar304 + fVar304 * auVar32._8_4_;
    fVar305 = fVar305 + fVar305 * auVar32._12_4_;
    fVar306 = fVar306 + fVar306 * auVar32._16_4_;
    fVar307 = fVar307 + fVar307 * auVar32._20_4_;
    fVar319 = fVar319 + fVar319 * auVar32._24_4_;
    auVar25 = vperm2f128_avx(auVar43,auVar43,1);
    auVar25 = vshufps_avx(auVar25,auVar43,0x30);
    local_a60 = vshufps_avx(auVar43,auVar25,0x29);
    auVar25 = vperm2f128_avx(local_a40,local_a40,1);
    auVar25 = vshufps_avx(auVar25,local_a40,0x30);
    local_8a0 = vshufps_avx(local_a40,auVar25,0x29);
    fVar396 = local_8a0._0_4_;
    fVar406 = local_8a0._4_4_;
    auVar52._4_4_ = fVar406 * fVar175;
    auVar52._0_4_ = fVar396 * fVar173;
    fVar408 = local_8a0._8_4_;
    auVar52._8_4_ = fVar408 * fVar264;
    fVar410 = local_8a0._12_4_;
    auVar52._12_4_ = fVar410 * fVar278;
    fVar412 = local_8a0._16_4_;
    auVar52._16_4_ = fVar412 * fVar257;
    fVar414 = local_8a0._20_4_;
    auVar52._20_4_ = fVar414 * fVar261;
    fVar416 = local_8a0._24_4_;
    auVar52._24_4_ = fVar416 * fVar284;
    auVar52._28_4_ = auVar25._28_4_;
    fVar349 = local_a60._0_4_;
    fVar360 = local_a60._4_4_;
    auVar53._4_4_ = fVar360 * fVar200;
    auVar53._0_4_ = fVar349 * fVar234;
    fVar361 = local_a60._8_4_;
    auVar53._8_4_ = fVar361 * fVar272;
    fVar394 = local_a60._12_4_;
    auVar53._12_4_ = fVar394 * fVar282;
    fVar280 = local_a60._16_4_;
    auVar53._16_4_ = fVar280 * fVar258;
    fVar285 = local_a60._20_4_;
    auVar53._20_4_ = fVar285 * fVar262;
    fVar290 = local_a60._24_4_;
    auVar53._24_4_ = fVar290 * fVar288;
    auVar53._28_4_ = fStack_204;
    auVar38 = vsubps_avx(auVar53,auVar52);
    auVar25 = vperm2f128_avx(auVar42,auVar42,1);
    auVar25 = vshufps_avx(auVar25,auVar42,0x30);
    local_880 = vshufps_avx(auVar42,auVar25,0x29);
    fVar311 = local_880._0_4_;
    fVar323 = local_880._4_4_;
    auVar54._4_4_ = fVar323 * fVar200;
    auVar54._0_4_ = fVar311 * fVar234;
    fVar328 = local_880._8_4_;
    auVar54._8_4_ = fVar328 * fVar272;
    fVar333 = local_880._12_4_;
    auVar54._12_4_ = fVar333 * fVar282;
    fVar338 = local_880._16_4_;
    auVar54._16_4_ = fVar338 * fVar258;
    fVar343 = local_880._20_4_;
    auVar54._20_4_ = fVar343 * fVar262;
    fVar348 = local_880._24_4_;
    auVar54._24_4_ = fVar348 * fVar288;
    auVar54._28_4_ = auVar25._28_4_;
    auVar55._4_4_ = fVar406 * fVar236;
    auVar55._0_4_ = fVar396 * fVar174;
    auVar55._8_4_ = fVar408 * fVar274;
    auVar55._12_4_ = fVar410 * fVar287;
    auVar55._16_4_ = fVar412 * fVar259;
    auVar55._20_4_ = fVar414 * fVar279;
    uVar108 = local_8a0._28_4_;
    auVar55._24_4_ = fVar416 * fVar289;
    auVar55._28_4_ = uVar108;
    auVar25 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ = fVar236 * fVar360;
    auVar56._0_4_ = fVar174 * fVar349;
    auVar56._8_4_ = fVar274 * fVar361;
    auVar56._12_4_ = fVar287 * fVar394;
    auVar56._16_4_ = fVar259 * fVar280;
    auVar56._20_4_ = fVar279 * fVar285;
    auVar56._24_4_ = fVar289 * fVar290;
    auVar56._28_4_ = uVar108;
    auVar57._4_4_ = fVar323 * fVar175;
    auVar57._0_4_ = fVar311 * fVar173;
    auVar57._8_4_ = fVar328 * fVar264;
    auVar57._12_4_ = fVar333 * fVar278;
    auVar57._16_4_ = fVar338 * fVar257;
    auVar57._20_4_ = fVar343 * fVar261;
    auVar57._24_4_ = fVar348 * fVar284;
    auVar57._28_4_ = fVar351;
    auVar39 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ =
         fVar303 * (auVar26._4_4_ * auVar26._4_4_ +
                   auVar31._4_4_ * auVar31._4_4_ + auVar30._4_4_ * auVar30._4_4_);
    auVar58._0_4_ =
         fVar302 * (auVar26._0_4_ * auVar26._0_4_ +
                   auVar31._0_4_ * auVar31._0_4_ + auVar30._0_4_ * auVar30._0_4_);
    auVar58._8_4_ =
         fVar304 * (auVar26._8_4_ * auVar26._8_4_ +
                   auVar31._8_4_ * auVar31._8_4_ + auVar30._8_4_ * auVar30._8_4_);
    auVar58._12_4_ =
         fVar305 * (auVar26._12_4_ * auVar26._12_4_ +
                   auVar31._12_4_ * auVar31._12_4_ + auVar30._12_4_ * auVar30._12_4_);
    auVar58._16_4_ =
         fVar306 * (auVar26._16_4_ * auVar26._16_4_ +
                   auVar31._16_4_ * auVar31._16_4_ + auVar30._16_4_ * auVar30._16_4_);
    auVar58._20_4_ =
         fVar307 * (auVar26._20_4_ * auVar26._20_4_ +
                   auVar31._20_4_ * auVar31._20_4_ + auVar30._20_4_ * auVar30._20_4_);
    auVar58._24_4_ =
         fVar319 * (auVar26._24_4_ * auVar26._24_4_ +
                   auVar31._24_4_ * auVar31._24_4_ + auVar30._24_4_ * auVar30._24_4_);
    auVar58._28_4_ = auVar26._28_4_ + fVar233 + auVar30._28_4_;
    auVar59._4_4_ =
         (auVar38._4_4_ * auVar38._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar39._4_4_ * auVar39._4_4_) * fVar303;
    auVar59._0_4_ =
         (auVar38._0_4_ * auVar38._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar39._0_4_ * auVar39._0_4_) * fVar302;
    auVar59._8_4_ =
         (auVar38._8_4_ * auVar38._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar39._8_4_ * auVar39._8_4_) * fVar304;
    auVar59._12_4_ =
         (auVar38._12_4_ * auVar38._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar39._12_4_ * auVar39._12_4_) * fVar305;
    auVar59._16_4_ =
         (auVar38._16_4_ * auVar38._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar39._16_4_ * auVar39._16_4_) * fVar306;
    auVar59._20_4_ =
         (auVar38._20_4_ * auVar38._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar39._20_4_ * auVar39._20_4_) * fVar307;
    auVar59._24_4_ =
         (auVar38._24_4_ * auVar38._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar39._24_4_ * auVar39._24_4_) * fVar319;
    auVar59._28_4_ = auVar133._28_4_ + auVar32._28_4_;
    auVar133 = vmaxps_avx(auVar58,auVar59);
    auVar25 = vperm2f128_avx(_local_b20,_local_b20,1);
    auVar25 = vshufps_avx(auVar25,_local_b20,0x30);
    auVar30 = vshufps_avx(_local_b20,auVar25,0x29);
    auVar135._0_4_ = (float)local_b20._0_4_ + fVar237;
    auVar135._4_4_ = (float)local_b20._4_4_ + fVar238;
    auVar135._8_4_ = fStack_b18 + fVar283;
    auVar135._12_4_ = fStack_b14 + fVar301;
    auVar135._16_4_ = fStack_b10 + fVar235;
    auVar135._20_4_ = fStack_b0c + fVar276;
    auVar135._24_4_ = fStack_b08 + fVar260;
    auVar135._28_4_ = fStack_b04 + fVar292;
    auVar25 = vmaxps_avx(_local_b20,auVar135);
    auVar26 = vmaxps_avx(auVar28,auVar30);
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar26 = vrsqrtps_avx(auVar194);
    fVar233 = auVar26._0_4_;
    fVar235 = auVar26._4_4_;
    fVar237 = auVar26._8_4_;
    fVar276 = auVar26._12_4_;
    fVar238 = auVar26._16_4_;
    fVar260 = auVar26._20_4_;
    fVar283 = auVar26._24_4_;
    auVar60._4_4_ = fVar235 * fVar235 * fVar235 * auVar194._4_4_ * 0.5;
    auVar60._0_4_ = fVar233 * fVar233 * fVar233 * auVar194._0_4_ * 0.5;
    auVar60._8_4_ = fVar237 * fVar237 * fVar237 * auVar194._8_4_ * 0.5;
    auVar60._12_4_ = fVar276 * fVar276 * fVar276 * auVar194._12_4_ * 0.5;
    auVar60._16_4_ = fVar238 * fVar238 * fVar238 * auVar194._16_4_ * 0.5;
    auVar60._20_4_ = fVar260 * fVar260 * fVar260 * auVar194._20_4_ * 0.5;
    auVar60._24_4_ = fVar283 * fVar283 * fVar283 * auVar194._24_4_ * 0.5;
    auVar60._28_4_ = auVar194._28_4_;
    auVar61._4_4_ = fVar235 * 1.5;
    auVar61._0_4_ = fVar233 * 1.5;
    auVar61._8_4_ = fVar237 * 1.5;
    auVar61._12_4_ = fVar276 * 1.5;
    auVar61._16_4_ = fVar238 * 1.5;
    auVar61._20_4_ = fVar260 * 1.5;
    auVar61._24_4_ = fVar283 * 1.5;
    auVar61._28_4_ = auVar26._28_4_;
    local_420 = vsubps_avx(auVar61,auVar60);
    auVar96._4_4_ = fVar321;
    auVar96._0_4_ = fVar309;
    auVar96._8_4_ = fVar326;
    auVar96._12_4_ = fVar331;
    auVar96._16_4_ = fVar336;
    auVar96._20_4_ = fVar341;
    auVar96._24_4_ = fVar346;
    auVar96._28_4_ = fVar351;
    local_8c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar96);
    auVar31 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
    auVar368 = ZEXT3264(auVar31);
    fVar362 = auVar31._0_4_;
    fVar369 = auVar31._4_4_;
    fVar370 = auVar31._8_4_;
    fVar371 = auVar31._12_4_;
    fVar372 = auVar31._16_4_;
    fVar373 = auVar31._20_4_;
    fVar374 = auVar31._24_4_;
    fVar424 = local_8c0._0_4_;
    fVar429 = local_8c0._4_4_;
    fVar430 = local_8c0._8_4_;
    fVar431 = local_8c0._12_4_;
    fVar432 = local_8c0._16_4_;
    fVar433 = local_8c0._20_4_;
    fVar434 = local_8c0._24_4_;
    auVar98._4_4_ = fVar320;
    auVar98._0_4_ = fVar308;
    auVar98._8_4_ = fVar325;
    auVar98._12_4_ = fVar330;
    auVar98._16_4_ = fVar335;
    auVar98._20_4_ = fVar340;
    auVar98._24_4_ = fVar345;
    auVar98._28_4_ = fVar350;
    auVar131 = ZEXT832(0) << 0x20;
    auVar31 = vsubps_avx(auVar131,auVar98);
    fVar235 = auVar31._0_4_;
    fVar237 = auVar31._4_4_;
    fVar276 = auVar31._8_4_;
    fVar238 = auVar31._12_4_;
    fVar260 = auVar31._16_4_;
    fVar283 = auVar31._20_4_;
    fVar292 = auVar31._24_4_;
    auVar358._0_4_ =
         fVar219 * fVar235 + fVar424 * (float)local_a20._0_4_ + fVar362 * (float)local_780._0_4_;
    auVar358._4_4_ =
         fVar219 * fVar237 + fVar429 * (float)local_a20._4_4_ + fVar369 * (float)local_780._4_4_;
    auVar358._8_4_ = fVar219 * fVar276 + fVar430 * fStack_a18 + fVar370 * fStack_778;
    auVar358._12_4_ = fVar219 * fVar238 + fVar431 * fStack_a14 + fVar371 * fStack_774;
    auVar358._16_4_ = fVar219 * fVar260 + fVar432 * fStack_a10 + fVar372 * fStack_770;
    auVar358._20_4_ = fVar219 * fVar283 + fVar433 * fStack_a0c + fVar373 * fStack_76c;
    auVar358._24_4_ = fVar219 * fVar292 + fVar434 * fStack_a08 + fVar374 * fStack_768;
    auVar358._28_4_ = auVar39._28_4_ + auVar26._28_4_ + auVar194._28_4_;
    auVar402._0_4_ = fVar235 * fVar235 + fVar424 * fVar424 + fVar362 * fVar362;
    auVar402._4_4_ = fVar237 * fVar237 + fVar429 * fVar429 + fVar369 * fVar369;
    auVar402._8_4_ = fVar276 * fVar276 + fVar430 * fVar430 + fVar370 * fVar370;
    auVar402._12_4_ = fVar238 * fVar238 + fVar431 * fVar431 + fVar371 * fVar371;
    auVar402._16_4_ = fVar260 * fVar260 + fVar432 * fVar432 + fVar372 * fVar372;
    auVar402._20_4_ = fVar283 * fVar283 + fVar433 * fVar433 + fVar373 * fVar373;
    auVar402._24_4_ = fVar292 * fVar292 + fVar434 * fVar434 + fVar374 * fVar374;
    auVar402._28_4_ = fVar351 + fVar351 + auVar39._28_4_;
    fVar307 = local_420._0_4_;
    fVar319 = local_420._4_4_;
    fVar324 = local_420._8_4_;
    fVar329 = local_420._12_4_;
    fVar334 = local_420._16_4_;
    fVar339 = local_420._20_4_;
    fVar344 = local_420._24_4_;
    local_6a0 = fVar219 * fVar174 * fVar307 +
                fVar307 * fVar173 * (float)local_a20._0_4_ +
                fVar307 * fVar234 * (float)local_780._0_4_;
    fStack_69c = fVar219 * fVar236 * fVar319 +
                 fVar319 * fVar175 * (float)local_a20._4_4_ +
                 fVar319 * fVar200 * (float)local_780._4_4_;
    fStack_698 = fVar219 * fVar274 * fVar324 +
                 fVar324 * fVar264 * fStack_a18 + fVar324 * fVar272 * fStack_778;
    fStack_694 = fVar219 * fVar287 * fVar329 +
                 fVar329 * fVar278 * fStack_a14 + fVar329 * fVar282 * fStack_774;
    fStack_690 = fVar219 * fVar259 * fVar334 +
                 fVar334 * fVar257 * fStack_a10 + fVar334 * fVar258 * fStack_770;
    fStack_68c = fVar219 * fVar279 * fVar339 +
                 fVar339 * fVar261 * fStack_a0c + fVar339 * fVar262 * fStack_76c;
    fStack_688 = fVar219 * fVar289 * fVar344 +
                 fVar344 * fVar284 * fStack_a08 + fVar344 * fVar288 * fStack_768;
    fStack_684 = fVar219 + fStack_a04 + fStack_764;
    fVar233 = fVar219 + fStack_a04 + fStack_764;
    local_a80._0_4_ =
         fVar235 * fVar174 * fVar307 + fVar424 * fVar307 * fVar173 + fVar362 * fVar307 * fVar234;
    local_a80._4_4_ =
         fVar237 * fVar236 * fVar319 + fVar429 * fVar319 * fVar175 + fVar369 * fVar319 * fVar200;
    local_a80._8_4_ =
         fVar276 * fVar274 * fVar324 + fVar430 * fVar324 * fVar264 + fVar370 * fVar324 * fVar272;
    local_a80._12_4_ =
         fVar238 * fVar287 * fVar329 + fVar431 * fVar329 * fVar278 + fVar371 * fVar329 * fVar282;
    local_a80._16_4_ =
         fVar260 * fVar259 * fVar334 + fVar432 * fVar334 * fVar257 + fVar372 * fVar334 * fVar258;
    local_a80._20_4_ =
         fVar283 * fVar279 * fVar339 + fVar433 * fVar339 * fVar261 + fVar373 * fVar339 * fVar262;
    local_a80._24_4_ =
         fVar292 * fVar289 * fVar344 + fVar434 * fVar344 * fVar284 + fVar374 * fVar344 * fVar288;
    local_a80._28_4_ = fStack_a04 + fVar233;
    auVar62._4_4_ = fStack_69c * local_a80._4_4_;
    auVar62._0_4_ = local_6a0 * (float)local_a80._0_4_;
    auVar62._8_4_ = fStack_698 * local_a80._8_4_;
    auVar62._12_4_ = fStack_694 * local_a80._12_4_;
    auVar62._16_4_ = fStack_690 * local_a80._16_4_;
    auVar62._20_4_ = fStack_68c * local_a80._20_4_;
    auVar62._24_4_ = fStack_688 * local_a80._24_4_;
    auVar62._28_4_ = fVar233;
    auVar26 = vsubps_avx(auVar358,auVar62);
    auVar63._4_4_ = local_a80._4_4_ * local_a80._4_4_;
    auVar63._0_4_ = (float)local_a80._0_4_ * (float)local_a80._0_4_;
    auVar63._8_4_ = local_a80._8_4_ * local_a80._8_4_;
    auVar63._12_4_ = local_a80._12_4_ * local_a80._12_4_;
    auVar63._16_4_ = local_a80._16_4_ * local_a80._16_4_;
    auVar63._20_4_ = local_a80._20_4_ * local_a80._20_4_;
    auVar63._24_4_ = local_a80._24_4_ * local_a80._24_4_;
    auVar63._28_4_ = fStack_a04;
    auVar32 = vsubps_avx(auVar402,auVar63);
    local_2e0 = vsqrtps_avx(auVar133);
    fVar233 = (local_2e0._0_4_ + auVar25._0_4_) * 1.0000002;
    fVar301 = (local_2e0._4_4_ + auVar25._4_4_) * 1.0000002;
    fVar302 = (local_2e0._8_4_ + auVar25._8_4_) * 1.0000002;
    fVar303 = (local_2e0._12_4_ + auVar25._12_4_) * 1.0000002;
    fVar304 = (local_2e0._16_4_ + auVar25._16_4_) * 1.0000002;
    fVar305 = (local_2e0._20_4_ + auVar25._20_4_) * 1.0000002;
    fVar306 = (local_2e0._24_4_ + auVar25._24_4_) * 1.0000002;
    auVar64._4_4_ = fVar301 * fVar301;
    auVar64._0_4_ = fVar233 * fVar233;
    auVar64._8_4_ = fVar302 * fVar302;
    auVar64._12_4_ = fVar303 * fVar303;
    auVar64._16_4_ = fVar304 * fVar304;
    auVar64._20_4_ = fVar305 * fVar305;
    auVar64._24_4_ = fVar306 * fVar306;
    auVar64._28_4_ = local_2e0._28_4_ + auVar25._28_4_;
    local_340._0_4_ = auVar26._0_4_ + auVar26._0_4_;
    local_340._4_4_ = auVar26._4_4_ + auVar26._4_4_;
    local_340._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_340._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_340._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_340._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_340._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    fVar233 = auVar26._28_4_;
    local_340._28_4_ = fVar233 + fVar233;
    auVar25 = vsubps_avx(auVar32,auVar64);
    auVar65._4_4_ = fStack_69c * fStack_69c;
    auVar65._0_4_ = local_6a0 * local_6a0;
    auVar65._8_4_ = fStack_698 * fStack_698;
    auVar65._12_4_ = fStack_694 * fStack_694;
    auVar65._16_4_ = fStack_690 * fStack_690;
    auVar65._20_4_ = fStack_68c * fStack_68c;
    auVar65._24_4_ = fStack_688 * fStack_688;
    auVar65._28_4_ = fVar233;
    auVar387 = ZEXT3264(local_2a0);
    auVar26 = vsubps_avx(local_2a0,auVar65);
    auVar66._4_4_ = local_340._4_4_ * local_340._4_4_;
    auVar66._0_4_ = local_340._0_4_ * local_340._0_4_;
    auVar66._8_4_ = local_340._8_4_ * local_340._8_4_;
    auVar66._12_4_ = local_340._12_4_ * local_340._12_4_;
    auVar66._16_4_ = local_340._16_4_ * local_340._16_4_;
    auVar66._20_4_ = local_340._20_4_ * local_340._20_4_;
    auVar66._24_4_ = local_340._24_4_ * local_340._24_4_;
    auVar66._28_4_ = auVar32._28_4_;
    fVar233 = auVar26._0_4_;
    local_2c0 = fVar233 * 4.0;
    fVar301 = auVar26._4_4_;
    fStack_2bc = fVar301 * 4.0;
    fVar302 = auVar26._8_4_;
    fStack_2b8 = fVar302 * 4.0;
    fVar303 = auVar26._12_4_;
    fStack_2b4 = fVar303 * 4.0;
    fVar304 = auVar26._16_4_;
    fStack_2b0 = fVar304 * 4.0;
    fVar305 = auVar26._20_4_;
    fStack_2ac = fVar305 * 4.0;
    fVar306 = auVar26._24_4_;
    fStack_2a8 = fVar306 * 4.0;
    uStack_2a4 = 0x40800000;
    auVar67._4_4_ = auVar25._4_4_ * fStack_2bc;
    auVar67._0_4_ = auVar25._0_4_ * local_2c0;
    auVar67._8_4_ = auVar25._8_4_ * fStack_2b8;
    auVar67._12_4_ = auVar25._12_4_ * fStack_2b4;
    auVar67._16_4_ = auVar25._16_4_ * fStack_2b0;
    auVar67._20_4_ = auVar25._20_4_ * fStack_2ac;
    auVar67._24_4_ = auVar25._24_4_ * fStack_2a8;
    auVar67._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(auVar66,auVar67);
    local_c60 = vcmpps_avx(auVar38,auVar131,5);
    auVar161._8_4_ = 0x7fffffff;
    auVar161._0_8_ = 0x7fffffff7fffffff;
    auVar161._12_4_ = 0x7fffffff;
    auVar161._16_4_ = 0x7fffffff;
    auVar161._20_4_ = 0x7fffffff;
    auVar161._24_4_ = 0x7fffffff;
    auVar161._28_4_ = 0x7fffffff;
    auVar133 = vandps_avx(auVar65,auVar161);
    local_380._0_4_ = fVar233 + fVar233;
    local_380._4_4_ = fVar301 + fVar301;
    local_380._8_4_ = fVar302 + fVar302;
    local_380._12_4_ = fVar303 + fVar303;
    local_380._16_4_ = fVar304 + fVar304;
    local_380._20_4_ = fVar305 + fVar305;
    local_380._24_4_ = fVar306 + fVar306;
    local_380._28_4_ = auVar26._28_4_ + auVar26._28_4_;
    local_440 = vandps_avx(auVar26,auVar161);
    uVar105 = CONCAT44(local_340._4_4_,local_340._0_4_);
    local_360._0_8_ = uVar105 ^ 0x8000000080000000;
    local_360._8_4_ = -local_340._8_4_;
    local_360._12_4_ = -local_340._12_4_;
    local_360._16_4_ = -local_340._16_4_;
    local_360._20_4_ = -local_340._20_4_;
    local_360._24_4_ = -local_340._24_4_;
    local_360._28_4_ = -local_340._28_4_;
    if ((((((((local_c60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_c60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_c60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_c60 >> 0x7f,0) == '\0') &&
          (local_c60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_c60 >> 0xbf,0) == '\0') &&
        (local_c60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_c60[0x1f]) {
      auVar215._8_4_ = 0x7f800000;
      auVar215._0_8_ = 0x7f8000007f800000;
      auVar215._12_4_ = 0x7f800000;
      auVar215._16_4_ = 0x7f800000;
      auVar215._20_4_ = 0x7f800000;
      auVar215._24_4_ = 0x7f800000;
      auVar215._28_4_ = 0x7f800000;
      auVar136._8_4_ = 0xff800000;
      auVar136._0_8_ = 0xff800000ff800000;
      auVar136._12_4_ = 0xff800000;
      auVar136._16_4_ = 0xff800000;
      auVar136._20_4_ = 0xff800000;
      auVar136._24_4_ = 0xff800000;
      auVar136._28_4_ = 0xff800000;
    }
    else {
      auVar132 = vsqrtps_avx(auVar38);
      auVar39 = vrcpps_avx(local_380);
      auVar26 = vcmpps_avx(auVar38,auVar131,5);
      fVar233 = auVar39._0_4_;
      fVar301 = auVar39._4_4_;
      auVar68._4_4_ = local_380._4_4_ * fVar301;
      auVar68._0_4_ = local_380._0_4_ * fVar233;
      fVar302 = auVar39._8_4_;
      auVar68._8_4_ = local_380._8_4_ * fVar302;
      fVar303 = auVar39._12_4_;
      auVar68._12_4_ = local_380._12_4_ * fVar303;
      fVar304 = auVar39._16_4_;
      auVar68._16_4_ = local_380._16_4_ * fVar304;
      fVar305 = auVar39._20_4_;
      auVar68._20_4_ = local_380._20_4_ * fVar305;
      fVar306 = auVar39._24_4_;
      auVar68._24_4_ = local_380._24_4_ * fVar306;
      auVar68._28_4_ = auVar38._28_4_;
      auVar162._8_4_ = 0x3f800000;
      auVar162._0_8_ = 0x3f8000003f800000;
      auVar162._12_4_ = 0x3f800000;
      auVar162._16_4_ = 0x3f800000;
      auVar162._20_4_ = 0x3f800000;
      auVar162._24_4_ = 0x3f800000;
      auVar162._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar162,auVar68);
      fVar233 = fVar233 + fVar233 * auVar38._0_4_;
      fVar301 = fVar301 + fVar301 * auVar38._4_4_;
      fVar302 = fVar302 + fVar302 * auVar38._8_4_;
      fVar303 = fVar303 + fVar303 * auVar38._12_4_;
      fVar304 = fVar304 + fVar304 * auVar38._16_4_;
      fVar305 = fVar305 + fVar305 * auVar38._20_4_;
      fVar306 = fVar306 + fVar306 * auVar38._24_4_;
      auVar131 = vsubps_avx(local_360,auVar132);
      fVar263 = auVar131._0_4_ * fVar233;
      fVar273 = auVar131._4_4_ * fVar301;
      auVar69._4_4_ = fVar273;
      auVar69._0_4_ = fVar263;
      fVar275 = auVar131._8_4_ * fVar302;
      auVar69._8_4_ = fVar275;
      fVar277 = auVar131._12_4_ * fVar303;
      auVar69._12_4_ = fVar277;
      fVar281 = auVar131._16_4_ * fVar304;
      auVar69._16_4_ = fVar281;
      fVar286 = auVar131._20_4_ * fVar305;
      auVar69._20_4_ = fVar286;
      fVar291 = auVar131._24_4_ * fVar306;
      auVar69._24_4_ = fVar291;
      auVar69._28_4_ = auVar131._28_4_;
      auVar131 = vsubps_avx(auVar132,local_340);
      fVar233 = auVar131._0_4_ * fVar233;
      fVar301 = auVar131._4_4_ * fVar301;
      auVar70._4_4_ = fVar301;
      auVar70._0_4_ = fVar233;
      fVar302 = auVar131._8_4_ * fVar302;
      auVar70._8_4_ = fVar302;
      fVar303 = auVar131._12_4_ * fVar303;
      auVar70._12_4_ = fVar303;
      fVar304 = auVar131._16_4_ * fVar304;
      auVar70._16_4_ = fVar304;
      fVar305 = auVar131._20_4_ * fVar305;
      auVar70._20_4_ = fVar305;
      fVar306 = auVar131._24_4_ * fVar306;
      auVar70._24_4_ = fVar306;
      auVar70._28_4_ = auVar39._28_4_ + auVar38._28_4_;
      local_3e0 = fVar307 * ((float)local_a80._0_4_ + local_6a0 * fVar263);
      fStack_3dc = fVar319 * (local_a80._4_4_ + fStack_69c * fVar273);
      fStack_3d8 = fVar324 * (local_a80._8_4_ + fStack_698 * fVar275);
      fStack_3d4 = fVar329 * (local_a80._12_4_ + fStack_694 * fVar277);
      fStack_3d0 = fVar334 * (local_a80._16_4_ + fStack_690 * fVar281);
      fStack_3cc = fVar339 * (local_a80._20_4_ + fStack_68c * fVar286);
      fStack_3c8 = fVar344 * (local_a80._24_4_ + fStack_688 * fVar291);
      uStack_3c4 = 0x3f800000;
      local_400 = fVar307 * ((float)local_a80._0_4_ + local_6a0 * fVar233);
      fStack_3fc = fVar319 * (local_a80._4_4_ + fStack_69c * fVar301);
      fStack_3f8 = fVar324 * (local_a80._8_4_ + fStack_698 * fVar302);
      fStack_3f4 = fVar329 * (local_a80._12_4_ + fStack_694 * fVar303);
      fStack_3f0 = fVar334 * (local_a80._16_4_ + fStack_690 * fVar304);
      fStack_3ec = fVar339 * (local_a80._20_4_ + fStack_68c * fVar305);
      fStack_3e8 = fVar344 * (local_a80._24_4_ + fStack_688 * fVar306);
      uStack_3e4 = 0x3f800000;
      auVar249._8_4_ = 0x7f800000;
      auVar249._0_8_ = 0x7f8000007f800000;
      auVar249._12_4_ = 0x7f800000;
      auVar249._16_4_ = 0x7f800000;
      auVar249._20_4_ = 0x7f800000;
      auVar249._24_4_ = 0x7f800000;
      auVar249._28_4_ = 0x7f800000;
      auVar215 = vblendvps_avx(auVar249,auVar69,auVar26);
      auVar250._8_4_ = 0xff800000;
      auVar250._0_8_ = 0xff800000ff800000;
      auVar250._12_4_ = 0xff800000;
      auVar250._16_4_ = 0xff800000;
      auVar250._20_4_ = 0xff800000;
      auVar250._24_4_ = 0xff800000;
      auVar250._28_4_ = 0xff800000;
      auVar136 = vblendvps_avx(auVar250,auVar70,auVar26);
      auVar38 = vmaxps_avx(local_680,auVar133);
      auVar71._4_4_ = auVar38._4_4_ * 1.9073486e-06;
      auVar71._0_4_ = auVar38._0_4_ * 1.9073486e-06;
      auVar71._8_4_ = auVar38._8_4_ * 1.9073486e-06;
      auVar71._12_4_ = auVar38._12_4_ * 1.9073486e-06;
      auVar71._16_4_ = auVar38._16_4_ * 1.9073486e-06;
      auVar71._20_4_ = auVar38._20_4_ * 1.9073486e-06;
      auVar71._24_4_ = auVar38._24_4_ * 1.9073486e-06;
      auVar71._28_4_ = auVar38._28_4_;
      auVar38 = vcmpps_avx(local_440,auVar71,1);
      auVar39 = auVar26 & auVar38;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        auVar38 = vandps_avx(auVar38,auVar26);
        auVar241 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
        auVar39 = vcmpps_avx(auVar25,_DAT_01f7b000,2);
        auVar403._8_4_ = 0xff800000;
        auVar403._0_8_ = 0xff800000ff800000;
        auVar403._12_4_ = 0xff800000;
        auVar403._16_4_ = 0xff800000;
        auVar403._20_4_ = 0xff800000;
        auVar403._24_4_ = 0xff800000;
        auVar403._28_4_ = 0xff800000;
        auVar386._8_4_ = 0x7f800000;
        auVar386._0_8_ = 0x7f8000007f800000;
        auVar386._12_4_ = 0x7f800000;
        auVar386._16_4_ = 0x7f800000;
        auVar386._20_4_ = 0x7f800000;
        auVar386._24_4_ = 0x7f800000;
        auVar386._28_4_ = 0x7f800000;
        auVar387 = ZEXT3264(auVar386);
        auVar25 = vblendvps_avx(auVar386,auVar403,auVar39);
        auVar36 = vpmovsxwd_avx(auVar241);
        auVar241 = vpunpckhwd_avx(auVar241,auVar241);
        auVar256._16_16_ = auVar241;
        auVar256._0_16_ = auVar36;
        auVar215 = vblendvps_avx(auVar215,auVar25,auVar256);
        auVar25 = vblendvps_avx(auVar403,auVar386,auVar39);
        auVar136 = vblendvps_avx(auVar136,auVar25,auVar256);
        auVar217._0_8_ = auVar38._0_8_ ^ 0xffffffffffffffff;
        auVar217._8_4_ = auVar38._8_4_ ^ 0xffffffff;
        auVar217._12_4_ = auVar38._12_4_ ^ 0xffffffff;
        auVar217._16_4_ = auVar38._16_4_ ^ 0xffffffff;
        auVar217._20_4_ = auVar38._20_4_ ^ 0xffffffff;
        auVar217._24_4_ = auVar38._24_4_ ^ 0xffffffff;
        auVar217._28_4_ = auVar38._28_4_ ^ 0xffffffff;
        auVar25 = vorps_avx(auVar39,auVar217);
        local_c60 = vandps_avx(auVar26,auVar25);
      }
    }
    auVar404 = ZEXT3264(auVar133);
    auVar359 = ZEXT3264(_local_9e0);
    auVar300 = ZEXT3264(auVar382);
    auVar25 = local_640 & local_c60;
    auVar271 = ZEXT3264(_local_780);
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0x7f,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar25 >> 0xbf,0) == '\0') &&
        (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f]) {
      auVar438 = ZEXT3264(auVar437);
    }
    else {
      auVar163 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
      local_460 = auVar163;
      auVar241 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_950._0_4_));
      auVar241 = vshufps_avx(auVar241,auVar241,0);
      auVar251._16_16_ = auVar241;
      auVar251._0_16_ = auVar241;
      auVar38 = vminps_avx(auVar251,auVar136);
      fVar263 = fStack_764 + auVar241._12_4_;
      auVar164._0_4_ =
           fVar219 * fVar310 + (float)local_a20._0_4_ * fVar375 + (float)local_780._0_4_ * fVar395;
      auVar164._4_4_ =
           fVar219 * fVar322 + (float)local_a20._4_4_ * fVar388 + (float)local_780._4_4_ * fVar405;
      auVar164._8_4_ = fVar219 * fVar327 + fStack_a18 * fVar389 + fStack_778 * fVar407;
      auVar164._12_4_ = fVar219 * fVar332 + fStack_a14 * fVar390 + fStack_774 * fVar409;
      auVar164._16_4_ = fVar219 * fVar337 + fStack_a10 * fVar391 + fStack_770 * fVar411;
      auVar164._20_4_ = fVar219 * fVar342 + fStack_a0c * fVar392 + fStack_76c * fVar413;
      auVar164._24_4_ = fVar219 * fVar347 + fStack_a08 * fVar393 + fStack_768 * fVar415;
      auVar164._28_4_ = fStack_1c4 + fStack_204 + fStack_1c4;
      auVar25 = vrcpps_avx(auVar164);
      fVar233 = auVar25._0_4_;
      fVar301 = auVar25._4_4_;
      auVar72._4_4_ = auVar164._4_4_ * fVar301;
      auVar72._0_4_ = auVar164._0_4_ * fVar233;
      fVar302 = auVar25._8_4_;
      auVar72._8_4_ = auVar164._8_4_ * fVar302;
      fVar303 = auVar25._12_4_;
      auVar72._12_4_ = auVar164._12_4_ * fVar303;
      fVar304 = auVar25._16_4_;
      auVar72._16_4_ = auVar164._16_4_ * fVar304;
      fVar305 = auVar25._20_4_;
      auVar72._20_4_ = auVar164._20_4_ * fVar305;
      fVar306 = auVar25._24_4_;
      auVar72._24_4_ = auVar164._24_4_ * fVar306;
      auVar72._28_4_ = fVar263;
      auVar383._8_4_ = 0x3f800000;
      auVar383._0_8_ = 0x3f8000003f800000;
      auVar383._12_4_ = 0x3f800000;
      auVar383._16_4_ = 0x3f800000;
      auVar383._20_4_ = 0x3f800000;
      auVar383._24_4_ = 0x3f800000;
      auVar383._28_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar383,auVar72);
      auVar296._8_4_ = 0x7fffffff;
      auVar296._0_8_ = 0x7fffffff7fffffff;
      auVar296._12_4_ = 0x7fffffff;
      auVar296._16_4_ = 0x7fffffff;
      auVar296._20_4_ = 0x7fffffff;
      auVar296._24_4_ = 0x7fffffff;
      auVar296._28_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar164,auVar296);
      auVar367._8_4_ = 0x219392ef;
      auVar367._0_8_ = 0x219392ef219392ef;
      auVar367._12_4_ = 0x219392ef;
      auVar367._16_4_ = 0x219392ef;
      auVar367._20_4_ = 0x219392ef;
      auVar367._24_4_ = 0x219392ef;
      auVar367._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar25,auVar367,1);
      auVar404 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar73._4_4_ =
           (fVar301 + fVar301 * auVar39._4_4_) *
           -(fVar322 * fVar237 + fVar388 * fVar429 + fVar369 * fVar405);
      auVar73._0_4_ =
           (fVar233 + fVar233 * auVar39._0_4_) *
           -(fVar310 * fVar235 + fVar375 * fVar424 + fVar362 * fVar395);
      auVar73._8_4_ =
           (fVar302 + fVar302 * auVar39._8_4_) *
           -(fVar327 * fVar276 + fVar389 * fVar430 + fVar370 * fVar407);
      auVar73._12_4_ =
           (fVar303 + fVar303 * auVar39._12_4_) *
           -(fVar332 * fVar238 + fVar390 * fVar431 + fVar371 * fVar409);
      auVar73._16_4_ =
           (fVar304 + fVar304 * auVar39._16_4_) *
           -(fVar337 * fVar260 + fVar391 * fVar432 + fVar372 * fVar411);
      auVar73._20_4_ =
           (fVar305 + fVar305 * auVar39._20_4_) *
           -(fVar342 * fVar283 + fVar392 * fVar433 + fVar373 * fVar413);
      auVar73._24_4_ =
           (fVar306 + fVar306 * auVar39._24_4_) *
           -(fVar347 * fVar292 + fVar393 * fVar434 + fVar374 * fVar415);
      auVar73._28_4_ = -(auVar31._28_4_ + fVar263);
      auVar25 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,1);
      auVar25 = vorps_avx(auVar26,auVar25);
      auVar423._8_4_ = 0xff800000;
      auVar423._0_8_ = 0xff800000ff800000;
      auVar423._12_4_ = 0xff800000;
      auVar423._16_4_ = 0xff800000;
      auVar423._20_4_ = 0xff800000;
      auVar423._24_4_ = 0xff800000;
      auVar423._28_4_ = 0xff800000;
      auVar25 = vblendvps_avx(auVar73,auVar423,auVar25);
      auVar31 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,6);
      auVar26 = vorps_avx(auVar26,auVar31);
      auVar427._8_4_ = 0x7f800000;
      auVar427._0_8_ = 0x7f8000007f800000;
      auVar427._12_4_ = 0x7f800000;
      auVar427._16_4_ = 0x7f800000;
      auVar427._20_4_ = 0x7f800000;
      auVar427._24_4_ = 0x7f800000;
      auVar427._28_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar73,auVar427,auVar26);
      auVar31 = vmaxps_avx(local_3a0,auVar215);
      auVar31 = vmaxps_avx(auVar31,auVar25);
      auVar38 = vminps_avx(auVar38,auVar26);
      auVar368 = ZEXT3264(auVar38);
      auVar131 = ZEXT832(0) << 0x20;
      auVar25 = vsubps_avx(auVar131,local_ac0);
      auVar26 = vsubps_avx(auVar131,auVar27);
      auVar74._4_4_ = auVar26._4_4_ * -fVar406;
      auVar74._0_4_ = auVar26._0_4_ * -fVar396;
      auVar74._8_4_ = auVar26._8_4_ * -fVar408;
      auVar74._12_4_ = auVar26._12_4_ * -fVar410;
      auVar74._16_4_ = auVar26._16_4_ * -fVar412;
      auVar74._20_4_ = auVar26._20_4_ * -fVar414;
      auVar74._24_4_ = auVar26._24_4_ * -fVar416;
      auVar74._28_4_ = auVar26._28_4_;
      auVar75._4_4_ = fVar360 * auVar25._4_4_;
      auVar75._0_4_ = fVar349 * auVar25._0_4_;
      auVar75._8_4_ = fVar361 * auVar25._8_4_;
      auVar75._12_4_ = fVar394 * auVar25._12_4_;
      auVar75._16_4_ = fVar280 * auVar25._16_4_;
      auVar75._20_4_ = fVar285 * auVar25._20_4_;
      auVar75._24_4_ = fVar290 * auVar25._24_4_;
      auVar75._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar74,auVar75);
      auVar26 = vsubps_avx(auVar131,auVar29);
      auVar76._4_4_ = fVar323 * auVar26._4_4_;
      auVar76._0_4_ = fVar311 * auVar26._0_4_;
      auVar76._8_4_ = fVar328 * auVar26._8_4_;
      auVar76._12_4_ = fVar333 * auVar26._12_4_;
      auVar76._16_4_ = fVar338 * auVar26._16_4_;
      auVar76._20_4_ = fVar343 * auVar26._20_4_;
      uVar8 = auVar26._28_4_;
      auVar76._24_4_ = fVar348 * auVar26._24_4_;
      auVar76._28_4_ = uVar8;
      auVar27 = vsubps_avx(auVar25,auVar76);
      auVar77._4_4_ = (float)local_780._4_4_ * -fVar406;
      auVar77._0_4_ = (float)local_780._0_4_ * -fVar396;
      auVar77._8_4_ = fStack_778 * -fVar408;
      auVar77._12_4_ = fStack_774 * -fVar410;
      auVar77._16_4_ = fStack_770 * -fVar412;
      auVar77._20_4_ = fStack_76c * -fVar414;
      auVar77._24_4_ = fStack_768 * -fVar416;
      auVar77._28_4_ = uVar108 ^ 0x80000000;
      auVar78._4_4_ = (float)local_a20._4_4_ * fVar360;
      auVar78._0_4_ = (float)local_a20._0_4_ * fVar349;
      auVar78._8_4_ = fStack_a18 * fVar361;
      auVar78._12_4_ = fStack_a14 * fVar394;
      auVar78._16_4_ = fStack_a10 * fVar280;
      auVar78._20_4_ = fStack_a0c * fVar285;
      auVar78._24_4_ = fStack_a08 * fVar290;
      auVar78._28_4_ = uVar8;
      auVar25 = vsubps_avx(auVar77,auVar78);
      auVar79._4_4_ = fVar219 * fVar323;
      auVar79._0_4_ = fVar219 * fVar311;
      auVar79._8_4_ = fVar219 * fVar328;
      auVar79._12_4_ = fVar219 * fVar333;
      auVar79._16_4_ = fVar219 * fVar338;
      auVar79._20_4_ = fVar219 * fVar343;
      auVar79._24_4_ = fVar219 * fVar348;
      auVar79._28_4_ = uVar8;
      auVar384._8_4_ = 0x3f800000;
      auVar384._0_8_ = 0x3f8000003f800000;
      auVar384._12_4_ = 0x3f800000;
      auVar384._16_4_ = 0x3f800000;
      auVar384._20_4_ = 0x3f800000;
      auVar384._24_4_ = 0x3f800000;
      auVar384._28_4_ = 0x3f800000;
      auVar387 = ZEXT3264(auVar384);
      auVar29 = vsubps_avx(auVar25,auVar79);
      auVar25 = vrcpps_avx(auVar29);
      fVar233 = auVar25._0_4_;
      fVar235 = auVar25._4_4_;
      auVar80._4_4_ = auVar29._4_4_ * fVar235;
      auVar80._0_4_ = auVar29._0_4_ * fVar233;
      fVar237 = auVar25._8_4_;
      auVar80._8_4_ = auVar29._8_4_ * fVar237;
      fVar276 = auVar25._12_4_;
      auVar80._12_4_ = auVar29._12_4_ * fVar276;
      fVar238 = auVar25._16_4_;
      auVar80._16_4_ = auVar29._16_4_ * fVar238;
      fVar260 = auVar25._20_4_;
      auVar80._20_4_ = auVar29._20_4_ * fVar260;
      fVar283 = auVar25._24_4_;
      auVar80._24_4_ = auVar29._24_4_ * fVar283;
      auVar80._28_4_ = fStack_a04;
      auVar39 = vsubps_avx(auVar384,auVar80);
      auVar25 = vandps_avx(auVar29,auVar296);
      auVar137._8_4_ = 0x219392ef;
      auVar137._0_8_ = 0x219392ef219392ef;
      auVar137._12_4_ = 0x219392ef;
      auVar137._16_4_ = 0x219392ef;
      auVar137._20_4_ = 0x219392ef;
      auVar137._24_4_ = 0x219392ef;
      auVar137._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar25,auVar137,1);
      auVar271 = ZEXT3264(auVar26);
      auVar81._4_4_ = (fVar235 + fVar235 * auVar39._4_4_) * -auVar27._4_4_;
      auVar81._0_4_ = (fVar233 + fVar233 * auVar39._0_4_) * -auVar27._0_4_;
      auVar81._8_4_ = (fVar237 + fVar237 * auVar39._8_4_) * -auVar27._8_4_;
      auVar81._12_4_ = (fVar276 + fVar276 * auVar39._12_4_) * -auVar27._12_4_;
      auVar81._16_4_ = (fVar238 + fVar238 * auVar39._16_4_) * -auVar27._16_4_;
      auVar81._20_4_ = (fVar260 + fVar260 * auVar39._20_4_) * -auVar27._20_4_;
      auVar81._24_4_ = (fVar283 + fVar283 * auVar39._24_4_) * -auVar27._24_4_;
      auVar81._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar25 = vcmpps_avx(auVar29,auVar131,1);
      auVar25 = vorps_avx(auVar26,auVar25);
      auVar25 = vblendvps_avx(auVar81,auVar423,auVar25);
      local_7a0 = vmaxps_avx(auVar31,auVar25);
      auVar300 = ZEXT3264(local_7a0);
      auVar25 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,6);
      auVar25 = vorps_avx(auVar26,auVar25);
      auVar26 = vblendvps_avx(auVar81,auVar427,auVar25);
      auVar25 = vandps_avx(local_c60,local_640);
      local_480 = vminps_avx(auVar38,auVar26);
      auVar26 = vcmpps_avx(local_7a0,local_480,2);
      auVar27 = auVar25 & auVar26;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar27 = vminps_avx(_local_b20,auVar135);
        auVar28 = vminps_avx(auVar28,auVar30);
        auVar27 = vminps_avx(auVar27,auVar28);
        auVar27 = vsubps_avx(auVar27,local_2e0);
        auVar25 = vandps_avx(auVar26,auVar25);
        auVar103._4_4_ = fStack_3dc;
        auVar103._0_4_ = local_3e0;
        auVar103._8_4_ = fStack_3d8;
        auVar103._12_4_ = fStack_3d4;
        auVar103._16_4_ = fStack_3d0;
        auVar103._20_4_ = fStack_3cc;
        auVar103._24_4_ = fStack_3c8;
        auVar103._28_4_ = uStack_3c4;
        auVar26 = vminps_avx(auVar103,auVar384);
        auVar226 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar26 = vmaxps_avx(auVar26,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar442 + fVar435 * (auVar26._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar443 + fVar439 * (auVar26._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar444 + fVar440 * (auVar26._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar199 + fVar441 * (auVar26._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar442 + fVar435 * (auVar26._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar443 + fVar439 * (auVar26._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar444 + fVar440 * (auVar26._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar199 + auVar26._28_4_ + 7.0;
        auVar102._4_4_ = fStack_3fc;
        auVar102._0_4_ = local_400;
        auVar102._8_4_ = fStack_3f8;
        auVar102._12_4_ = fStack_3f4;
        auVar102._16_4_ = fStack_3f0;
        auVar102._20_4_ = fStack_3ec;
        auVar102._24_4_ = fStack_3e8;
        auVar102._28_4_ = uStack_3e4;
        auVar26 = vminps_avx(auVar102,auVar384);
        auVar26 = vmaxps_avx(auVar26,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar442 + fVar435 * (auVar26._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar443 + fVar439 * (auVar26._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar444 + fVar440 * (auVar26._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar199 + fVar441 * (auVar26._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar442 + fVar435 * (auVar26._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar443 + fVar439 * (auVar26._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar444 + fVar440 * (auVar26._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar199 + auVar26._28_4_ + 7.0;
        auVar82._4_4_ = auVar27._4_4_ * 0.99999976;
        auVar82._0_4_ = auVar27._0_4_ * 0.99999976;
        auVar82._8_4_ = auVar27._8_4_ * 0.99999976;
        auVar82._12_4_ = auVar27._12_4_ * 0.99999976;
        auVar82._16_4_ = auVar27._16_4_ * 0.99999976;
        auVar82._20_4_ = auVar27._20_4_ * 0.99999976;
        auVar82._24_4_ = auVar27._24_4_ * 0.99999976;
        auVar82._28_4_ = 0x3f7ffffc;
        auVar26 = vmaxps_avx(ZEXT832(0) << 0x20,auVar82);
        auVar83._4_4_ = auVar26._4_4_ * auVar26._4_4_;
        auVar83._0_4_ = auVar26._0_4_ * auVar26._0_4_;
        auVar83._8_4_ = auVar26._8_4_ * auVar26._8_4_;
        auVar83._12_4_ = auVar26._12_4_ * auVar26._12_4_;
        auVar83._16_4_ = auVar26._16_4_ * auVar26._16_4_;
        auVar83._20_4_ = auVar26._20_4_ * auVar26._20_4_;
        auVar83._24_4_ = auVar26._24_4_ * auVar26._24_4_;
        auVar83._28_4_ = auVar26._28_4_;
        auVar27 = vsubps_avx(auVar32,auVar83);
        auVar84._4_4_ = auVar27._4_4_ * fStack_2bc;
        auVar84._0_4_ = auVar27._0_4_ * local_2c0;
        auVar84._8_4_ = auVar27._8_4_ * fStack_2b8;
        auVar84._12_4_ = auVar27._12_4_ * fStack_2b4;
        auVar84._16_4_ = auVar27._16_4_ * fStack_2b0;
        auVar84._20_4_ = auVar27._20_4_ * fStack_2ac;
        auVar84._24_4_ = auVar27._24_4_ * fStack_2a8;
        auVar84._28_4_ = auVar26._28_4_;
        auVar28 = vsubps_avx(auVar66,auVar84);
        auVar26 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,5);
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0x7f,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0xbf,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar26[0x1f]) {
          auVar271 = ZEXT864(0) << 0x20;
          auVar246 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar368 = ZEXT864(0) << 0x20;
          auVar418 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar425 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar318._8_4_ = 0x7f800000;
          auVar318._0_8_ = 0x7f8000007f800000;
          auVar318._12_4_ = 0x7f800000;
          auVar318._16_4_ = 0x7f800000;
          auVar318._20_4_ = 0x7f800000;
          auVar318._24_4_ = 0x7f800000;
          auVar318._28_4_ = 0x7f800000;
          auVar385._8_4_ = 0xff800000;
          auVar385._0_8_ = 0xff800000ff800000;
          auVar385._12_4_ = 0xff800000;
          auVar385._16_4_ = 0xff800000;
          auVar385._20_4_ = 0xff800000;
          auVar385._24_4_ = 0xff800000;
          auVar385._28_4_ = 0xff800000;
        }
        else {
          auVar29 = vrcpps_avx(local_380);
          fVar233 = auVar29._0_4_;
          auVar228._0_4_ = local_380._0_4_ * fVar233;
          fVar235 = auVar29._4_4_;
          auVar228._4_4_ = local_380._4_4_ * fVar235;
          fVar237 = auVar29._8_4_;
          auVar228._8_4_ = local_380._8_4_ * fVar237;
          fVar276 = auVar29._12_4_;
          auVar228._12_4_ = local_380._12_4_ * fVar276;
          fVar238 = auVar29._16_4_;
          auVar228._16_4_ = local_380._16_4_ * fVar238;
          fVar260 = auVar29._20_4_;
          auVar228._20_4_ = local_380._20_4_ * fVar260;
          fVar283 = auVar29._24_4_;
          auVar228._24_4_ = local_380._24_4_ * fVar283;
          auVar228._28_4_ = 0;
          auVar31 = vsubps_avx(auVar384,auVar228);
          auVar30 = vsqrtps_avx(auVar28);
          fVar233 = fVar233 + fVar233 * auVar31._0_4_;
          fVar235 = fVar235 + fVar235 * auVar31._4_4_;
          fVar237 = fVar237 + fVar237 * auVar31._8_4_;
          fVar276 = fVar276 + fVar276 * auVar31._12_4_;
          fVar238 = fVar238 + fVar238 * auVar31._16_4_;
          fVar260 = fVar260 + fVar260 * auVar31._20_4_;
          fVar283 = fVar283 + fVar283 * auVar31._24_4_;
          auVar32 = vsubps_avx(local_360,auVar30);
          fVar435 = auVar32._0_4_ * fVar233;
          fVar439 = auVar32._4_4_ * fVar235;
          auVar85._4_4_ = fVar439;
          auVar85._0_4_ = fVar435;
          fVar440 = auVar32._8_4_ * fVar237;
          auVar85._8_4_ = fVar440;
          fVar441 = auVar32._12_4_ * fVar276;
          auVar85._12_4_ = fVar441;
          fVar442 = auVar32._16_4_ * fVar238;
          auVar85._16_4_ = fVar442;
          fVar443 = auVar32._20_4_ * fVar260;
          auVar85._20_4_ = fVar443;
          fVar444 = auVar32._24_4_ * fVar283;
          auVar85._24_4_ = fVar444;
          auVar85._28_4_ = auVar33._12_4_;
          auVar32 = vsubps_avx(auVar30,local_340);
          fVar233 = auVar32._0_4_ * fVar233;
          fVar235 = auVar32._4_4_ * fVar235;
          auVar86._4_4_ = fVar235;
          auVar86._0_4_ = fVar233;
          fVar237 = auVar32._8_4_ * fVar237;
          auVar86._8_4_ = fVar237;
          fVar276 = auVar32._12_4_ * fVar276;
          auVar86._12_4_ = fVar276;
          fVar238 = auVar32._16_4_ * fVar238;
          auVar86._16_4_ = fVar238;
          fVar260 = auVar32._20_4_ * fVar260;
          auVar86._20_4_ = fVar260;
          fVar283 = auVar32._24_4_ * fVar283;
          auVar86._24_4_ = fVar283;
          auVar86._28_4_ = 0x7f800000;
          fVar292 = fVar307 * (fVar435 * local_6a0 + (float)local_a80._0_4_);
          fVar301 = fVar319 * (fVar439 * fStack_69c + local_a80._4_4_);
          fVar302 = fVar324 * (fVar440 * fStack_698 + local_a80._8_4_);
          fVar303 = fVar329 * (fVar441 * fStack_694 + local_a80._12_4_);
          fVar304 = fVar334 * (fVar442 * fStack_690 + local_a80._16_4_);
          fVar305 = fVar339 * (fVar443 * fStack_68c + local_a80._20_4_);
          fVar306 = fVar344 * (fVar444 * fStack_688 + local_a80._24_4_);
          auVar138._0_4_ = fVar308 + fVar292 * fVar174;
          auVar138._4_4_ = fVar320 + fVar301 * fVar236;
          auVar138._8_4_ = fVar325 + fVar302 * fVar274;
          auVar138._12_4_ = fVar330 + fVar303 * fVar287;
          auVar138._16_4_ = fVar335 + fVar304 * fVar259;
          auVar138._20_4_ = fVar340 + fVar305 * fVar279;
          auVar138._24_4_ = fVar345 + fVar306 * fVar289;
          auVar138._28_4_ = fVar350 + auVar29._28_4_ + auVar31._28_4_ + local_a80._28_4_;
          auVar87._4_4_ = fVar219 * fVar439;
          auVar87._0_4_ = fVar219 * fVar435;
          auVar87._8_4_ = fVar219 * fVar440;
          auVar87._12_4_ = fVar219 * fVar441;
          auVar87._16_4_ = fVar219 * fVar442;
          auVar87._20_4_ = fVar219 * fVar443;
          auVar87._24_4_ = fVar219 * fVar444;
          auVar87._28_4_ = auVar30._28_4_;
          auVar29 = vsubps_avx(auVar87,auVar138);
          auVar252._0_4_ = fVar309 + fVar173 * fVar292;
          auVar252._4_4_ = fVar321 + fVar175 * fVar301;
          auVar252._8_4_ = fVar326 + fVar264 * fVar302;
          auVar252._12_4_ = fVar331 + fVar278 * fVar303;
          auVar252._16_4_ = fVar336 + fVar257 * fVar304;
          auVar252._20_4_ = fVar341 + fVar261 * fVar305;
          auVar252._24_4_ = fVar346 + fVar284 * fVar306;
          auVar252._28_4_ = fVar351 + auVar30._28_4_;
          auVar88._4_4_ = (float)local_a20._4_4_ * fVar439;
          auVar88._0_4_ = (float)local_a20._0_4_ * fVar435;
          auVar88._8_4_ = fStack_a18 * fVar440;
          auVar88._12_4_ = fStack_a14 * fVar441;
          auVar88._16_4_ = fStack_a10 * fVar442;
          auVar88._20_4_ = fStack_a0c * fVar443;
          auVar88._24_4_ = fStack_a08 * fVar444;
          auVar88._28_4_ = 0x3e000000;
          auVar30 = vsubps_avx(auVar88,auVar252);
          auVar229._0_4_ = local_9c0 + fVar234 * fVar292;
          auVar229._4_4_ = fStack_9bc + fVar200 * fVar301;
          auVar229._8_4_ = fStack_9b8 + fVar272 * fVar302;
          auVar229._12_4_ = fStack_9b4 + fVar282 * fVar303;
          auVar229._16_4_ = fStack_9b0 + fVar258 * fVar304;
          auVar229._20_4_ = fStack_9ac + fVar262 * fVar305;
          auVar229._24_4_ = fStack_9a8 + fVar288 * fVar306;
          auVar229._28_4_ = fStack_9a4 + auVar32._28_4_;
          auVar89._4_4_ = fVar439 * (float)local_780._4_4_;
          auVar89._0_4_ = fVar435 * (float)local_780._0_4_;
          auVar89._8_4_ = fVar440 * fStack_778;
          auVar89._12_4_ = fVar441 * fStack_774;
          auVar89._16_4_ = fVar442 * fStack_770;
          auVar89._20_4_ = fVar443 * fStack_76c;
          auVar89._24_4_ = fVar444 * fStack_768;
          auVar89._28_4_ = auVar252._28_4_;
          local_ac0 = vsubps_avx(auVar89,auVar229);
          fVar307 = fVar307 * (fVar233 * local_6a0 + (float)local_a80._0_4_);
          fVar319 = fVar319 * (fVar235 * fStack_69c + local_a80._4_4_);
          fVar324 = fVar324 * (fVar237 * fStack_698 + local_a80._8_4_);
          fVar329 = fVar329 * (fVar276 * fStack_694 + local_a80._12_4_);
          fVar334 = fVar334 * (fVar238 * fStack_690 + local_a80._16_4_);
          fVar339 = fVar339 * (fVar260 * fStack_68c + local_a80._20_4_);
          fVar344 = fVar344 * (fVar283 * fStack_688 + local_a80._24_4_);
          auVar230._0_4_ = fVar308 + fVar307 * fVar174;
          auVar230._4_4_ = fVar320 + fVar319 * fVar236;
          auVar230._8_4_ = fVar325 + fVar324 * fVar274;
          auVar230._12_4_ = fVar330 + fVar329 * fVar287;
          auVar230._16_4_ = fVar335 + fVar334 * fVar259;
          auVar230._20_4_ = fVar340 + fVar339 * fVar279;
          auVar230._24_4_ = fVar345 + fVar344 * fVar289;
          auVar230._28_4_ = fVar350 + local_ac0._28_4_ + local_a80._28_4_;
          auVar90._4_4_ = fVar219 * fVar235;
          auVar90._0_4_ = fVar219 * fVar233;
          auVar90._8_4_ = fVar219 * fVar237;
          auVar90._12_4_ = fVar219 * fVar276;
          auVar90._16_4_ = fVar219 * fVar238;
          auVar90._20_4_ = fVar219 * fVar260;
          auVar90._24_4_ = fVar219 * fVar283;
          auVar90._28_4_ = 0x3e000000;
          auVar31 = vsubps_avx(auVar90,auVar230);
          auVar226 = auVar31._0_28_;
          auVar270._0_4_ = fVar309 + fVar173 * fVar307;
          auVar270._4_4_ = fVar321 + fVar175 * fVar319;
          auVar270._8_4_ = fVar326 + fVar264 * fVar324;
          auVar270._12_4_ = fVar331 + fVar278 * fVar329;
          auVar270._16_4_ = fVar336 + fVar257 * fVar334;
          auVar270._20_4_ = fVar341 + fVar261 * fVar339;
          auVar270._24_4_ = fVar346 + fVar284 * fVar344;
          auVar270._28_4_ = fVar351 + 0.125;
          auVar91._4_4_ = (float)local_a20._4_4_ * fVar235;
          auVar91._0_4_ = (float)local_a20._0_4_ * fVar233;
          auVar91._8_4_ = fStack_a18 * fVar237;
          auVar91._12_4_ = fStack_a14 * fVar276;
          auVar91._16_4_ = fStack_a10 * fVar238;
          auVar91._20_4_ = fStack_a0c * fVar260;
          auVar91._24_4_ = fStack_a08 * fVar283;
          auVar91._28_4_ = fVar219;
          auVar31 = vsubps_avx(auVar91,auVar270);
          auVar271 = ZEXT3264(auVar31);
          auVar253._0_4_ = local_9c0 + fVar234 * fVar307;
          auVar253._4_4_ = fStack_9bc + fVar200 * fVar319;
          auVar253._8_4_ = fStack_9b8 + fVar272 * fVar324;
          auVar253._12_4_ = fStack_9b4 + fVar282 * fVar329;
          auVar253._16_4_ = fStack_9b0 + fVar258 * fVar334;
          auVar253._20_4_ = fStack_9ac + fVar262 * fVar339;
          auVar253._24_4_ = fStack_9a8 + fVar288 * fVar344;
          auVar253._28_4_ = fStack_9a4 + auVar252._28_4_;
          auVar92._4_4_ = fVar235 * (float)local_780._4_4_;
          auVar92._0_4_ = fVar233 * (float)local_780._0_4_;
          auVar92._8_4_ = fVar237 * fStack_778;
          auVar92._12_4_ = fVar276 * fStack_774;
          auVar92._16_4_ = fVar238 * fStack_770;
          auVar92._20_4_ = fVar260 * fStack_76c;
          auVar92._24_4_ = fVar283 * fStack_768;
          auVar92._28_4_ = fVar219;
          auVar31 = vsubps_avx(auVar92,auVar253);
          auVar246 = auVar31._0_28_;
          auVar28 = vcmpps_avx(auVar28,_DAT_01f7b000,5);
          auVar297._8_4_ = 0x7f800000;
          auVar297._0_8_ = 0x7f8000007f800000;
          auVar297._12_4_ = 0x7f800000;
          auVar297._16_4_ = 0x7f800000;
          auVar297._20_4_ = 0x7f800000;
          auVar297._24_4_ = 0x7f800000;
          auVar297._28_4_ = 0x7f800000;
          auVar318 = vblendvps_avx(auVar297,auVar85,auVar28);
          auVar133 = vmaxps_avx(local_680,auVar133);
          auVar93._4_4_ = auVar133._4_4_ * 1.9073486e-06;
          auVar93._0_4_ = auVar133._0_4_ * 1.9073486e-06;
          auVar93._8_4_ = auVar133._8_4_ * 1.9073486e-06;
          auVar93._12_4_ = auVar133._12_4_ * 1.9073486e-06;
          auVar93._16_4_ = auVar133._16_4_ * 1.9073486e-06;
          auVar93._20_4_ = auVar133._20_4_ * 1.9073486e-06;
          auVar93._24_4_ = auVar133._24_4_ * 1.9073486e-06;
          auVar93._28_4_ = auVar133._28_4_;
          auVar133 = vcmpps_avx(local_440,auVar93,1);
          auVar298._8_4_ = 0xff800000;
          auVar298._0_8_ = 0xff800000ff800000;
          auVar298._12_4_ = 0xff800000;
          auVar298._16_4_ = 0xff800000;
          auVar298._20_4_ = 0xff800000;
          auVar298._24_4_ = 0xff800000;
          auVar298._28_4_ = 0xff800000;
          auVar385 = vblendvps_avx(auVar298,auVar86,auVar28);
          auVar31 = auVar28 & auVar133;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar133 = vandps_avx(auVar133,auVar28);
            auVar241 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
            auVar27 = vcmpps_avx(auVar27,_DAT_01f7b000,2);
            auVar143._8_4_ = 0xff800000;
            auVar143._0_8_ = 0xff800000ff800000;
            auVar143._12_4_ = 0xff800000;
            auVar143._16_4_ = 0xff800000;
            auVar143._20_4_ = 0xff800000;
            auVar143._24_4_ = 0xff800000;
            auVar143._28_4_ = 0xff800000;
            auVar299._8_4_ = 0x7f800000;
            auVar299._0_8_ = 0x7f8000007f800000;
            auVar299._12_4_ = 0x7f800000;
            auVar299._16_4_ = 0x7f800000;
            auVar299._20_4_ = 0x7f800000;
            auVar299._24_4_ = 0x7f800000;
            auVar299._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar299,auVar143,auVar27);
            auVar36 = vpmovsxwd_avx(auVar241);
            auVar241 = vpunpckhwd_avx(auVar241,auVar241);
            auVar428._16_16_ = auVar241;
            auVar428._0_16_ = auVar36;
            auVar318 = vblendvps_avx(auVar318,auVar26,auVar428);
            auVar26 = vblendvps_avx(auVar143,auVar299,auVar27);
            auVar385 = vblendvps_avx(auVar385,auVar26,auVar428);
            auVar218._0_8_ = auVar133._0_8_ ^ 0xffffffffffffffff;
            auVar218._8_4_ = auVar133._8_4_ ^ 0xffffffff;
            auVar218._12_4_ = auVar133._12_4_ ^ 0xffffffff;
            auVar218._16_4_ = auVar133._16_4_ ^ 0xffffffff;
            auVar218._20_4_ = auVar133._20_4_ ^ 0xffffffff;
            auVar218._24_4_ = auVar133._24_4_ ^ 0xffffffff;
            auVar218._28_4_ = auVar133._28_4_ ^ 0xffffffff;
            auVar133 = vorps_avx(auVar27,auVar218);
            auVar26 = vandps_avx(auVar28,auVar133);
          }
          auVar368 = ZEXT3264(auVar29);
          auVar418 = auVar30._0_28_;
          auVar425 = local_ac0._0_28_;
        }
        auVar438 = ZEXT3264(auVar437);
        auVar404 = ZEXT3264(local_7a0);
        _local_4e0 = local_7a0;
        local_4c0 = vminps_avx(local_480,auVar318);
        _local_8e0 = vmaxps_avx(local_7a0,auVar385);
        _local_4a0 = _local_8e0;
        auVar133 = vcmpps_avx(local_7a0,local_4c0,2);
        local_6e0 = vandps_avx(auVar133,auVar25);
        auVar387 = ZEXT3264(local_6e0);
        auVar133 = vcmpps_avx(_local_8e0,local_480,2);
        local_900 = vandps_avx(auVar25,auVar133);
        auVar133 = vorps_avx(local_6e0,local_900);
        auVar300 = ZEXT3264(auVar382);
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0x7f,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar133 >> 0xbf,0) != '\0') ||
            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar133[0x1f] < '\0') {
          fVar233 = auVar271._0_4_;
          fVar173 = auVar271._4_4_;
          fVar234 = auVar271._8_4_;
          fVar174 = auVar271._12_4_;
          fVar235 = auVar271._16_4_;
          fVar175 = auVar271._20_4_;
          fVar200 = auVar271._24_4_;
          auVar271 = ZEXT3264(_local_780);
          auVar196._0_8_ = auVar26._0_8_ ^ 0xffffffffffffffff;
          auVar196._8_4_ = auVar26._8_4_ ^ 0xffffffff;
          auVar196._12_4_ = auVar26._12_4_ ^ 0xffffffff;
          auVar196._16_4_ = auVar26._16_4_ ^ 0xffffffff;
          auVar196._20_4_ = auVar26._20_4_ ^ 0xffffffff;
          auVar196._24_4_ = auVar26._24_4_ ^ 0xffffffff;
          fVar236 = auVar26._28_4_;
          auVar196._28_4_ = (uint)fVar236 ^ 0xffffffff;
          auVar165._0_4_ =
               fVar219 * auVar226._0_4_ +
               (float)local_a20._0_4_ * fVar233 + (float)local_780._0_4_ * auVar246._0_4_;
          auVar165._4_4_ =
               fVar219 * auVar226._4_4_ +
               (float)local_a20._4_4_ * fVar173 + (float)local_780._4_4_ * auVar246._4_4_;
          auVar165._8_4_ =
               fVar219 * auVar226._8_4_ + fStack_a18 * fVar234 + fStack_778 * auVar246._8_4_;
          auVar165._12_4_ =
               fVar219 * auVar226._12_4_ + fStack_a14 * fVar174 + fStack_774 * auVar246._12_4_;
          auVar165._16_4_ =
               fVar219 * auVar226._16_4_ + fStack_a10 * fVar235 + fStack_770 * auVar246._16_4_;
          auVar165._20_4_ =
               fVar219 * auVar226._20_4_ + fStack_a0c * fVar175 + fStack_76c * auVar246._20_4_;
          auVar165._24_4_ =
               fVar219 * auVar226._24_4_ + fStack_a08 * fVar200 + fStack_768 * auVar246._24_4_;
          auVar165._28_4_ = fVar236 + local_900._28_4_ + auVar133._28_4_;
          auVar231._8_4_ = 0x7fffffff;
          auVar231._0_8_ = 0x7fffffff7fffffff;
          auVar231._12_4_ = 0x7fffffff;
          auVar231._16_4_ = 0x7fffffff;
          auVar231._20_4_ = 0x7fffffff;
          auVar231._24_4_ = 0x7fffffff;
          auVar231._28_4_ = 0x7fffffff;
          auVar133 = vandps_avx(auVar165,auVar231);
          auVar254._8_4_ = 0x3e99999a;
          auVar254._0_8_ = 0x3e99999a3e99999a;
          auVar254._12_4_ = 0x3e99999a;
          auVar254._16_4_ = 0x3e99999a;
          auVar254._20_4_ = 0x3e99999a;
          auVar254._24_4_ = 0x3e99999a;
          auVar254._28_4_ = 0x3e99999a;
          auVar133 = vcmpps_avx(auVar133,auVar254,1);
          local_720 = vorps_avx(auVar133,auVar196);
          auVar140._0_4_ =
               auVar368._0_4_ * fVar219 +
               (float)local_a20._0_4_ * auVar418._0_4_ + auVar425._0_4_ * (float)local_780._0_4_;
          auVar140._4_4_ =
               auVar368._4_4_ * fVar219 +
               (float)local_a20._4_4_ * auVar418._4_4_ + auVar425._4_4_ * (float)local_780._4_4_;
          auVar140._8_4_ =
               auVar368._8_4_ * fVar219 + fStack_a18 * auVar418._8_4_ + auVar425._8_4_ * fStack_778;
          auVar140._12_4_ =
               auVar368._12_4_ * fVar219 +
               fStack_a14 * auVar418._12_4_ + auVar425._12_4_ * fStack_774;
          auVar140._16_4_ =
               auVar368._16_4_ * fVar219 +
               fStack_a10 * auVar418._16_4_ + auVar425._16_4_ * fStack_770;
          auVar140._20_4_ =
               auVar368._20_4_ * fVar219 +
               fStack_a0c * auVar418._20_4_ + auVar425._20_4_ * fStack_76c;
          auVar140._24_4_ =
               auVar368._24_4_ * fVar219 +
               fStack_a08 * auVar418._24_4_ + auVar425._24_4_ * fStack_768;
          auVar140._28_4_ = local_720._28_4_ + auVar133._28_4_ + fVar236;
          auVar133 = vandps_avx(auVar140,auVar231);
          auVar133 = vcmpps_avx(auVar133,auVar254,1);
          auVar133 = vorps_avx(auVar133,auVar196);
          auVar166._8_4_ = 3;
          auVar166._0_8_ = 0x300000003;
          auVar166._12_4_ = 3;
          auVar166._16_4_ = 3;
          auVar166._20_4_ = 3;
          auVar166._24_4_ = 3;
          auVar166._28_4_ = 3;
          auVar197._8_4_ = 2;
          auVar197._0_8_ = 0x200000002;
          auVar197._12_4_ = 2;
          auVar197._16_4_ = 2;
          auVar197._20_4_ = 2;
          auVar197._24_4_ = 2;
          auVar197._28_4_ = 2;
          auVar133 = vblendvps_avx(auVar197,auVar166,auVar133);
          local_740 = ZEXT432(local_ca8);
          local_760 = vpshufd_avx(ZEXT416(local_ca8),0);
          auVar241 = vpcmpgtd_avx(auVar133._16_16_,local_760);
          auStack_750 = auVar66._16_16_;
          auVar36 = vpcmpgtd_avx(auVar133._0_16_,local_760);
          auVar167._16_16_ = auVar241;
          auVar167._0_16_ = auVar36;
          local_700 = vblendps_avx(ZEXT1632(auVar36),auVar167,0xf0);
          local_500 = vandnps_avx(local_700,local_6e0);
          local_980._4_4_ = local_7a0._4_4_ + (float)local_9e0._4_4_;
          local_980._0_4_ = local_7a0._0_4_ + (float)local_9e0._0_4_;
          fStack_978 = local_7a0._8_4_ + fStack_9d8;
          fStack_974 = local_7a0._12_4_ + fStack_9d4;
          fStack_970 = local_7a0._16_4_ + fStack_9d0;
          fStack_96c = local_7a0._20_4_ + fStack_9cc;
          fStack_968 = local_7a0._24_4_ + fStack_9c8;
          fStack_964 = local_7a0._28_4_ + fStack_9c4;
          while( true ) {
            local_b70 = auVar376._0_4_;
            fStack_b6c = auVar376._4_4_;
            fStack_b68 = auVar376._8_4_;
            fStack_b64 = auVar376._12_4_;
            local_c30._0_4_ = auVar35._0_4_;
            local_c30._4_4_ = auVar35._4_4_;
            fStack_c28 = auVar35._8_4_;
            fStack_c24 = auVar35._12_4_;
            if ((((((((local_500 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_500 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_500 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_500 >> 0x7f,0) == '\0') &&
                  (local_500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_500 >> 0xbf,0) == '\0') &&
                (local_500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_500[0x1f]) break;
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar133 = vblendvps_avx(auVar168,local_7a0,local_500);
            auVar25 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar25 = vminps_avx(auVar133,auVar25);
            auVar26 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar26 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar25 = vcmpps_avx(auVar133,auVar25,0);
            auVar26 = local_500 & auVar25;
            auVar133 = local_500;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar133 = vandps_avx(auVar25,local_500);
            }
            uVar104 = vmovmskps_avx(auVar133);
            uVar108 = 0;
            if (uVar104 != 0) {
              for (; (uVar104 >> uVar108 & 1) == 0; uVar108 = uVar108 + 1) {
              }
            }
            uVar105 = (ulong)uVar108;
            *(undefined4 *)(local_500 + uVar105 * 4) = 0;
            fVar233 = local_1a0[uVar105];
            uVar108 = *(uint *)(local_4e0 + uVar105 * 4);
            auVar133 = auVar438._0_32_;
            fVar173 = auVar147._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              auVar271 = ZEXT1664(auVar271._0_16_);
              auVar368 = ZEXT1664(auVar368._0_16_);
              auVar404 = ZEXT1664(auVar404._0_16_);
              fVar173 = sqrtf((float)local_a00._0_4_);
              uVar105 = extraout_RAX;
              auVar133 = auVar437;
            }
            auVar300 = ZEXT464((uint)fVar233);
            auVar387 = ZEXT3264(auVar133);
            auVar36 = vminps_avx(_local_aa0,_local_9a0);
            auVar241 = vmaxps_avx(_local_aa0,_local_9a0);
            auVar125 = vminps_avx(auVar35,auVar376);
            auVar120 = vminps_avx(auVar36,auVar125);
            auVar36 = vmaxps_avx(auVar35,auVar376);
            auVar125 = vmaxps_avx(auVar241,auVar36);
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar241 = vandps_avx(auVar120,auVar203);
            auVar36 = vandps_avx(auVar125,auVar203);
            auVar241 = vmaxps_avx(auVar241,auVar36);
            auVar36 = vmovshdup_avx(auVar241);
            auVar36 = vmaxss_avx(auVar36,auVar241);
            auVar241 = vshufpd_avx(auVar241,auVar241,1);
            auVar241 = vmaxss_avx(auVar241,auVar36);
            fVar234 = auVar241._0_4_ * 1.9073486e-06;
            local_a40._0_4_ = fVar173 * 1.9073486e-06;
            local_a80._0_16_ = vshufps_avx(auVar125,auVar125,0xff);
            auVar241 = vinsertps_avx(ZEXT416(uVar108),ZEXT416((uint)fVar233),0x10);
            for (uVar111 = 0; bVar114 = (byte)uVar105, uVar111 != 5; uVar111 = uVar111 + 1) {
              auVar36 = vmovshdup_avx(auVar241);
              fVar175 = auVar36._0_4_;
              fVar235 = 1.0 - fVar175;
              fVar233 = fVar235 * fVar235 * fVar235;
              fVar173 = fVar175 * fVar175 * fVar175;
              fVar174 = fVar175 * fVar235;
              auVar36 = vshufps_avx(ZEXT416((uint)(fVar173 * 0.16666667)),
                                    ZEXT416((uint)(fVar173 * 0.16666667)),0);
              auVar125 = ZEXT416((uint)((fVar173 * 4.0 + fVar233 +
                                        fVar175 * fVar174 * 12.0 + fVar235 * fVar174 * 6.0) *
                                       0.16666667));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar120 = ZEXT416((uint)((fVar233 * 4.0 + fVar173 +
                                        fVar235 * fVar174 * 12.0 + fVar175 * fVar174 * 6.0) *
                                       0.16666667));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar127 = vshufps_avx(auVar241,auVar241,0);
              auVar178._0_4_ = auVar127._0_4_ * (float)local_9f0._0_4_ + 0.0;
              auVar178._4_4_ = auVar127._4_4_ * (float)local_9f0._4_4_ + 0.0;
              auVar178._8_4_ = auVar127._8_4_ * fStack_9e8 + 0.0;
              auVar178._12_4_ = auVar127._12_4_ * fStack_9e4 + 0.0;
              auVar127 = vshufps_avx(ZEXT416((uint)(fVar233 * 0.16666667)),
                                     ZEXT416((uint)(fVar233 * 0.16666667)),0);
              auVar118._0_4_ =
                   auVar127._0_4_ * (float)local_aa0._0_4_ +
                   auVar120._0_4_ * (float)local_9a0._0_4_ +
                   auVar36._0_4_ * local_b70 + auVar125._0_4_ * (float)local_c30._0_4_;
              auVar118._4_4_ =
                   auVar127._4_4_ * (float)local_aa0._4_4_ +
                   auVar120._4_4_ * (float)local_9a0._4_4_ +
                   auVar36._4_4_ * fStack_b6c + auVar125._4_4_ * (float)local_c30._4_4_;
              auVar118._8_4_ =
                   auVar127._8_4_ * fStack_a98 +
                   auVar120._8_4_ * fStack_998 +
                   auVar36._8_4_ * fStack_b68 + auVar125._8_4_ * fStack_c28;
              auVar118._12_4_ =
                   auVar127._12_4_ * fStack_a94 +
                   auVar120._12_4_ * fStack_994 +
                   auVar36._12_4_ * fStack_b64 + auVar125._12_4_ * fStack_c24;
              local_ac0._0_16_ = auVar118;
              auVar36 = vsubps_avx(auVar178,auVar118);
              local_9c0 = auVar36._0_4_;
              fStack_9bc = auVar36._4_4_;
              fStack_9b8 = auVar36._8_4_;
              fStack_9b4 = auVar36._12_4_;
              auVar36 = vdpps_avx(auVar36,auVar36,0x7f);
              fVar233 = auVar36._0_4_;
              if (fVar233 < 0.0) {
                fVar173 = sqrtf(fVar233);
                uVar105 = extraout_RAX_00;
              }
              else {
                auVar125 = vsqrtss_avx(auVar36,auVar36);
                fVar173 = auVar125._0_4_;
              }
              auVar125 = ZEXT416((uint)(fVar175 * fVar175 * 0.5));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar120 = ZEXT416((uint)((fVar235 * fVar235 + fVar174 * 4.0) * 0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar127 = ZEXT416((uint)((fVar175 * -fVar175 - fVar174 * 4.0) * 0.5));
              auVar127 = vshufps_avx(auVar127,auVar127,0);
              auVar119 = ZEXT416((uint)(fVar235 * -fVar235 * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar312._0_4_ =
                   (float)local_aa0._0_4_ * auVar119._0_4_ +
                   (float)local_9a0._0_4_ * auVar127._0_4_ +
                   local_b70 * auVar125._0_4_ + (float)local_c30._0_4_ * auVar120._0_4_;
              auVar312._4_4_ =
                   (float)local_aa0._4_4_ * auVar119._4_4_ +
                   (float)local_9a0._4_4_ * auVar127._4_4_ +
                   fStack_b6c * auVar125._4_4_ + (float)local_c30._4_4_ * auVar120._4_4_;
              auVar312._8_4_ =
                   fStack_a98 * auVar119._8_4_ +
                   fStack_998 * auVar127._8_4_ +
                   fStack_b68 * auVar125._8_4_ + fStack_c28 * auVar120._8_4_;
              auVar312._12_4_ =
                   fStack_a94 * auVar119._12_4_ +
                   fStack_994 * auVar127._12_4_ +
                   fStack_b64 * auVar125._12_4_ + fStack_c24 * auVar120._12_4_;
              auVar125 = vshufps_avx(auVar241,auVar241,0x55);
              auVar120 = ZEXT416((uint)(fVar235 - (fVar175 + fVar175)));
              auVar127 = vshufps_avx(auVar120,auVar120,0);
              auVar120 = ZEXT416((uint)(fVar175 - (fVar235 + fVar235)));
              auVar119 = vshufps_avx(auVar120,auVar120,0);
              auVar126 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
              auVar120 = vdpps_avx(auVar312,auVar312,0x7f);
              auVar149._0_4_ =
                   (float)local_aa0._0_4_ * auVar126._0_4_ +
                   (float)local_9a0._0_4_ * auVar119._0_4_ +
                   local_b70 * auVar125._0_4_ + (float)local_c30._0_4_ * auVar127._0_4_;
              auVar149._4_4_ =
                   (float)local_aa0._4_4_ * auVar126._4_4_ +
                   (float)local_9a0._4_4_ * auVar119._4_4_ +
                   fStack_b6c * auVar125._4_4_ + (float)local_c30._4_4_ * auVar127._4_4_;
              auVar149._8_4_ =
                   fStack_a98 * auVar126._8_4_ +
                   fStack_998 * auVar119._8_4_ +
                   fStack_b68 * auVar125._8_4_ + fStack_c28 * auVar127._8_4_;
              auVar149._12_4_ =
                   fStack_a94 * auVar126._12_4_ +
                   fStack_994 * auVar119._12_4_ +
                   fStack_b64 * auVar125._12_4_ + fStack_c24 * auVar127._12_4_;
              auVar125 = vblendps_avx(auVar120,_DAT_01f45a50,0xe);
              auVar127 = vrsqrtss_avx(auVar125,auVar125);
              fVar235 = auVar127._0_4_;
              fVar174 = auVar120._0_4_;
              auVar127 = vdpps_avx(auVar312,auVar149,0x7f);
              auVar119 = vshufps_avx(auVar120,auVar120,0);
              auVar150._0_4_ = auVar149._0_4_ * auVar119._0_4_;
              auVar150._4_4_ = auVar149._4_4_ * auVar119._4_4_;
              auVar150._8_4_ = auVar149._8_4_ * auVar119._8_4_;
              auVar150._12_4_ = auVar149._12_4_ * auVar119._12_4_;
              auVar127 = vshufps_avx(auVar127,auVar127,0);
              auVar222._0_4_ = auVar312._0_4_ * auVar127._0_4_;
              auVar222._4_4_ = auVar312._4_4_ * auVar127._4_4_;
              auVar222._8_4_ = auVar312._8_4_ * auVar127._8_4_;
              auVar222._12_4_ = auVar312._12_4_ * auVar127._12_4_;
              auVar126 = vsubps_avx(auVar150,auVar222);
              auVar127 = vrcpss_avx(auVar125,auVar125);
              auVar125 = vmaxss_avx(ZEXT416((uint)fVar234),
                                    ZEXT416((uint)(auVar241._0_4_ * (float)local_a40._0_4_)));
              auVar127 = ZEXT416((uint)(auVar127._0_4_ * (2.0 - fVar174 * auVar127._0_4_)));
              auVar127 = vshufps_avx(auVar127,auVar127,0);
              uVar94 = CONCAT44(auVar312._4_4_,auVar312._0_4_);
              auVar242._0_8_ = uVar94 ^ 0x8000000080000000;
              auVar242._8_4_ = -auVar312._8_4_;
              auVar242._12_4_ = -auVar312._12_4_;
              auVar119 = ZEXT416((uint)(fVar235 * 1.5 + fVar174 * -0.5 * fVar235 * fVar235 * fVar235
                                       ));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar204._0_4_ = auVar119._0_4_ * auVar126._0_4_ * auVar127._0_4_;
              auVar204._4_4_ = auVar119._4_4_ * auVar126._4_4_ * auVar127._4_4_;
              auVar204._8_4_ = auVar119._8_4_ * auVar126._8_4_ * auVar127._8_4_;
              auVar204._12_4_ = auVar119._12_4_ * auVar126._12_4_ * auVar127._12_4_;
              auVar265._0_4_ = auVar312._0_4_ * auVar119._0_4_;
              auVar265._4_4_ = auVar312._4_4_ * auVar119._4_4_;
              auVar265._8_4_ = auVar312._8_4_ * auVar119._8_4_;
              auVar265._12_4_ = auVar312._12_4_ * auVar119._12_4_;
              if (fVar174 < 0.0) {
                local_a60._0_16_ = auVar204;
                fVar174 = sqrtf(fVar174);
                uVar105 = extraout_RAX_01;
                auVar204 = local_a60._0_16_;
              }
              else {
                auVar120 = vsqrtss_avx(auVar120,auVar120);
                fVar174 = auVar120._0_4_;
              }
              auVar99._4_4_ = fStack_9bc;
              auVar99._0_4_ = local_9c0;
              auVar99._8_4_ = fStack_9b8;
              auVar99._12_4_ = fStack_9b4;
              auVar120 = vdpps_avx(auVar99,auVar265,0x7f);
              fVar173 = (fVar234 / fVar174) * (fVar173 + 1.0) + auVar125._0_4_ + fVar173 * fVar234;
              auVar127 = vdpps_avx(auVar242,auVar265,0x7f);
              auVar119 = vdpps_avx(auVar99,auVar204,0x7f);
              auVar126 = vdpps_avx(_local_9f0,auVar265,0x7f);
              auVar37 = vdpps_avx(auVar99,auVar242,0x7f);
              fVar174 = auVar127._0_4_ + auVar119._0_4_;
              fVar235 = auVar120._0_4_;
              auVar121._0_4_ = fVar235 * fVar235;
              auVar121._4_4_ = auVar120._4_4_ * auVar120._4_4_;
              auVar121._8_4_ = auVar120._8_4_ * auVar120._8_4_;
              auVar121._12_4_ = auVar120._12_4_ * auVar120._12_4_;
              auVar119 = vsubps_avx(auVar36,auVar121);
              auVar151 = ZEXT416((uint)fVar174);
              auVar127 = vdpps_avx(auVar99,_local_9f0,0x7f);
              fVar175 = auVar37._0_4_ - fVar235 * fVar174;
              fVar200 = auVar127._0_4_ - fVar235 * auVar126._0_4_;
              auVar127 = vrsqrtss_avx(auVar119,auVar119);
              fVar236 = auVar119._0_4_;
              fVar235 = auVar127._0_4_;
              fVar235 = fVar235 * 1.5 + fVar236 * -0.5 * fVar235 * fVar235 * fVar235;
              if (fVar236 < 0.0) {
                local_a60._0_16_ = auVar126;
                local_880._0_4_ = fVar175;
                local_8a0._0_4_ = fVar200;
                local_8c0._0_4_ = fVar235;
                fVar236 = sqrtf(fVar236);
                uVar105 = extraout_RAX_02;
                fVar235 = (float)local_8c0._0_4_;
                fVar175 = (float)local_880._0_4_;
                fVar200 = (float)local_8a0._0_4_;
                auVar126 = local_a60._0_16_;
              }
              else {
                auVar127 = vsqrtss_avx(auVar119,auVar119);
                fVar236 = auVar127._0_4_;
              }
              auVar368 = ZEXT1664(auVar36);
              auVar387 = ZEXT3264(auVar437);
              auVar404 = ZEXT1664(auVar312);
              auVar37 = vpermilps_avx(local_ac0._0_16_,0xff);
              auVar9 = vshufps_avx(auVar312,auVar312,0xff);
              fVar175 = fVar175 * fVar235 - auVar9._0_4_;
              auVar223._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
              auVar223._8_4_ = auVar126._8_4_ ^ 0x80000000;
              auVar223._12_4_ = auVar126._12_4_ ^ 0x80000000;
              auVar243._0_4_ = -fVar175;
              auVar243._4_4_ = 0x80000000;
              auVar243._8_4_ = 0x80000000;
              auVar243._12_4_ = 0x80000000;
              auVar300 = ZEXT1664(auVar151);
              fVar174 = fVar174 * fVar200 * fVar235;
              auVar271 = ZEXT464((uint)fVar174);
              auVar127 = vinsertps_avx(auVar243,ZEXT416((uint)(fVar200 * fVar235)),0x1c);
              auVar126 = vmovsldup_avx(ZEXT416((uint)(fVar174 - auVar126._0_4_ * fVar175)));
              auVar127 = vdivps_avx(auVar127,auVar126);
              auVar119 = vinsertps_avx(auVar151,auVar223,0x10);
              auVar119 = vdivps_avx(auVar119,auVar126);
              auVar126 = vmovsldup_avx(auVar120);
              auVar152 = ZEXT416((uint)(fVar236 - auVar37._0_4_));
              auVar37 = vmovsldup_avx(auVar152);
              auVar179._0_4_ = auVar126._0_4_ * auVar127._0_4_ + auVar37._0_4_ * auVar119._0_4_;
              auVar179._4_4_ = auVar126._4_4_ * auVar127._4_4_ + auVar37._4_4_ * auVar119._4_4_;
              auVar179._8_4_ = auVar126._8_4_ * auVar127._8_4_ + auVar37._8_4_ * auVar119._8_4_;
              auVar179._12_4_ = auVar126._12_4_ * auVar127._12_4_ + auVar37._12_4_ * auVar119._12_4_
              ;
              auVar241 = vsubps_avx(auVar241,auVar179);
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar120 = vandps_avx(auVar120,auVar180);
              if (auVar120._0_4_ < fVar173) {
                auVar205._8_4_ = 0x7fffffff;
                auVar205._0_8_ = 0x7fffffff7fffffff;
                auVar205._12_4_ = 0x7fffffff;
                auVar120 = vandps_avx(auVar152,auVar205);
                if (auVar120._0_4_ <
                    (float)local_a80._0_4_ * 1.9073486e-06 + auVar125._0_4_ + fVar173) {
                  bVar113 = uVar111 < 5;
                  fVar173 = auVar241._0_4_ + (float)local_950._0_4_;
                  if (fVar115 <= fVar173) {
                    fVar234 = *(float *)(ray + k * 4 + 0x80);
                    if (fVar234 < fVar173) {
                      bVar114 = 0;
                      goto LAB_00ad3606;
                    }
                    auVar125 = vmovshdup_avx(auVar241);
                    bVar114 = 0;
                    if ((auVar125._0_4_ < 0.0) || (1.0 < auVar125._0_4_)) goto LAB_00ad3606;
                    auVar125 = vrsqrtss_avx(auVar36,auVar36);
                    fVar235 = auVar125._0_4_;
                    pGVar19 = (context->scene->geometries).items[uVar109].ptr;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar114 = 1, pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00ad3606;
                      auVar125 = ZEXT416((uint)(fVar235 * 1.5 +
                                               fVar233 * -0.5 * fVar235 * fVar235 * fVar235));
                      auVar125 = vshufps_avx(auVar125,auVar125,0);
                      auVar181._0_4_ = auVar125._0_4_ * local_9c0;
                      auVar181._4_4_ = auVar125._4_4_ * fStack_9bc;
                      auVar181._8_4_ = auVar125._8_4_ * fStack_9b8;
                      auVar181._12_4_ = auVar125._12_4_ * fStack_9b4;
                      auVar122._0_4_ = auVar312._0_4_ + auVar9._0_4_ * auVar181._0_4_;
                      auVar122._4_4_ = auVar312._4_4_ + auVar9._4_4_ * auVar181._4_4_;
                      auVar122._8_4_ = auVar312._8_4_ + auVar9._8_4_ * auVar181._8_4_;
                      auVar122._12_4_ = auVar312._12_4_ + auVar9._12_4_ * auVar181._12_4_;
                      auVar125 = vshufps_avx(auVar181,auVar181,0xc9);
                      auVar120 = vshufps_avx(auVar312,auVar312,0xc9);
                      auVar182._0_4_ = auVar120._0_4_ * auVar181._0_4_;
                      auVar182._4_4_ = auVar120._4_4_ * auVar181._4_4_;
                      auVar182._8_4_ = auVar120._8_4_ * auVar181._8_4_;
                      auVar182._12_4_ = auVar120._12_4_ * auVar181._12_4_;
                      auVar206._0_4_ = auVar312._0_4_ * auVar125._0_4_;
                      auVar206._4_4_ = auVar312._4_4_ * auVar125._4_4_;
                      auVar206._8_4_ = auVar312._8_4_ * auVar125._8_4_;
                      auVar206._12_4_ = auVar312._12_4_ * auVar125._12_4_;
                      auVar127 = vsubps_avx(auVar206,auVar182);
                      auVar125 = vshufps_avx(auVar127,auVar127,0xc9);
                      auVar120 = vshufps_avx(auVar122,auVar122,0xc9);
                      auVar207._0_4_ = auVar120._0_4_ * auVar125._0_4_;
                      auVar207._4_4_ = auVar120._4_4_ * auVar125._4_4_;
                      auVar207._8_4_ = auVar120._8_4_ * auVar125._8_4_;
                      auVar207._12_4_ = auVar120._12_4_ * auVar125._12_4_;
                      auVar125 = vshufps_avx(auVar127,auVar127,0xd2);
                      auVar123._0_4_ = auVar122._0_4_ * auVar125._0_4_;
                      auVar123._4_4_ = auVar122._4_4_ * auVar125._4_4_;
                      auVar123._8_4_ = auVar122._8_4_ * auVar125._8_4_;
                      auVar123._12_4_ = auVar122._12_4_ * auVar125._12_4_;
                      auVar125 = vsubps_avx(auVar207,auVar123);
                      local_810 = vshufps_avx(auVar241,auVar241,0x55);
                      local_840 = (RTCHitN  [16])vshufps_avx(auVar125,auVar125,0x55);
                      auStack_830 = vshufps_avx(auVar125,auVar125,0xaa);
                      local_820 = vshufps_avx(auVar125,auVar125,0);
                      local_800 = ZEXT816(0) << 0x20;
                      local_7f0 = local_860._0_8_;
                      uStack_7e8 = local_860._8_8_;
                      local_7e0 = local_850;
                      vcmpps_avx(ZEXT1632(local_850),ZEXT1632(local_850),0xf);
                      uStack_7cc = context->user->instID[0];
                      local_7d0 = uStack_7cc;
                      uStack_7c8 = uStack_7cc;
                      uStack_7c4 = uStack_7cc;
                      uStack_7c0 = context->user->instPrimID[0];
                      uStack_7bc = uStack_7c0;
                      uStack_7b8 = uStack_7c0;
                      uStack_7b4 = uStack_7c0;
                      *(float *)(ray + k * 4 + 0x80) = fVar173;
                      auVar241 = *(undefined1 (*) [16])
                                  (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      local_920._0_16_ = auVar241;
                      local_af0.valid = (int *)local_920;
                      local_af0.geometryUserPtr = pGVar19->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_840;
                      local_af0.N = 4;
                      local_af0.ray = (RTCRayN *)ray;
                      if (pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar271 = ZEXT464((uint)fVar174);
                        auVar300 = ZEXT1664(auVar151);
                        auVar368 = ZEXT1664(auVar36);
                        auVar387 = ZEXT1664(auVar33);
                        auVar404 = ZEXT1664(auVar312);
                        (*pGVar19->occlusionFilterN)(&local_af0);
                        auVar241 = local_920._0_16_;
                      }
                      if (auVar241 == (undefined1  [16])0x0) {
                        auVar241 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar241 = auVar241 ^ _DAT_01f46b70;
                      }
                      else {
                        p_Var24 = context->args->filter;
                        if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          auVar300 = ZEXT1664(auVar300._0_16_);
                          auVar368 = ZEXT1664(auVar368._0_16_);
                          auVar387 = ZEXT1664(auVar387._0_16_);
                          auVar404 = ZEXT1664(auVar404._0_16_);
                          (*p_Var24)(&local_af0);
                          auVar241 = local_920._0_16_;
                        }
                        auVar36 = vpcmpeqd_avx(auVar241,_DAT_01f45a50);
                        auVar241 = auVar36 ^ _DAT_01f46b70;
                        auVar183._8_4_ = 0xff800000;
                        auVar183._0_8_ = 0xff800000ff800000;
                        auVar183._12_4_ = 0xff800000;
                        auVar36 = vblendvps_avx(auVar183,*(undefined1 (*) [16])
                                                          (local_af0.ray + 0x80),auVar36);
                        *(undefined1 (*) [16])(local_af0.ray + 0x80) = auVar36;
                      }
                      auVar438 = ZEXT3264(auVar437);
                      auVar153._8_8_ = 0x100000001;
                      auVar153._0_8_ = 0x100000001;
                      bVar114 = (auVar153 & auVar241) != (undefined1  [16])0x0;
                      if (!(bool)bVar114) {
                        *(float *)(ray + k * 4 + 0x80) = fVar234;
                      }
                      goto LAB_00ad3610;
                    }
                  }
                  bVar114 = 0;
                  goto LAB_00ad3606;
                }
              }
            }
            bVar113 = false;
LAB_00ad3606:
            auVar438 = ZEXT3264(auVar387._0_32_);
LAB_00ad3610:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar163._4_4_ = uVar8;
            auVar163._0_4_ = uVar8;
            auVar163._8_4_ = uVar8;
            auVar163._12_4_ = uVar8;
            auVar163._16_4_ = uVar8;
            auVar163._20_4_ = uVar8;
            auVar163._24_4_ = uVar8;
            auVar163._28_4_ = uVar8;
            bVar112 = bVar112 | bVar113 & bVar114;
            auVar133 = vcmpps_avx(_local_980,auVar163,2);
            local_500 = vandps_avx(auVar133,local_500);
          }
          auVar141._0_4_ = (float)local_9e0._0_4_ + (float)local_8e0._0_4_;
          auVar141._4_4_ = (float)local_9e0._4_4_ + (float)local_8e0._4_4_;
          auVar141._8_4_ = fStack_9d8 + fStack_8d8;
          auVar141._12_4_ = fStack_9d4 + fStack_8d4;
          auVar141._16_4_ = fStack_9d0 + fStack_8d0;
          auVar141._20_4_ = fStack_9cc + fStack_8cc;
          auVar141._24_4_ = fStack_9c8 + fStack_8c8;
          auVar141._28_4_ = fStack_9c4 + fStack_8c4;
          auVar241 = vshufps_avx(auVar163._0_16_,auVar163._0_16_,0);
          auVar169._16_16_ = auVar241;
          auVar169._0_16_ = auVar241;
          auVar133 = vcmpps_avx(auVar141,auVar169,2);
          _local_8e0 = vandps_avx(auVar133,local_900);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar133 = vblendvps_avx(auVar170,auVar142,local_720);
          auVar241 = vpcmpgtd_avx(auVar133._16_16_,local_760);
          auVar36 = vpshufd_avx(local_740._0_16_,0);
          auVar36 = vpcmpgtd_avx(auVar133._0_16_,auVar36);
          auVar171._16_16_ = auVar241;
          auVar171._0_16_ = auVar36;
          local_900 = vblendps_avx(ZEXT1632(auVar36),auVar171,0xf0);
          local_920 = vandnps_avx(local_900,_local_8e0);
          local_7a0 = _local_4a0;
          local_980._4_4_ = (float)local_9e0._4_4_ + (float)local_4a0._4_4_;
          local_980._0_4_ = (float)local_9e0._0_4_ + (float)local_4a0._0_4_;
          fStack_978 = fStack_9d8 + fStack_498;
          fStack_974 = fStack_9d4 + fStack_494;
          fStack_970 = fStack_9d0 + fStack_490;
          fStack_96c = fStack_9cc + fStack_48c;
          fStack_968 = fStack_9c8 + fStack_488;
          fStack_964 = fStack_9c4 + fStack_484;
          for (; (((((((local_920 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_920 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_920 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_920 >> 0x7f,0) != '\0') ||
                   (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_920 >> 0xbf,0) != '\0') ||
                 (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_920[0x1f] < '\0'; local_920 = vandps_avx(auVar133,local_920)) {
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar133 = vblendvps_avx(auVar172,local_7a0,local_920);
            auVar25 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar25 = vminps_avx(auVar133,auVar25);
            auVar26 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar26 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar25 = vcmpps_avx(auVar133,auVar25,0);
            auVar26 = local_920 & auVar25;
            auVar133 = local_920;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar133 = vandps_avx(auVar25,local_920);
            }
            uVar104 = vmovmskps_avx(auVar133);
            uVar108 = 0;
            if (uVar104 != 0) {
              for (; (uVar104 >> uVar108 & 1) == 0; uVar108 = uVar108 + 1) {
              }
            }
            uVar105 = (ulong)uVar108;
            *(undefined4 *)(local_920 + uVar105 * 4) = 0;
            fVar233 = local_1c0[uVar105];
            uVar108 = *(uint *)(local_480 + uVar105 * 4);
            fVar173 = auVar34._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              auVar368 = ZEXT1664(auVar368._0_16_);
              auVar387 = ZEXT1664(auVar387._0_16_);
              auVar404 = ZEXT1664(auVar404._0_16_);
              fVar173 = sqrtf((float)local_a00._0_4_);
              auVar438 = ZEXT3264(auVar437);
              uVar105 = extraout_RAX_03;
            }
            auVar300 = ZEXT464(uVar108);
            auVar271 = ZEXT464((uint)fVar233);
            auVar36 = vminps_avx(_local_aa0,_local_9a0);
            auVar241 = vmaxps_avx(_local_aa0,_local_9a0);
            auVar125 = vminps_avx(auVar35,auVar376);
            auVar120 = vminps_avx(auVar36,auVar125);
            auVar36 = vmaxps_avx(auVar35,auVar376);
            auVar125 = vmaxps_avx(auVar241,auVar36);
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar241 = vandps_avx(auVar120,auVar208);
            auVar36 = vandps_avx(auVar125,auVar208);
            auVar241 = vmaxps_avx(auVar241,auVar36);
            auVar36 = vmovshdup_avx(auVar241);
            auVar36 = vmaxss_avx(auVar36,auVar241);
            auVar241 = vshufpd_avx(auVar241,auVar241,1);
            auVar241 = vmaxss_avx(auVar241,auVar36);
            fVar234 = auVar241._0_4_ * 1.9073486e-06;
            local_a80._0_16_ = vshufps_avx(auVar125,auVar125,0xff);
            auVar241 = vinsertps_avx(ZEXT416(uVar108),ZEXT416((uint)fVar233),0x10);
            for (uVar111 = 0; bVar114 = (byte)uVar105, uVar111 != 5; uVar111 = uVar111 + 1) {
              auVar36 = vmovshdup_avx(auVar241);
              fVar236 = auVar36._0_4_;
              fVar200 = 1.0 - fVar236;
              fVar233 = fVar200 * fVar200;
              fVar174 = fVar200 * fVar233;
              fVar235 = fVar236 * fVar236 * fVar236;
              fVar175 = fVar236 * fVar200;
              auVar36 = vshufps_avx(ZEXT416((uint)(fVar235 * 0.16666667)),
                                    ZEXT416((uint)(fVar235 * 0.16666667)),0);
              auVar125 = ZEXT416((uint)((fVar235 * 4.0 + fVar174 +
                                        fVar236 * fVar175 * 12.0 + fVar200 * fVar175 * 6.0) *
                                       0.16666667));
              auVar125 = vshufps_avx(auVar125,auVar125,0);
              auVar120 = ZEXT416((uint)((fVar174 * 4.0 + fVar235 +
                                        fVar200 * fVar175 * 12.0 + fVar236 * fVar175 * 6.0) *
                                       0.16666667));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar127 = vshufps_avx(auVar241,auVar241,0);
              auVar184._0_4_ = auVar127._0_4_ * (float)local_9f0._0_4_ + 0.0;
              auVar184._4_4_ = auVar127._4_4_ * (float)local_9f0._4_4_ + 0.0;
              auVar184._8_4_ = auVar127._8_4_ * fStack_9e8 + 0.0;
              auVar184._12_4_ = auVar127._12_4_ * fStack_9e4 + 0.0;
              auVar127 = vshufps_avx(ZEXT416((uint)(fVar174 * 0.16666667)),
                                     ZEXT416((uint)(fVar174 * 0.16666667)),0);
              auVar124._0_4_ =
                   auVar127._0_4_ * (float)local_aa0._0_4_ +
                   auVar120._0_4_ * (float)local_9a0._0_4_ +
                   auVar36._0_4_ * local_b70 + auVar125._0_4_ * (float)local_c30._0_4_;
              auVar124._4_4_ =
                   auVar127._4_4_ * (float)local_aa0._4_4_ +
                   auVar120._4_4_ * (float)local_9a0._4_4_ +
                   auVar36._4_4_ * fStack_b6c + auVar125._4_4_ * (float)local_c30._4_4_;
              auVar124._8_4_ =
                   auVar127._8_4_ * fStack_a98 +
                   auVar120._8_4_ * fStack_998 +
                   auVar36._8_4_ * fStack_b68 + auVar125._8_4_ * fStack_c28;
              auVar124._12_4_ =
                   auVar127._12_4_ * fStack_a94 +
                   auVar120._12_4_ * fStack_994 +
                   auVar36._12_4_ * fStack_b64 + auVar125._12_4_ * fStack_c24;
              local_ac0._0_16_ = auVar124;
              auVar36 = vsubps_avx(auVar184,auVar124);
              local_9c0 = auVar36._0_4_;
              fStack_9bc = auVar36._4_4_;
              fStack_9b8 = auVar36._8_4_;
              fStack_9b4 = auVar36._12_4_;
              auVar36 = vdpps_avx(auVar36,auVar36,0x7f);
              fVar174 = auVar36._0_4_;
              if (fVar174 < 0.0) {
                local_a40._0_4_ = fVar233;
                auVar271._0_4_ = sqrtf(fVar174);
                auVar271._4_60_ = extraout_var;
                auVar125 = auVar271._0_16_;
                uVar105 = extraout_RAX_04;
                fVar233 = (float)local_a40._0_4_;
              }
              else {
                auVar125 = vsqrtss_avx(auVar36,auVar36);
              }
              auVar387 = ZEXT1664(auVar125);
              auVar120 = ZEXT416((uint)(fVar236 * fVar236 * 0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar127 = ZEXT416((uint)((fVar233 + fVar175 * 4.0) * 0.5));
              auVar127 = vshufps_avx(auVar127,auVar127,0);
              auVar119 = ZEXT416((uint)((fVar236 * -fVar236 - fVar175 * 4.0) * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar126 = ZEXT416((uint)(fVar200 * -fVar200 * 0.5));
              auVar126 = vshufps_avx(auVar126,auVar126,0);
              auVar313._0_4_ =
                   (float)local_aa0._0_4_ * auVar126._0_4_ +
                   (float)local_9a0._0_4_ * auVar119._0_4_ +
                   local_b70 * auVar120._0_4_ + (float)local_c30._0_4_ * auVar127._0_4_;
              auVar313._4_4_ =
                   (float)local_aa0._4_4_ * auVar126._4_4_ +
                   (float)local_9a0._4_4_ * auVar119._4_4_ +
                   fStack_b6c * auVar120._4_4_ + (float)local_c30._4_4_ * auVar127._4_4_;
              auVar313._8_4_ =
                   fStack_a98 * auVar126._8_4_ +
                   fStack_998 * auVar119._8_4_ +
                   fStack_b68 * auVar120._8_4_ + fStack_c28 * auVar127._8_4_;
              auVar313._12_4_ =
                   fStack_a94 * auVar126._12_4_ +
                   fStack_994 * auVar119._12_4_ +
                   fStack_b64 * auVar120._12_4_ + fStack_c24 * auVar127._12_4_;
              auVar120 = vshufps_avx(auVar241,auVar241,0x55);
              auVar127 = ZEXT416((uint)(fVar200 - (fVar236 + fVar236)));
              auVar119 = vshufps_avx(auVar127,auVar127,0);
              auVar127 = ZEXT416((uint)(fVar236 - (fVar200 + fVar200)));
              auVar126 = vshufps_avx(auVar127,auVar127,0);
              auVar37 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
              auVar127 = vdpps_avx(auVar313,auVar313,0x7f);
              auVar154._0_4_ =
                   (float)local_aa0._0_4_ * auVar37._0_4_ +
                   (float)local_9a0._0_4_ * auVar126._0_4_ +
                   local_b70 * auVar120._0_4_ + (float)local_c30._0_4_ * auVar119._0_4_;
              auVar154._4_4_ =
                   (float)local_aa0._4_4_ * auVar37._4_4_ +
                   (float)local_9a0._4_4_ * auVar126._4_4_ +
                   fStack_b6c * auVar120._4_4_ + (float)local_c30._4_4_ * auVar119._4_4_;
              auVar154._8_4_ =
                   fStack_a98 * auVar37._8_4_ +
                   fStack_998 * auVar126._8_4_ +
                   fStack_b68 * auVar120._8_4_ + fStack_c28 * auVar119._8_4_;
              auVar154._12_4_ =
                   fStack_a94 * auVar37._12_4_ +
                   fStack_994 * auVar126._12_4_ +
                   fStack_b64 * auVar120._12_4_ + fStack_c24 * auVar119._12_4_;
              auVar120 = vblendps_avx(auVar127,_DAT_01f45a50,0xe);
              auVar119 = vrsqrtss_avx(auVar120,auVar120);
              fVar235 = auVar119._0_4_;
              fVar233 = auVar127._0_4_;
              auVar119 = vdpps_avx(auVar313,auVar154,0x7f);
              auVar126 = vshufps_avx(auVar127,auVar127,0);
              auVar155._0_4_ = auVar154._0_4_ * auVar126._0_4_;
              auVar155._4_4_ = auVar154._4_4_ * auVar126._4_4_;
              auVar155._8_4_ = auVar154._8_4_ * auVar126._8_4_;
              auVar155._12_4_ = auVar154._12_4_ * auVar126._12_4_;
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar224._0_4_ = auVar313._0_4_ * auVar119._0_4_;
              auVar224._4_4_ = auVar313._4_4_ * auVar119._4_4_;
              auVar224._8_4_ = auVar313._8_4_ * auVar119._8_4_;
              auVar224._12_4_ = auVar313._12_4_ * auVar119._12_4_;
              auVar37 = vsubps_avx(auVar155,auVar224);
              auVar119 = vrcpss_avx(auVar120,auVar120);
              auVar120 = vmaxss_avx(ZEXT416((uint)fVar234),
                                    ZEXT416((uint)(auVar241._0_4_ * fVar173 * 1.9073486e-06)));
              auVar300 = ZEXT1664(auVar120);
              auVar119 = ZEXT416((uint)(auVar119._0_4_ * (2.0 - fVar233 * auVar119._0_4_)));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              uVar94 = CONCAT44(auVar313._4_4_,auVar313._0_4_);
              auVar244._0_8_ = uVar94 ^ 0x8000000080000000;
              auVar244._8_4_ = -auVar313._8_4_;
              auVar244._12_4_ = -auVar313._12_4_;
              auVar126 = ZEXT416((uint)(fVar235 * 1.5 + fVar233 * -0.5 * fVar235 * fVar235 * fVar235
                                       ));
              auVar126 = vshufps_avx(auVar126,auVar126,0);
              auVar209._0_4_ = auVar126._0_4_ * auVar37._0_4_ * auVar119._0_4_;
              auVar209._4_4_ = auVar126._4_4_ * auVar37._4_4_ * auVar119._4_4_;
              auVar209._8_4_ = auVar126._8_4_ * auVar37._8_4_ * auVar119._8_4_;
              auVar209._12_4_ = auVar126._12_4_ * auVar37._12_4_ * auVar119._12_4_;
              auVar266._0_4_ = auVar313._0_4_ * auVar126._0_4_;
              auVar266._4_4_ = auVar313._4_4_ * auVar126._4_4_;
              auVar266._8_4_ = auVar313._8_4_ * auVar126._8_4_;
              auVar266._12_4_ = auVar313._12_4_ * auVar126._12_4_;
              if (fVar233 < 0.0) {
                local_a40._0_16_ = auVar244;
                local_a60._0_16_ = auVar209;
                fVar233 = sqrtf(fVar233);
                auVar387 = ZEXT464(auVar125._0_4_);
                auVar300 = ZEXT464(auVar120._0_4_);
                uVar105 = extraout_RAX_05;
                auVar209 = local_a60._0_16_;
                auVar244 = local_a40._0_16_;
              }
              else {
                auVar125 = vsqrtss_avx(auVar127,auVar127);
                fVar233 = auVar125._0_4_;
              }
              auVar100._4_4_ = fStack_9bc;
              auVar100._0_4_ = local_9c0;
              auVar100._8_4_ = fStack_9b8;
              auVar100._12_4_ = fStack_9b4;
              auVar125 = vdpps_avx(auVar100,auVar266,0x7f);
              fVar233 = (fVar234 / fVar233) * (auVar387._0_4_ + 1.0) +
                        auVar387._0_4_ * fVar234 + auVar300._0_4_;
              auVar127 = vdpps_avx(auVar244,auVar266,0x7f);
              auVar119 = vdpps_avx(auVar100,auVar209,0x7f);
              auVar126 = vdpps_avx(_local_9f0,auVar266,0x7f);
              auVar37 = vdpps_avx(auVar100,auVar244,0x7f);
              fVar235 = auVar127._0_4_ + auVar119._0_4_;
              fVar175 = auVar125._0_4_;
              auVar128._0_4_ = fVar175 * fVar175;
              auVar128._4_4_ = auVar125._4_4_ * auVar125._4_4_;
              auVar128._8_4_ = auVar125._8_4_ * auVar125._8_4_;
              auVar128._12_4_ = auVar125._12_4_ * auVar125._12_4_;
              auVar119 = vsubps_avx(auVar36,auVar128);
              auVar127 = vdpps_avx(auVar100,_local_9f0,0x7f);
              fVar200 = auVar37._0_4_ - fVar175 * fVar235;
              fVar236 = auVar127._0_4_ - fVar175 * auVar126._0_4_;
              auVar127 = vrsqrtss_avx(auVar119,auVar119);
              fVar237 = auVar119._0_4_;
              fVar175 = auVar127._0_4_;
              fVar175 = fVar175 * 1.5 + fVar237 * -0.5 * fVar175 * fVar175 * fVar175;
              if (fVar237 < 0.0) {
                local_a40._0_4_ = fVar233;
                local_a60._0_16_ = ZEXT416((uint)fVar235);
                local_880._0_4_ = fVar200;
                local_8a0._0_4_ = fVar236;
                local_8c0._0_4_ = fVar175;
                auVar387 = ZEXT1664(auVar387._0_16_);
                fVar237 = sqrtf(fVar237);
                auVar300 = ZEXT464(auVar120._0_4_);
                uVar105 = extraout_RAX_06;
                fVar175 = (float)local_8c0._0_4_;
                fVar200 = (float)local_880._0_4_;
                fVar236 = (float)local_8a0._0_4_;
                fVar233 = (float)local_a40._0_4_;
                auVar120 = local_a60._0_16_;
              }
              else {
                auVar120 = vsqrtss_avx(auVar119,auVar119);
                fVar237 = auVar120._0_4_;
                auVar120 = ZEXT416((uint)fVar235);
              }
              auVar368 = ZEXT1664(auVar36);
              auVar438 = ZEXT3264(auVar437);
              auVar404 = ZEXT1664(auVar313);
              auVar151 = vpermilps_avx(local_ac0._0_16_,0xff);
              auVar37 = vshufps_avx(auVar313,auVar313,0xff);
              fVar200 = fVar200 * fVar175 - auVar37._0_4_;
              auVar225._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
              auVar225._8_4_ = auVar126._8_4_ ^ 0x80000000;
              auVar225._12_4_ = auVar126._12_4_ ^ 0x80000000;
              auVar245._0_4_ = -fVar200;
              auVar245._4_4_ = 0x80000000;
              auVar245._8_4_ = 0x80000000;
              auVar245._12_4_ = 0x80000000;
              fVar235 = auVar120._0_4_ * fVar236 * fVar175;
              auVar271 = ZEXT464((uint)fVar235);
              auVar127 = vinsertps_avx(auVar245,ZEXT416((uint)(fVar236 * fVar175)),0x1c);
              auVar119 = vmovsldup_avx(ZEXT416((uint)(fVar235 - auVar126._0_4_ * fVar200)));
              auVar127 = vdivps_avx(auVar127,auVar119);
              auVar120 = vinsertps_avx(auVar120,auVar225,0x10);
              auVar120 = vdivps_avx(auVar120,auVar119);
              auVar119 = vmovsldup_avx(auVar125);
              auVar151 = ZEXT416((uint)(fVar237 - auVar151._0_4_));
              auVar126 = vmovsldup_avx(auVar151);
              auVar185._0_4_ = auVar119._0_4_ * auVar127._0_4_ + auVar126._0_4_ * auVar120._0_4_;
              auVar185._4_4_ = auVar119._4_4_ * auVar127._4_4_ + auVar126._4_4_ * auVar120._4_4_;
              auVar185._8_4_ = auVar119._8_4_ * auVar127._8_4_ + auVar126._8_4_ * auVar120._8_4_;
              auVar185._12_4_ =
                   auVar119._12_4_ * auVar127._12_4_ + auVar126._12_4_ * auVar120._12_4_;
              auVar241 = vsubps_avx(auVar241,auVar185);
              auVar186._8_4_ = 0x7fffffff;
              auVar186._0_8_ = 0x7fffffff7fffffff;
              auVar186._12_4_ = 0x7fffffff;
              auVar125 = vandps_avx(auVar125,auVar186);
              if (auVar125._0_4_ < fVar233) {
                auVar210._8_4_ = 0x7fffffff;
                auVar210._0_8_ = 0x7fffffff7fffffff;
                auVar210._12_4_ = 0x7fffffff;
                auVar125 = vandps_avx(auVar151,auVar210);
                if (auVar125._0_4_ <
                    (float)local_a80._0_4_ * 1.9073486e-06 + fVar233 + auVar300._0_4_) {
                  bVar113 = uVar111 < 5;
                  fVar233 = auVar241._0_4_ + (float)local_950._0_4_;
                  if ((fVar115 <= fVar233) &&
                     (fVar173 = *(float *)(ray + k * 4 + 0x80), fVar233 <= fVar173)) {
                    auVar125 = vmovshdup_avx(auVar241);
                    bVar114 = 0;
                    if ((auVar125._0_4_ < 0.0) || (1.0 < auVar125._0_4_)) goto LAB_00ad40fc;
                    auVar125 = vrsqrtss_avx(auVar36,auVar36);
                    fVar234 = auVar125._0_4_;
                    pGVar19 = (context->scene->geometries).items[uVar109].ptr;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar114 = 1, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar125 = ZEXT416((uint)(fVar234 * 1.5 +
                                                 fVar174 * -0.5 * fVar234 * fVar234 * fVar234));
                        auVar125 = vshufps_avx(auVar125,auVar125,0);
                        auVar187._0_4_ = auVar125._0_4_ * local_9c0;
                        auVar187._4_4_ = auVar125._4_4_ * fStack_9bc;
                        auVar187._8_4_ = auVar125._8_4_ * fStack_9b8;
                        auVar187._12_4_ = auVar125._12_4_ * fStack_9b4;
                        auVar129._0_4_ = auVar313._0_4_ + auVar37._0_4_ * auVar187._0_4_;
                        auVar129._4_4_ = auVar313._4_4_ + auVar37._4_4_ * auVar187._4_4_;
                        auVar129._8_4_ = auVar313._8_4_ + auVar37._8_4_ * auVar187._8_4_;
                        auVar129._12_4_ = auVar313._12_4_ + auVar37._12_4_ * auVar187._12_4_;
                        auVar125 = vshufps_avx(auVar187,auVar187,0xc9);
                        auVar120 = vshufps_avx(auVar313,auVar313,0xc9);
                        auVar188._0_4_ = auVar120._0_4_ * auVar187._0_4_;
                        auVar188._4_4_ = auVar120._4_4_ * auVar187._4_4_;
                        auVar188._8_4_ = auVar120._8_4_ * auVar187._8_4_;
                        auVar188._12_4_ = auVar120._12_4_ * auVar187._12_4_;
                        auVar211._0_4_ = auVar313._0_4_ * auVar125._0_4_;
                        auVar211._4_4_ = auVar313._4_4_ * auVar125._4_4_;
                        auVar211._8_4_ = auVar313._8_4_ * auVar125._8_4_;
                        auVar211._12_4_ = auVar313._12_4_ * auVar125._12_4_;
                        auVar127 = vsubps_avx(auVar211,auVar188);
                        auVar125 = vshufps_avx(auVar127,auVar127,0xc9);
                        auVar120 = vshufps_avx(auVar129,auVar129,0xc9);
                        auVar212._0_4_ = auVar120._0_4_ * auVar125._0_4_;
                        auVar212._4_4_ = auVar120._4_4_ * auVar125._4_4_;
                        auVar212._8_4_ = auVar120._8_4_ * auVar125._8_4_;
                        auVar212._12_4_ = auVar120._12_4_ * auVar125._12_4_;
                        auVar125 = vshufps_avx(auVar127,auVar127,0xd2);
                        auVar130._0_4_ = auVar129._0_4_ * auVar125._0_4_;
                        auVar130._4_4_ = auVar129._4_4_ * auVar125._4_4_;
                        auVar130._8_4_ = auVar129._8_4_ * auVar125._8_4_;
                        auVar130._12_4_ = auVar129._12_4_ * auVar125._12_4_;
                        auVar125 = vsubps_avx(auVar212,auVar130);
                        local_810 = vshufps_avx(auVar241,auVar241,0x55);
                        local_840 = (RTCHitN  [16])vshufps_avx(auVar125,auVar125,0x55);
                        auStack_830 = vshufps_avx(auVar125,auVar125,0xaa);
                        local_820 = vshufps_avx(auVar125,auVar125,0);
                        local_800 = ZEXT816(0) << 0x20;
                        local_7f0 = local_860._0_8_;
                        uStack_7e8 = local_860._8_8_;
                        local_7e0 = local_850;
                        vcmpps_avx(ZEXT1632(local_850),ZEXT1632(local_850),0xf);
                        uStack_7cc = context->user->instID[0];
                        local_7d0 = uStack_7cc;
                        uStack_7c8 = uStack_7cc;
                        uStack_7c4 = uStack_7cc;
                        uStack_7c0 = context->user->instPrimID[0];
                        uStack_7bc = uStack_7c0;
                        uStack_7b8 = uStack_7c0;
                        uStack_7b4 = uStack_7c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar233;
                        local_940 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                        local_af0.valid = (int *)local_940;
                        local_af0.geometryUserPtr = pGVar19->userPtr;
                        local_af0.context = context->user;
                        local_af0.hit = local_840;
                        local_af0.N = 4;
                        local_af0.ray = (RTCRayN *)ray;
                        if (pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar271 = ZEXT464((uint)fVar235);
                          auVar300 = ZEXT1664(auVar300._0_16_);
                          auVar368 = ZEXT1664(auVar36);
                          auVar387 = ZEXT1664(auVar387._0_16_);
                          auVar404 = ZEXT1664(auVar313);
                          (*pGVar19->occlusionFilterN)(&local_af0);
                        }
                        if (local_940 == (undefined1  [16])0x0) {
                          auVar241 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar241 = auVar241 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var24 = context->args->filter;
                          if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            auVar300 = ZEXT1664(auVar300._0_16_);
                            auVar368 = ZEXT1664(auVar368._0_16_);
                            auVar387 = ZEXT1664(auVar387._0_16_);
                            auVar404 = ZEXT1664(auVar404._0_16_);
                            (*p_Var24)(&local_af0);
                          }
                          auVar36 = vpcmpeqd_avx(local_940,_DAT_01f45a50);
                          auVar241 = auVar36 ^ _DAT_01f46b70;
                          auVar189._8_4_ = 0xff800000;
                          auVar189._0_8_ = 0xff800000ff800000;
                          auVar189._12_4_ = 0xff800000;
                          auVar36 = vblendvps_avx(auVar189,*(undefined1 (*) [16])
                                                            (local_af0.ray + 0x80),auVar36);
                          *(undefined1 (*) [16])(local_af0.ray + 0x80) = auVar36;
                        }
                        auVar438 = ZEXT3264(auVar437);
                        auVar156._8_8_ = 0x100000001;
                        auVar156._0_8_ = 0x100000001;
                        bVar114 = (auVar156 & auVar241) != (undefined1  [16])0x0;
                        if (!(bool)bVar114) {
                          *(float *)(ray + k * 4 + 0x80) = fVar173;
                        }
                      }
                      goto LAB_00ad40fc;
                    }
                  }
                  bVar114 = 0;
                  goto LAB_00ad40fc;
                }
              }
            }
            bVar113 = false;
LAB_00ad40fc:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar163._4_4_ = uVar8;
            auVar163._0_4_ = uVar8;
            auVar163._8_4_ = uVar8;
            auVar163._12_4_ = uVar8;
            auVar163._16_4_ = uVar8;
            auVar163._20_4_ = uVar8;
            auVar163._24_4_ = uVar8;
            auVar163._28_4_ = uVar8;
            bVar112 = bVar112 | bVar113 & bVar114;
            auVar133 = vcmpps_avx(_local_980,auVar163,2);
          }
          auVar133 = vandps_avx(local_700,local_6e0);
          auVar25 = vandps_avx(local_900,_local_8e0);
          auVar198._0_4_ = local_9e0._0_4_ + local_4e0._0_4_;
          auVar198._4_4_ = local_9e0._4_4_ + local_4e0._4_4_;
          auVar198._8_4_ = local_9e0._8_4_ + local_4e0._8_4_;
          auVar198._12_4_ = local_9e0._12_4_ + local_4e0._12_4_;
          auVar198._16_4_ = local_9e0._16_4_ + local_4e0._16_4_;
          auVar198._20_4_ = local_9e0._20_4_ + local_4e0._20_4_;
          auVar198._24_4_ = local_9e0._24_4_ + local_4e0._24_4_;
          auVar198._28_4_ = local_9e0._28_4_ + local_4e0._28_4_;
          auVar241 = vshufps_avx(auVar163._0_16_,auVar163._0_16_,0);
          auVar359 = ZEXT3264(_local_9e0);
          auVar232._16_16_ = auVar241;
          auVar232._0_16_ = auVar241;
          auVar26 = vcmpps_avx(auVar198,auVar232,2);
          auVar133 = vandps_avx(auVar26,auVar133);
          auVar255._0_4_ = local_9e0._0_4_ + local_4a0._0_4_;
          auVar255._4_4_ = local_9e0._4_4_ + local_4a0._4_4_;
          auVar255._8_4_ = local_9e0._8_4_ + local_4a0._8_4_;
          auVar255._12_4_ = local_9e0._12_4_ + local_4a0._12_4_;
          auVar255._16_4_ = local_9e0._16_4_ + local_4a0._16_4_;
          auVar255._20_4_ = local_9e0._20_4_ + local_4a0._20_4_;
          auVar255._24_4_ = local_9e0._24_4_ + local_4a0._24_4_;
          auVar255._28_4_ = local_9e0._28_4_ + local_4a0._28_4_;
          auVar26 = vcmpps_avx(auVar255,auVar232,2);
          auVar25 = vandps_avx(auVar26,auVar25);
          auVar25 = vorps_avx(auVar133,auVar25);
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            uVar111 = (ulong)uVar106;
            *(undefined1 (*) [32])(auStack_180 + uVar111 * 0x60) = auVar25;
            auVar133 = vblendvps_avx(_local_4a0,_local_4e0,auVar133);
            *(undefined1 (*) [32])(auStack_160 + uVar111 * 0x60) = auVar133;
            uVar105 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar111 * 0xc] = uVar105;
            auStack_138[uVar111 * 0x18] = local_ca8 + 1;
            uVar106 = uVar106 + 1;
          }
          goto LAB_00ad2c99;
        }
      }
      auVar438 = ZEXT3264(auVar437);
      auVar359 = ZEXT3264(_local_9e0);
    }
LAB_00ad2c99:
    do {
      uVar108 = uVar106;
      if (uVar108 == 0) {
        if (bVar112 != 0) goto LAB_00ad45dd;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar144._4_4_ = uVar8;
        auVar144._0_4_ = uVar8;
        auVar144._8_4_ = uVar8;
        auVar144._12_4_ = uVar8;
        auVar144._16_4_ = uVar8;
        auVar144._20_4_ = uVar8;
        auVar144._24_4_ = uVar8;
        auVar144._28_4_ = uVar8;
        auVar133 = vcmpps_avx(local_3c0,auVar144,2);
        uVar109 = vmovmskps_avx(auVar133);
        uVar109 = (uint)local_928 - 1 & (uint)local_928 & uVar109;
        goto LAB_00ad1a96;
      }
      uVar105 = (ulong)(uVar108 - 1);
      lVar107 = uVar105 * 0x60;
      auVar133 = *(undefined1 (*) [32])(auStack_160 + lVar107);
      auVar139._0_4_ = auVar359._0_4_ + auVar133._0_4_;
      auVar139._4_4_ = auVar359._4_4_ + auVar133._4_4_;
      auVar139._8_4_ = auVar359._8_4_ + auVar133._8_4_;
      auVar139._12_4_ = auVar359._12_4_ + auVar133._12_4_;
      auVar139._16_4_ = auVar359._16_4_ + auVar133._16_4_;
      auVar139._20_4_ = auVar359._20_4_ + auVar133._20_4_;
      auVar139._24_4_ = auVar359._24_4_ + auVar133._24_4_;
      auVar139._28_4_ = auVar359._28_4_ + auVar133._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar216._4_4_ = uVar8;
      auVar216._0_4_ = uVar8;
      auVar216._8_4_ = uVar8;
      auVar216._12_4_ = uVar8;
      auVar216._16_4_ = uVar8;
      auVar216._20_4_ = uVar8;
      auVar216._24_4_ = uVar8;
      auVar216._28_4_ = uVar8;
      auVar25 = vcmpps_avx(auVar139,auVar216,2);
      _local_840 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar107));
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar107) & auVar25;
      uVar106 = uVar108 - 1;
    } while ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar25 >> 0x7f,0) == '\0') &&
               (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar25 >> 0xbf,0) == '\0') &&
             (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar25[0x1f]);
    auVar195._8_4_ = 0x7f800000;
    auVar195._0_8_ = 0x7f8000007f800000;
    auVar195._12_4_ = 0x7f800000;
    auVar195._16_4_ = 0x7f800000;
    auVar195._20_4_ = 0x7f800000;
    auVar195._24_4_ = 0x7f800000;
    auVar195._28_4_ = 0x7f800000;
    auVar133 = vblendvps_avx(auVar195,auVar133,_local_840);
    auVar25 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar25 = vminps_avx(auVar133,auVar25);
    auVar26 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar26 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar133,auVar25,0);
    auVar26 = _local_840 & auVar25;
    auVar133 = _local_840;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar133 = vandps_avx(auVar25,_local_840);
    }
    auVar148._8_8_ = 0;
    auVar148._0_8_ = (&uStack_140)[uVar105 * 0xc];
    local_ca8 = auStack_138[uVar105 * 0x18];
    uVar106 = vmovmskps_avx(auVar133);
    uVar104 = 0;
    if (uVar106 != 0) {
      for (; (uVar106 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
      }
    }
    *(undefined4 *)(local_840 + (ulong)uVar104 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar107) = _local_840;
    uVar106 = uVar108 - 1;
    if ((((((((_local_840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_840 >> 0x7f,0) != '\0') ||
          (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_840 >> 0xbf,0) != '\0') ||
        (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_840[0x1f] < '\0') {
      uVar106 = uVar108;
    }
    auVar241 = vshufps_avx(auVar148,auVar148,0);
    auVar36 = vshufps_avx(auVar148,auVar148,0x55);
    auVar36 = vsubps_avx(auVar36,auVar241);
    local_4e0._4_4_ = auVar241._4_4_ + auVar36._4_4_ * 0.14285715;
    local_4e0._0_4_ = auVar241._0_4_ + auVar36._0_4_ * 0.0;
    fStack_4d8 = auVar241._8_4_ + auVar36._8_4_ * 0.2857143;
    fStack_4d4 = auVar241._12_4_ + auVar36._12_4_ * 0.42857146;
    fStack_4d0 = auVar241._0_4_ + auVar36._0_4_ * 0.5714286;
    fStack_4cc = auVar241._4_4_ + auVar36._4_4_ * 0.71428573;
    fStack_4c8 = auVar241._8_4_ + auVar36._8_4_ * 0.8571429;
    fStack_4c4 = auVar241._12_4_ + auVar36._12_4_;
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar104 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }